

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersectorK<4,16>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  float *pfVar5;
  float fVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  RTCRayQueryContext *pRVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  byte bVar67;
  byte bVar68;
  byte bVar69;
  byte bVar70;
  ulong uVar71;
  long lVar72;
  byte bVar73;
  byte bVar74;
  int iVar75;
  long lVar76;
  uint uVar77;
  bool bVar78;
  ulong uVar79;
  uint uVar80;
  uint uVar151;
  uint uVar152;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  uint uVar154;
  uint uVar155;
  uint uVar156;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  uint uVar153;
  uint uVar157;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  vint4 bi_2;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  float fVar173;
  undefined4 uVar174;
  float fVar188;
  float fVar189;
  vint4 bi_1;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar184 [32];
  undefined1 auVar177 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar195;
  vint4 bi;
  undefined1 auVar240 [32];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar241 [64];
  vint4 ai;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar249 [32];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar250 [32];
  undefined1 auVar251 [64];
  vint4 ai_1;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [64];
  vint4 ai_2;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [32];
  undefined1 auVar261 [64];
  undefined1 auVar262 [32];
  undefined1 auVar263 [64];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [32];
  undefined1 auVar268 [64];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [32];
  undefined1 auVar272 [16];
  float fVar273;
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [64];
  undefined1 auVar277 [64];
  undefined1 auVar278 [64];
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  undefined1 auVar281 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_b30;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [16];
  undefined1 (*local_ad0) [32];
  ulong local_ac8;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  undefined1 local_950 [8];
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [16];
  undefined1 local_930 [16];
  undefined1 local_920 [16];
  Primitive *local_910;
  ulong local_908;
  undefined1 local_900 [64];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [64];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  ulong uStack_160;
  int aiStack_158 [74];
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar233 [32];
  
  uVar71 = (ulong)(byte)prim[1];
  lVar72 = uVar71 * 0x25;
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 4 + 6)));
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 5 + 6)));
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 6 + 6)));
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0xf + 6)));
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x11 + 6)));
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x1a + 6)));
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x1b + 6)));
  fVar6 = *(float *)(prim + lVar72 + 0x12);
  auVar274._4_4_ = fVar6;
  auVar274._0_4_ = fVar6;
  auVar274._8_4_ = fVar6;
  auVar274._12_4_ = fVar6;
  auVar99 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar99 = vinsertps_avx(auVar99,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar84 = vsubps_avx(auVar99,*(undefined1 (*) [16])(prim + lVar72 + 6));
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x1c + 6)));
  fVar173 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar72 + 0x16)) *
            *(float *)(prim + lVar72 + 0x1a);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + uVar71 * 7 + 6);
  auVar103 = vpmovsxwd_avx(auVar99);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar71 * 0xb + 6);
  auVar104 = vpmovsxwd_avx(auVar98);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar71 * 9 + 6);
  auVar158 = vpmovsxwd_avx(auVar100);
  auVar81 = vpbroadcastd_avx512vl();
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar71 * 0xd + 6);
  auVar82 = vpmovsxwd_avx512vl(auVar94);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar71 * 0x12 + 6);
  auVar83 = vpmovsxwd_avx512vl(auVar101);
  auVar99 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar99 = vinsertps_avx512f(auVar99,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar275._0_4_ = fVar6 * auVar84._0_4_;
  auVar275._4_4_ = fVar6 * auVar84._4_4_;
  auVar275._8_4_ = fVar6 * auVar84._8_4_;
  auVar275._12_4_ = fVar6 * auVar84._12_4_;
  auVar84 = vmulps_avx512vl(auVar274,auVar99);
  auVar85 = vcvtdq2ps_avx512vl(auVar91);
  auVar86 = vcvtdq2ps_avx512vl(auVar90);
  auVar87 = vcvtdq2ps_avx512vl(auVar87);
  auVar88 = vcvtdq2ps_avx512vl(auVar88);
  auVar89 = vcvtdq2ps_avx512vl(auVar89);
  auVar99 = vcvtdq2ps_avx(auVar92);
  auVar98 = vcvtdq2ps_avx(auVar93);
  auVar100 = vcvtdq2ps_avx(auVar102);
  auVar94 = vcvtdq2ps_avx(auVar28);
  uVar174 = auVar84._0_4_;
  auVar264._4_4_ = uVar174;
  auVar264._0_4_ = uVar174;
  auVar264._8_4_ = uVar174;
  auVar264._12_4_ = uVar174;
  auVar101 = vshufps_avx(auVar84,auVar84,0x55);
  auVar91 = vshufps_avx(auVar84,auVar84,0xaa);
  auVar90 = vmulps_avx512vl(auVar91,auVar87);
  auVar175._0_4_ = auVar91._0_4_ * auVar99._0_4_;
  auVar175._4_4_ = auVar91._4_4_ * auVar99._4_4_;
  auVar175._8_4_ = auVar91._8_4_ * auVar99._8_4_;
  auVar175._12_4_ = auVar91._12_4_ * auVar99._12_4_;
  auVar84._0_4_ = auVar94._0_4_ * auVar91._0_4_;
  auVar84._4_4_ = auVar94._4_4_ * auVar91._4_4_;
  auVar84._8_4_ = auVar94._8_4_ * auVar91._8_4_;
  auVar84._12_4_ = auVar94._12_4_ * auVar91._12_4_;
  auVar91 = vfmadd231ps_avx512vl(auVar90,auVar101,auVar86);
  auVar90 = vfmadd231ps_avx512vl(auVar175,auVar101,auVar89);
  auVar101 = vfmadd231ps_fma(auVar84,auVar100,auVar101);
  auVar92 = vfmadd231ps_avx512vl(auVar91,auVar264,auVar85);
  auVar93 = vfmadd231ps_avx512vl(auVar90,auVar264,auVar88);
  auVar90 = vfmadd231ps_fma(auVar101,auVar98,auVar264);
  auVar272._4_4_ = auVar275._0_4_;
  auVar272._0_4_ = auVar275._0_4_;
  auVar272._8_4_ = auVar275._0_4_;
  auVar272._12_4_ = auVar275._0_4_;
  auVar101 = vshufps_avx(auVar275,auVar275,0x55);
  auVar91 = vshufps_avx(auVar275,auVar275,0xaa);
  auVar87 = vmulps_avx512vl(auVar91,auVar87);
  auVar265._0_4_ = auVar91._0_4_ * auVar99._0_4_;
  auVar265._4_4_ = auVar91._4_4_ * auVar99._4_4_;
  auVar265._8_4_ = auVar91._8_4_ * auVar99._8_4_;
  auVar265._12_4_ = auVar91._12_4_ * auVar99._12_4_;
  auVar216._0_4_ = auVar91._0_4_ * auVar94._0_4_;
  auVar216._4_4_ = auVar91._4_4_ * auVar94._4_4_;
  auVar216._8_4_ = auVar91._8_4_ * auVar94._8_4_;
  auVar216._12_4_ = auVar91._12_4_ * auVar94._12_4_;
  auVar94 = vfmadd231ps_avx512vl(auVar87,auVar101,auVar86);
  auVar91 = vfmadd231ps_avx512vl(auVar265,auVar101,auVar89);
  auVar99 = vfmadd231ps_fma(auVar216,auVar101,auVar100);
  auVar85 = vfmadd231ps_avx512vl(auVar94,auVar272,auVar85);
  auVar86 = vfmadd231ps_avx512vl(auVar91,auVar272,auVar88);
  auVar84 = vfmadd231ps_fma(auVar99,auVar272,auVar98);
  auVar270._8_4_ = 0x7fffffff;
  auVar270._0_8_ = 0x7fffffff7fffffff;
  auVar270._12_4_ = 0x7fffffff;
  auVar266._8_4_ = 0x219392ef;
  auVar266._0_8_ = 0x219392ef219392ef;
  auVar266._12_4_ = 0x219392ef;
  auVar99 = vandps_avx(auVar270,auVar92);
  uVar79 = vcmpps_avx512vl(auVar99,auVar266,1);
  bVar78 = (bool)((byte)uVar79 & 1);
  auVar95._0_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar92._0_4_;
  bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar92._4_4_;
  bVar78 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar92._8_4_;
  bVar78 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar92._12_4_;
  auVar99 = vandps_avx(auVar270,auVar93);
  uVar79 = vcmpps_avx512vl(auVar99,auVar266,1);
  bVar78 = (bool)((byte)uVar79 & 1);
  auVar96._0_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar93._0_4_;
  bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar93._4_4_;
  bVar78 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar93._8_4_;
  bVar78 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar93._12_4_;
  auVar99 = vandps_avx(auVar270,auVar90);
  uVar79 = vcmpps_avx512vl(auVar99,auVar266,1);
  bVar78 = (bool)((byte)uVar79 & 1);
  auVar97._0_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar90._0_4_;
  bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar97._4_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar90._4_4_;
  bVar78 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar97._8_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar90._8_4_;
  bVar78 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar97._12_4_ = (uint)bVar78 * 0x219392ef | (uint)!bVar78 * auVar90._12_4_;
  auVar98 = vrcp14ps_avx512vl(auVar95);
  auVar269._8_4_ = 0x3f800000;
  auVar269._0_8_ = 0x3f8000003f800000;
  auVar269._12_4_ = 0x3f800000;
  auVar99 = vfnmadd213ps_fma(auVar95,auVar98,auVar269);
  auVar100 = vfmadd132ps_fma(auVar99,auVar98,auVar98);
  auVar98 = vrcp14ps_avx512vl(auVar96);
  auVar99 = vfnmadd213ps_fma(auVar96,auVar98,auVar269);
  auVar94 = vfmadd132ps_fma(auVar99,auVar98,auVar98);
  auVar98 = vrcp14ps_avx512vl(auVar97);
  auVar99 = vfnmadd213ps_fma(auVar97,auVar98,auVar269);
  auVar101 = vfmadd132ps_fma(auVar99,auVar98,auVar98);
  auVar242._4_4_ = fVar173;
  auVar242._0_4_ = fVar173;
  auVar242._8_4_ = fVar173;
  auVar242._12_4_ = fVar173;
  auVar99 = vcvtdq2ps_avx(auVar103);
  auVar98 = vcvtdq2ps_avx(auVar104);
  auVar98 = vsubps_avx(auVar98,auVar99);
  auVar102 = vfmadd213ps_fma(auVar98,auVar242,auVar99);
  auVar99 = vcvtdq2ps_avx(auVar158);
  auVar98 = vcvtdq2ps_avx512vl(auVar82);
  auVar98 = vsubps_avx(auVar98,auVar99);
  auVar28 = vfmadd213ps_fma(auVar98,auVar242,auVar99);
  auVar87 = vcvtdq2ps_avx512vl(auVar83);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar71 * 0x16 + 6);
  auVar99 = vpmovsxwd_avx(auVar91);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar98 = vsubps_avx(auVar99,auVar87);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar71 * 0x14 + 6);
  auVar99 = vpmovsxwd_avx(auVar90);
  auVar91 = vfmadd213ps_fma(auVar98,auVar242,auVar87);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar71 * 0x18 + 6);
  auVar98 = vpmovsxwd_avx(auVar87);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar99);
  auVar90 = vfmadd213ps_fma(auVar98,auVar242,auVar99);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar71 * 0x1d + 6);
  auVar99 = vpmovsxwd_avx(auVar88);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar71 * 0x21 + 6);
  auVar98 = vpmovsxwd_avx(auVar89);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar99);
  auVar87 = vfmadd213ps_fma(auVar98,auVar242,auVar99);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar71 * 0x1f + 6);
  auVar99 = vpmovsxwd_avx(auVar92);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar71 * 0x23 + 6);
  auVar98 = vpmovsxwd_avx(auVar93);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar99);
  auVar98 = vfmadd213ps_fma(auVar98,auVar242,auVar99);
  auVar99 = vsubps_avx512vl(auVar102,auVar85);
  auVar243._0_4_ = auVar100._0_4_ * auVar99._0_4_;
  auVar243._4_4_ = auVar100._4_4_ * auVar99._4_4_;
  auVar243._8_4_ = auVar100._8_4_ * auVar99._8_4_;
  auVar243._12_4_ = auVar100._12_4_ * auVar99._12_4_;
  auVar99 = vsubps_avx512vl(auVar28,auVar85);
  auVar83._0_4_ = auVar100._0_4_ * auVar99._0_4_;
  auVar83._4_4_ = auVar100._4_4_ * auVar99._4_4_;
  auVar83._8_4_ = auVar100._8_4_ * auVar99._8_4_;
  auVar83._12_4_ = auVar100._12_4_ * auVar99._12_4_;
  auVar99 = vsubps_avx(auVar91,auVar86);
  auVar85._0_4_ = auVar94._0_4_ * auVar99._0_4_;
  auVar85._4_4_ = auVar94._4_4_ * auVar99._4_4_;
  auVar85._8_4_ = auVar94._8_4_ * auVar99._8_4_;
  auVar85._12_4_ = auVar94._12_4_ * auVar99._12_4_;
  auVar99 = vsubps_avx(auVar90,auVar86);
  auVar82._0_4_ = auVar94._0_4_ * auVar99._0_4_;
  auVar82._4_4_ = auVar94._4_4_ * auVar99._4_4_;
  auVar82._8_4_ = auVar94._8_4_ * auVar99._8_4_;
  auVar82._12_4_ = auVar94._12_4_ * auVar99._12_4_;
  auVar99 = vsubps_avx(auVar87,auVar84);
  auVar86._0_4_ = auVar101._0_4_ * auVar99._0_4_;
  auVar86._4_4_ = auVar101._4_4_ * auVar99._4_4_;
  auVar86._8_4_ = auVar101._8_4_ * auVar99._8_4_;
  auVar86._12_4_ = auVar101._12_4_ * auVar99._12_4_;
  auVar99 = vsubps_avx(auVar98,auVar84);
  auVar158._0_4_ = auVar101._0_4_ * auVar99._0_4_;
  auVar158._4_4_ = auVar101._4_4_ * auVar99._4_4_;
  auVar158._8_4_ = auVar101._8_4_ * auVar99._8_4_;
  auVar158._12_4_ = auVar101._12_4_ * auVar99._12_4_;
  auVar99 = vpminsd_avx(auVar243,auVar83);
  auVar98 = vpminsd_avx(auVar85,auVar82);
  auVar99 = vmaxps_avx(auVar99,auVar98);
  auVar98 = vpminsd_avx(auVar86,auVar158);
  uVar174 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar102._4_4_ = uVar174;
  auVar102._0_4_ = uVar174;
  auVar102._8_4_ = uVar174;
  auVar102._12_4_ = uVar174;
  auVar98 = vmaxps_avx512vl(auVar98,auVar102);
  auVar99 = vmaxps_avx(auVar99,auVar98);
  auVar28._8_4_ = 0x3f7ffffa;
  auVar28._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar28._12_4_ = 0x3f7ffffa;
  local_660 = vmulps_avx512vl(auVar99,auVar28);
  auVar99 = vpmaxsd_avx(auVar243,auVar83);
  auVar98 = vpmaxsd_avx(auVar85,auVar82);
  auVar99 = vminps_avx(auVar99,auVar98);
  auVar98 = vpmaxsd_avx(auVar86,auVar158);
  uVar174 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar103._4_4_ = uVar174;
  auVar103._0_4_ = uVar174;
  auVar103._8_4_ = uVar174;
  auVar103._12_4_ = uVar174;
  auVar98 = vminps_avx512vl(auVar98,auVar103);
  auVar99 = vminps_avx(auVar99,auVar98);
  auVar104._8_4_ = 0x3f800003;
  auVar104._0_8_ = 0x3f8000033f800003;
  auVar104._12_4_ = 0x3f800003;
  auVar99 = vmulps_avx512vl(auVar99,auVar104);
  uVar29 = vcmpps_avx512vl(local_660,auVar99,2);
  uVar31 = vpcmpgtd_avx512vl(auVar81,_DAT_01f4ad30);
  local_908 = (ulong)((byte)uVar29 & 0xf & (byte)uVar31);
  local_ad0 = (undefined1 (*) [32])local_240;
  auVar172 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar172);
  local_910 = prim;
LAB_018a25ea:
  auVar117._8_4_ = 0x7fffffff;
  auVar117._0_8_ = 0x7fffffff7fffffff;
  auVar117._12_4_ = 0x7fffffff;
  auVar117._16_4_ = 0x7fffffff;
  auVar117._20_4_ = 0x7fffffff;
  auVar117._24_4_ = 0x7fffffff;
  auVar117._28_4_ = 0x7fffffff;
  if (local_908 == 0) {
    return;
  }
  lVar72 = 0;
  for (uVar79 = local_908; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
    lVar72 = lVar72 + 1;
  }
  uVar7 = *(uint *)(local_910 + 2);
  local_ac8 = (ulong)*(uint *)(local_910 + lVar72 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar7].ptr;
  uVar79 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           local_ac8 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar6 = (pGVar8->time_range).lower;
  fVar6 = pGVar8->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0x1c0) - fVar6) / ((pGVar8->time_range).upper - fVar6));
  auVar99 = vroundss_avx(ZEXT416((uint)fVar6),ZEXT416((uint)fVar6),9);
  auVar99 = vminss_avx(auVar99,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar99 = vmaxss_avx(ZEXT816(0) << 0x20,auVar99);
  fVar6 = fVar6 - auVar99._0_4_;
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar76 = (long)(int)auVar99._0_4_ * 0x38;
  lVar72 = *(long *)(_Var9 + 0x10 + lVar76);
  lVar10 = *(long *)(_Var9 + 0x38 + lVar76);
  lVar11 = *(long *)(_Var9 + 0x48 + lVar76);
  pfVar5 = (float *)(lVar10 + uVar79 * lVar11);
  auVar196._0_4_ = fVar6 * *pfVar5;
  auVar196._4_4_ = fVar6 * pfVar5[1];
  auVar196._8_4_ = fVar6 * pfVar5[2];
  auVar196._12_4_ = fVar6 * pfVar5[3];
  pfVar5 = (float *)(lVar10 + (uVar79 + 1) * lVar11);
  auVar217._0_4_ = fVar6 * *pfVar5;
  auVar217._4_4_ = fVar6 * pfVar5[1];
  auVar217._8_4_ = fVar6 * pfVar5[2];
  auVar217._12_4_ = fVar6 * pfVar5[3];
  pfVar5 = (float *)(lVar10 + (uVar79 + 2) * lVar11);
  auVar235._0_4_ = fVar6 * *pfVar5;
  auVar235._4_4_ = fVar6 * pfVar5[1];
  auVar235._8_4_ = fVar6 * pfVar5[2];
  auVar235._12_4_ = fVar6 * pfVar5[3];
  pfVar5 = (float *)(lVar10 + lVar11 * (uVar79 + 3));
  auVar176._0_4_ = fVar6 * *pfVar5;
  auVar176._4_4_ = fVar6 * pfVar5[1];
  auVar176._8_4_ = fVar6 * pfVar5[2];
  auVar176._12_4_ = fVar6 * pfVar5[3];
  lVar10 = *(long *)(_Var9 + lVar76);
  fVar6 = 1.0 - fVar6;
  auVar159._4_4_ = fVar6;
  auVar159._0_4_ = fVar6;
  auVar159._8_4_ = fVar6;
  auVar159._12_4_ = fVar6;
  auVar100 = vfmadd231ps_fma(auVar196,auVar159,*(undefined1 (*) [16])(lVar10 + lVar72 * uVar79));
  auVar94 = vfmadd231ps_fma(auVar217,auVar159,*(undefined1 (*) [16])(lVar10 + lVar72 * (uVar79 + 1))
                           );
  auVar101 = vfmadd231ps_fma(auVar235,auVar159,
                             *(undefined1 (*) [16])(lVar10 + lVar72 * (uVar79 + 2)));
  auVar91 = vfmadd231ps_fma(auVar176,auVar159,*(undefined1 (*) [16])(lVar10 + lVar72 * (uVar79 + 3))
                           );
  auVar99 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar98 = vinsertps_avx(auVar99,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  local_a00 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  auVar279 = ZEXT3264(local_a00);
  local_620 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar99 = vunpcklps_avx512vl(local_a00._0_16_,local_620._0_16_);
  local_a20 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar280 = ZEXT3264(local_a20);
  auVar88 = local_a20._0_16_;
  local_a30 = vinsertps_avx512f(auVar99,auVar88,0x28);
  auVar244._0_4_ = auVar100._0_4_ + auVar94._0_4_ + auVar101._0_4_ + auVar91._0_4_;
  auVar244._4_4_ = auVar100._4_4_ + auVar94._4_4_ + auVar101._4_4_ + auVar91._4_4_;
  auVar244._8_4_ = auVar100._8_4_ + auVar94._8_4_ + auVar101._8_4_ + auVar91._8_4_;
  auVar244._12_4_ = auVar100._12_4_ + auVar94._12_4_ + auVar101._12_4_ + auVar91._12_4_;
  auVar81._8_4_ = 0x3e800000;
  auVar81._0_8_ = 0x3e8000003e800000;
  auVar81._12_4_ = 0x3e800000;
  auVar99 = vmulps_avx512vl(auVar244,auVar81);
  auVar99 = vsubps_avx(auVar99,auVar98);
  auVar99 = vdpps_avx(auVar99,local_a30,0x7f);
  local_a40 = vdpps_avx(local_a30,local_a30,0x7f);
  fVar6 = *(float *)(ray + k * 4 + 0xc0);
  auVar252._4_12_ = ZEXT812(0) << 0x20;
  auVar252._0_4_ = local_a40._0_4_;
  auVar87 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar252);
  auVar90 = vfnmadd213ss_fma(auVar87,local_a40,ZEXT416(0x40000000));
  local_5a0 = auVar99._0_4_ * auVar87._0_4_ * auVar90._0_4_;
  auVar251 = ZEXT3264(_DAT_01f7b040);
  auVar257._4_4_ = local_5a0;
  auVar257._0_4_ = local_5a0;
  auVar257._8_4_ = local_5a0;
  auVar257._12_4_ = local_5a0;
  fStack_710 = local_5a0;
  _local_720 = auVar257;
  fStack_70c = local_5a0;
  fStack_708 = local_5a0;
  fStack_704 = local_5a0;
  auVar99 = vfmadd231ps_fma(auVar98,local_a30,auVar257);
  auVar99 = vblendps_avx(auVar99,ZEXT816(0) << 0x40,8);
  auVar98 = vsubps_avx(auVar100,auVar99);
  auVar100 = vsubps_avx(auVar101,auVar99);
  auVar94 = vsubps_avx(auVar94,auVar99);
  auVar99 = vsubps_avx(auVar91,auVar99);
  uVar174 = auVar98._0_4_;
  local_ac0._4_4_ = uVar174;
  local_ac0._0_4_ = uVar174;
  local_ac0._8_4_ = uVar174;
  local_ac0._12_4_ = uVar174;
  local_ac0._16_4_ = uVar174;
  local_ac0._20_4_ = uVar174;
  local_ac0._24_4_ = uVar174;
  local_ac0._28_4_ = uVar174;
  auVar268 = ZEXT3264(local_ac0);
  auVar112._8_4_ = 1;
  auVar112._0_8_ = 0x100000001;
  auVar112._12_4_ = 1;
  auVar112._16_4_ = 1;
  auVar112._20_4_ = 1;
  auVar112._24_4_ = 1;
  auVar112._28_4_ = 1;
  local_840 = ZEXT1632(auVar98);
  local_a60 = vpermps_avx2(auVar112,local_840);
  auVar113._8_4_ = 2;
  auVar113._0_8_ = 0x200000002;
  auVar113._12_4_ = 2;
  auVar113._16_4_ = 2;
  auVar113._20_4_ = 2;
  auVar113._24_4_ = 2;
  auVar113._28_4_ = 2;
  local_a80 = vpermps_avx2(auVar113,local_840);
  auVar114._8_4_ = 3;
  auVar114._0_8_ = 0x300000003;
  auVar114._12_4_ = 3;
  auVar114._16_4_ = 3;
  auVar114._20_4_ = 3;
  auVar114._24_4_ = 3;
  auVar114._28_4_ = 3;
  auVar105 = vpermps_avx512vl(auVar114,local_840);
  auVar281 = ZEXT3264(auVar105);
  auVar261 = ZEXT3264(local_a60);
  uVar174 = auVar94._0_4_;
  local_9e0._4_4_ = uVar174;
  local_9e0._0_4_ = uVar174;
  local_9e0._8_4_ = uVar174;
  local_9e0._12_4_ = uVar174;
  local_9e0._16_4_ = uVar174;
  local_9e0._20_4_ = uVar174;
  local_9e0._24_4_ = uVar174;
  local_9e0._28_4_ = uVar174;
  local_880 = ZEXT1632(auVar94);
  local_aa0 = vpermps_avx2(auVar112,local_880);
  auVar276 = ZEXT3264(local_aa0);
  auVar105 = vpermps_avx512vl(auVar113,local_880);
  auVar277 = ZEXT3264(auVar105);
  auVar106 = vpermps_avx512vl(auVar114,local_880);
  auVar278 = ZEXT3264(auVar106);
  auVar107 = vbroadcastss_avx512vl(auVar100);
  local_860 = ZEXT1632(auVar100);
  auVar108 = vpermps_avx512vl(auVar112,local_860);
  auVar109 = vpermps_avx512vl(auVar113,local_860);
  auVar110 = vpermps_avx512vl(auVar114,local_860);
  auVar241 = ZEXT3264(local_9e0);
  auVar111 = vbroadcastss_avx512vl(auVar99);
  _local_8a0 = ZEXT1632(auVar99);
  auVar112 = vpermps_avx512vl(auVar112,_local_8a0);
  auVar113 = vpermps_avx512vl(auVar113,_local_8a0);
  auVar114 = vpermps_avx512vl(auVar114,_local_8a0);
  auVar263 = ZEXT3264(local_a80);
  auVar99 = vmulss_avx512f(auVar88,auVar88);
  auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),local_620,local_620);
  auVar115 = vfmadd231ps_avx512vl(auVar115,local_a00,local_a00);
  local_560._0_4_ = auVar115._0_4_;
  local_560._4_4_ = local_560._0_4_;
  local_560._8_4_ = local_560._0_4_;
  local_560._12_4_ = local_560._0_4_;
  local_560._16_4_ = local_560._0_4_;
  local_560._20_4_ = local_560._0_4_;
  local_560._24_4_ = local_560._0_4_;
  local_560._28_4_ = local_560._0_4_;
  local_580 = vandps_avx(auVar117,local_560);
  local_970 = ZEXT416((uint)local_5a0);
  local_5a0 = fVar6 - local_5a0;
  auVar256 = ZEXT3264(local_aa0);
  fStack_59c = local_5a0;
  fStack_598 = local_5a0;
  fStack_594 = local_5a0;
  fStack_590 = local_5a0;
  fStack_58c = local_5a0;
  fStack_588 = local_5a0;
  fStack_584 = local_5a0;
  auVar172 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar172);
  uVar77 = 0;
  iVar75 = 1;
  auVar172 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar172);
  auVar99 = vsqrtss_avx(local_a40,local_a40);
  auVar98 = vsqrtss_avx(local_a40,local_a40);
  local_650 = ZEXT816(0x3f80000000000000);
  do {
    auVar100 = vmovshdup_avx(local_650);
    auVar100 = vsubps_avx(auVar100,local_650);
    fVar191 = auVar100._0_4_;
    fVar192 = fVar191 * 0.04761905;
    auVar211._0_4_ = local_650._0_4_;
    auVar211._4_4_ = auVar211._0_4_;
    auVar211._8_4_ = auVar211._0_4_;
    auVar211._12_4_ = auVar211._0_4_;
    auVar211._16_4_ = auVar211._0_4_;
    auVar211._20_4_ = auVar211._0_4_;
    auVar211._24_4_ = auVar211._0_4_;
    auVar211._28_4_ = auVar211._0_4_;
    auVar218._4_4_ = fVar191;
    auVar218._0_4_ = fVar191;
    auVar218._8_4_ = fVar191;
    auVar218._12_4_ = fVar191;
    auVar233._16_4_ = fVar191;
    auVar233._0_16_ = auVar218;
    auVar233._20_4_ = fVar191;
    auVar233._24_4_ = fVar191;
    auVar233._28_4_ = fVar191;
    auVar100 = vfmadd231ps_fma(auVar211,auVar233,auVar251._0_32_);
    auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar117 = vsubps_avx512vl(auVar116,ZEXT1632(auVar100));
    fVar173 = auVar100._0_4_;
    fVar188 = auVar100._4_4_;
    auVar119._4_4_ = auVar241._4_4_ * fVar188;
    auVar119._0_4_ = auVar241._0_4_ * fVar173;
    fVar189 = auVar100._8_4_;
    auVar119._8_4_ = auVar241._8_4_ * fVar189;
    fVar190 = auVar100._12_4_;
    auVar119._12_4_ = auVar241._12_4_ * fVar190;
    auVar119._16_4_ = auVar241._16_4_ * 0.0;
    auVar119._20_4_ = auVar241._20_4_ * 0.0;
    auVar119._24_4_ = auVar241._24_4_ * 0.0;
    auVar119._28_4_ = auVar211._0_4_;
    auVar121 = ZEXT1632(auVar100);
    auVar120._4_4_ = auVar256._4_4_ * fVar188;
    auVar120._0_4_ = auVar256._0_4_ * fVar173;
    auVar120._8_4_ = auVar256._8_4_ * fVar189;
    auVar120._12_4_ = auVar256._12_4_ * fVar190;
    auVar120._16_4_ = auVar256._16_4_ * 0.0;
    auVar120._20_4_ = auVar256._20_4_ * 0.0;
    auVar120._24_4_ = auVar256._24_4_ * 0.0;
    auVar120._28_4_ = fVar191;
    auVar115 = vmulps_avx512vl(auVar277._0_32_,auVar121);
    auVar118 = vmulps_avx512vl(auVar278._0_32_,auVar121);
    auVar94 = vfmadd231ps_fma(auVar119,auVar117,auVar268._0_32_);
    auVar101 = vfmadd231ps_fma(auVar120,auVar117,auVar261._0_32_);
    auVar91 = vfmadd231ps_fma(auVar115,auVar117,auVar263._0_32_);
    local_b00 = auVar281._0_32_;
    auVar115 = vfmadd231ps_avx512vl(auVar118,auVar117,local_b00);
    auVar119 = vmulps_avx512vl(auVar107,auVar121);
    auVar125 = ZEXT1632(auVar100);
    auVar120 = vmulps_avx512vl(auVar108,auVar125);
    auVar118 = vmulps_avx512vl(auVar109,auVar125);
    auVar121 = vmulps_avx512vl(auVar110,auVar125);
    auVar90 = vfmadd231ps_fma(auVar119,auVar117,auVar241._0_32_);
    auVar87 = vfmadd231ps_fma(auVar120,auVar117,auVar256._0_32_);
    auVar119 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar277._0_32_);
    auVar120 = vfmadd231ps_avx512vl(auVar121,auVar117,auVar278._0_32_);
    auVar118 = vmulps_avx512vl(auVar111,auVar125);
    auVar121 = vmulps_avx512vl(auVar112,auVar125);
    auVar122 = vmulps_avx512vl(auVar113,auVar125);
    auVar123 = vmulps_avx512vl(auVar114,auVar125);
    auVar124 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar107);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar117,auVar108);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar117,auVar109);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar117,auVar110);
    auVar172._28_36_ = auVar276._28_36_;
    auVar172._0_28_ =
         ZEXT1628(CONCAT412(fVar190 * auVar90._12_4_,
                            CONCAT48(fVar189 * auVar90._8_4_,
                                     CONCAT44(fVar188 * auVar90._4_4_,fVar173 * auVar90._0_4_))));
    auVar118 = vmulps_avx512vl(auVar125,ZEXT1632(auVar87));
    auVar125 = vmulps_avx512vl(ZEXT1632(auVar100),auVar119);
    auVar126 = vmulps_avx512vl(ZEXT1632(auVar100),auVar120);
    auVar100 = vfmadd231ps_fma(auVar172._0_32_,auVar117,ZEXT1632(auVar94));
    auVar127 = vfmadd231ps_avx512vl(auVar118,auVar117,ZEXT1632(auVar101));
    auVar128 = vfmadd231ps_avx512vl(auVar125,auVar117,ZEXT1632(auVar91));
    auVar129 = vfmadd231ps_avx512vl(auVar126,auVar117,auVar115);
    auVar118._4_4_ = auVar124._4_4_ * fVar188;
    auVar118._0_4_ = auVar124._0_4_ * fVar173;
    auVar118._8_4_ = auVar124._8_4_ * fVar189;
    auVar118._12_4_ = auVar124._12_4_ * fVar190;
    auVar118._16_4_ = auVar124._16_4_ * 0.0;
    auVar118._20_4_ = auVar124._20_4_ * 0.0;
    auVar118._24_4_ = auVar124._24_4_ * 0.0;
    auVar118._28_4_ = auVar115._28_4_;
    auVar125._4_4_ = auVar121._4_4_ * fVar188;
    auVar125._0_4_ = auVar121._0_4_ * fVar173;
    auVar125._8_4_ = auVar121._8_4_ * fVar189;
    auVar125._12_4_ = auVar121._12_4_ * fVar190;
    auVar125._16_4_ = auVar121._16_4_ * 0.0;
    auVar125._20_4_ = auVar121._20_4_ * 0.0;
    auVar125._24_4_ = auVar121._24_4_ * 0.0;
    auVar125._28_4_ = auVar124._28_4_;
    auVar126._4_4_ = auVar122._4_4_ * fVar188;
    auVar126._0_4_ = auVar122._0_4_ * fVar173;
    auVar126._8_4_ = auVar122._8_4_ * fVar189;
    auVar126._12_4_ = auVar122._12_4_ * fVar190;
    auVar126._16_4_ = auVar122._16_4_ * 0.0;
    auVar126._20_4_ = auVar122._20_4_ * 0.0;
    auVar126._24_4_ = auVar122._24_4_ * 0.0;
    auVar126._28_4_ = auVar121._28_4_;
    auVar130._4_4_ = auVar123._4_4_ * fVar188;
    auVar130._0_4_ = auVar123._0_4_ * fVar173;
    auVar130._8_4_ = auVar123._8_4_ * fVar189;
    auVar130._12_4_ = auVar123._12_4_ * fVar190;
    auVar130._16_4_ = auVar123._16_4_ * 0.0;
    auVar130._20_4_ = auVar123._20_4_ * 0.0;
    auVar130._24_4_ = auVar123._24_4_ * 0.0;
    auVar130._28_4_ = auVar122._28_4_;
    auVar94 = vfmadd231ps_fma(auVar118,auVar117,ZEXT1632(auVar90));
    auVar101 = vfmadd231ps_fma(auVar125,auVar117,ZEXT1632(auVar87));
    auVar91 = vfmadd231ps_fma(auVar126,auVar117,auVar119);
    auVar90 = vfmadd231ps_fma(auVar130,auVar117,auVar120);
    auVar87 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar190 * auVar94._12_4_,
                                                 CONCAT48(fVar189 * auVar94._8_4_,
                                                          CONCAT44(fVar188 * auVar94._4_4_,
                                                                   fVar173 * auVar94._0_4_)))),
                              auVar117,ZEXT1632(auVar100));
    auVar125 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar101._12_4_ * fVar190,
                                             CONCAT48(auVar101._8_4_ * fVar189,
                                                      CONCAT44(auVar101._4_4_ * fVar188,
                                                               auVar101._0_4_ * fVar173)))),auVar117
                          ,auVar127);
    auVar126 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar91._12_4_ * fVar190,
                                             CONCAT48(auVar91._8_4_ * fVar189,
                                                      CONCAT44(auVar91._4_4_ * fVar188,
                                                               auVar91._0_4_ * fVar173)))),auVar117,
                          auVar128);
    auVar115 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar90._12_4_ * fVar190,
                                             CONCAT48(auVar90._8_4_ * fVar189,
                                                      CONCAT44(auVar90._4_4_ * fVar188,
                                                               auVar90._0_4_ * fVar173)))),auVar129,
                          auVar117);
    auVar117 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar100));
    auVar119 = vsubps_avx512vl(ZEXT1632(auVar101),auVar127);
    auVar120 = vsubps_avx512vl(ZEXT1632(auVar91),auVar128);
    auVar118 = vsubps_avx512vl(ZEXT1632(auVar90),auVar129);
    auVar144._0_4_ = fVar192 * auVar117._0_4_ * 3.0;
    auVar144._4_4_ = fVar192 * auVar117._4_4_ * 3.0;
    auVar144._8_4_ = fVar192 * auVar117._8_4_ * 3.0;
    auVar144._12_4_ = fVar192 * auVar117._12_4_ * 3.0;
    auVar144._16_4_ = fVar192 * auVar117._16_4_ * 3.0;
    auVar144._20_4_ = fVar192 * auVar117._20_4_ * 3.0;
    auVar144._24_4_ = fVar192 * auVar117._24_4_ * 3.0;
    auVar144._28_4_ = 0;
    auVar145._0_4_ = fVar192 * auVar119._0_4_ * 3.0;
    auVar145._4_4_ = fVar192 * auVar119._4_4_ * 3.0;
    auVar145._8_4_ = fVar192 * auVar119._8_4_ * 3.0;
    auVar145._12_4_ = fVar192 * auVar119._12_4_ * 3.0;
    auVar145._16_4_ = fVar192 * auVar119._16_4_ * 3.0;
    auVar145._20_4_ = fVar192 * auVar119._20_4_ * 3.0;
    auVar145._24_4_ = fVar192 * auVar119._24_4_ * 3.0;
    auVar145._28_4_ = 0;
    auVar127._4_4_ = fVar192 * auVar120._4_4_ * 3.0;
    auVar127._0_4_ = fVar192 * auVar120._0_4_ * 3.0;
    auVar127._8_4_ = fVar192 * auVar120._8_4_ * 3.0;
    auVar127._12_4_ = fVar192 * auVar120._12_4_ * 3.0;
    auVar127._16_4_ = fVar192 * auVar120._16_4_ * 3.0;
    auVar127._20_4_ = fVar192 * auVar120._20_4_ * 3.0;
    auVar127._24_4_ = fVar192 * auVar120._24_4_ * 3.0;
    auVar127._28_4_ = auVar123._28_4_;
    fVar173 = auVar118._0_4_ * 3.0 * fVar192;
    fVar188 = auVar118._4_4_ * 3.0 * fVar192;
    auVar128._4_4_ = fVar188;
    auVar128._0_4_ = fVar173;
    fVar189 = auVar118._8_4_ * 3.0 * fVar192;
    auVar128._8_4_ = fVar189;
    fVar190 = auVar118._12_4_ * 3.0 * fVar192;
    auVar128._12_4_ = fVar190;
    fVar191 = auVar118._16_4_ * 3.0 * fVar192;
    auVar128._16_4_ = fVar191;
    fVar193 = auVar118._20_4_ * 3.0 * fVar192;
    auVar128._20_4_ = fVar193;
    fVar194 = auVar118._24_4_ * 3.0 * fVar192;
    auVar128._24_4_ = fVar194;
    auVar128._28_4_ = fVar192;
    auVar100 = vxorps_avx512vl(auVar114._0_16_,auVar114._0_16_);
    auVar130 = vpermt2ps_avx512vl(ZEXT1632(auVar87),_DAT_01fb9fc0,ZEXT1632(auVar100));
    auVar131 = vpermt2ps_avx512vl(auVar125,_DAT_01fb9fc0,ZEXT1632(auVar100));
    auVar119 = ZEXT1632(auVar100);
    auVar132 = vpermt2ps_avx512vl(auVar126,_DAT_01fb9fc0,auVar119);
    auVar133._0_4_ = auVar115._0_4_ + fVar173;
    auVar133._4_4_ = auVar115._4_4_ + fVar188;
    auVar133._8_4_ = auVar115._8_4_ + fVar189;
    auVar133._12_4_ = auVar115._12_4_ + fVar190;
    auVar133._16_4_ = auVar115._16_4_ + fVar191;
    auVar133._20_4_ = auVar115._20_4_ + fVar193;
    auVar133._24_4_ = auVar115._24_4_ + fVar194;
    auVar133._28_4_ = auVar115._28_4_ + fVar192;
    auVar117 = vmaxps_avx(auVar115,auVar133);
    auVar121 = vminps_avx512vl(auVar115,auVar133);
    auVar122 = vpermt2ps_avx512vl(auVar115,_DAT_01fb9fc0,auVar119);
    auVar133 = vpermt2ps_avx512vl(auVar144,_DAT_01fb9fc0,auVar119);
    auVar134 = vpermt2ps_avx512vl(auVar145,_DAT_01fb9fc0,auVar119);
    auVar141 = ZEXT1632(auVar100);
    auVar135 = vpermt2ps_avx512vl(auVar127,_DAT_01fb9fc0,auVar141);
    auVar115 = vpermt2ps_avx512vl(auVar128,_DAT_01fb9fc0,auVar141);
    auVar115 = vsubps_avx(auVar122,auVar115);
    auVar119 = vsubps_avx(auVar130,ZEXT1632(auVar87));
    auVar120 = vsubps_avx(auVar131,auVar125);
    auVar118 = vsubps_avx(auVar132,auVar126);
    auVar123 = vmulps_avx512vl(auVar120,auVar127);
    auVar123 = vfmsub231ps_avx512vl(auVar123,auVar145,auVar118);
    auVar124 = vmulps_avx512vl(auVar118,auVar144);
    auVar124 = vfmsub231ps_avx512vl(auVar124,auVar127,auVar119);
    auVar128 = vmulps_avx512vl(auVar119,auVar145);
    auVar128 = vfmsub231ps_avx512vl(auVar128,auVar144,auVar120);
    auVar128 = vmulps_avx512vl(auVar128,auVar128);
    auVar124 = vfmadd231ps_avx512vl(auVar128,auVar124,auVar124);
    auVar123 = vfmadd231ps_avx512vl(auVar124,auVar123,auVar123);
    auVar124 = vmulps_avx512vl(auVar118,auVar118);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar120,auVar120);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar119,auVar119);
    auVar128 = vrcp14ps_avx512vl(auVar124);
    auVar129 = vfnmadd213ps_avx512vl(auVar128,auVar124,auVar116);
    auVar128 = vfmadd132ps_avx512vl(auVar129,auVar128,auVar128);
    auVar123 = vmulps_avx512vl(auVar123,auVar128);
    auVar129 = vmulps_avx512vl(auVar120,auVar135);
    auVar129 = vfmsub231ps_avx512vl(auVar129,auVar134,auVar118);
    auVar136 = vmulps_avx512vl(auVar118,auVar133);
    auVar136 = vfmsub231ps_avx512vl(auVar136,auVar135,auVar119);
    auVar137 = vmulps_avx512vl(auVar119,auVar134);
    auVar137 = vfmsub231ps_avx512vl(auVar137,auVar133,auVar120);
    auVar137 = vmulps_avx512vl(auVar137,auVar137);
    auVar136 = vfmadd231ps_avx512vl(auVar137,auVar136,auVar136);
    auVar129 = vfmadd231ps_avx512vl(auVar136,auVar129,auVar129);
    auVar128 = vmulps_avx512vl(auVar129,auVar128);
    auVar123 = vmaxps_avx512vl(auVar123,auVar128);
    auVar123 = vsqrtps_avx512vl(auVar123);
    auVar128 = vmaxps_avx512vl(auVar115,auVar122);
    auVar117 = vmaxps_avx512vl(auVar117,auVar128);
    auVar128 = vaddps_avx512vl(auVar123,auVar117);
    auVar117 = vminps_avx(auVar115,auVar122);
    auVar117 = vminps_avx512vl(auVar121,auVar117);
    auVar117 = vsubps_avx512vl(auVar117,auVar123);
    auVar115._8_4_ = 0x3f800002;
    auVar115._0_8_ = 0x3f8000023f800002;
    auVar115._12_4_ = 0x3f800002;
    auVar115._16_4_ = 0x3f800002;
    auVar115._20_4_ = 0x3f800002;
    auVar115._24_4_ = 0x3f800002;
    auVar115._28_4_ = 0x3f800002;
    auVar115 = vmulps_avx512vl(auVar128,auVar115);
    auVar121._8_4_ = 0x3f7ffffc;
    auVar121._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar121._12_4_ = 0x3f7ffffc;
    auVar121._16_4_ = 0x3f7ffffc;
    auVar121._20_4_ = 0x3f7ffffc;
    auVar121._24_4_ = 0x3f7ffffc;
    auVar121._28_4_ = 0x3f7ffffc;
    auVar117 = vmulps_avx512vl(auVar117,auVar121);
    auVar115 = vmulps_avx512vl(auVar115,auVar115);
    auVar121 = vrsqrt14ps_avx512vl(auVar124);
    auVar122._8_4_ = 0xbf000000;
    auVar122._0_8_ = 0xbf000000bf000000;
    auVar122._12_4_ = 0xbf000000;
    auVar122._16_4_ = 0xbf000000;
    auVar122._20_4_ = 0xbf000000;
    auVar122._24_4_ = 0xbf000000;
    auVar122._28_4_ = 0xbf000000;
    auVar122 = vmulps_avx512vl(auVar124,auVar122);
    fVar173 = auVar121._0_4_;
    fVar188 = auVar121._4_4_;
    fVar189 = auVar121._8_4_;
    fVar190 = auVar121._12_4_;
    fVar192 = auVar121._16_4_;
    fVar191 = auVar121._20_4_;
    fVar193 = auVar121._24_4_;
    auVar129._4_4_ = fVar188 * fVar188 * fVar188 * auVar122._4_4_;
    auVar129._0_4_ = fVar173 * fVar173 * fVar173 * auVar122._0_4_;
    auVar129._8_4_ = fVar189 * fVar189 * fVar189 * auVar122._8_4_;
    auVar129._12_4_ = fVar190 * fVar190 * fVar190 * auVar122._12_4_;
    auVar129._16_4_ = fVar192 * fVar192 * fVar192 * auVar122._16_4_;
    auVar129._20_4_ = fVar191 * fVar191 * fVar191 * auVar122._20_4_;
    auVar129._24_4_ = fVar193 * fVar193 * fVar193 * auVar122._24_4_;
    auVar129._28_4_ = auVar128._28_4_;
    auVar123._8_4_ = 0x3fc00000;
    auVar123._0_8_ = 0x3fc000003fc00000;
    auVar123._12_4_ = 0x3fc00000;
    auVar123._16_4_ = 0x3fc00000;
    auVar123._20_4_ = 0x3fc00000;
    auVar123._24_4_ = 0x3fc00000;
    auVar123._28_4_ = 0x3fc00000;
    auVar121 = vfmadd231ps_avx512vl(auVar129,auVar121,auVar123);
    auVar276 = ZEXT3264(auVar121);
    auVar122 = vmulps_avx512vl(auVar119,auVar121);
    auVar123 = vmulps_avx512vl(auVar120,auVar121);
    auVar124 = vmulps_avx512vl(auVar118,auVar121);
    auVar240 = ZEXT1632(auVar87);
    auVar128 = vsubps_avx512vl(auVar141,auVar240);
    auVar129 = vsubps_avx512vl(auVar141,auVar125);
    auVar136 = vsubps_avx512vl(auVar141,auVar126);
    auVar137 = vmulps_avx512vl(auVar280._0_32_,auVar136);
    auVar137 = vfmadd231ps_avx512vl(auVar137,local_620,auVar129);
    auVar137 = vfmadd231ps_avx512vl(auVar137,auVar279._0_32_,auVar128);
    auVar138 = vmulps_avx512vl(auVar136,auVar136);
    auVar138 = vfmadd231ps_avx512vl(auVar138,auVar129,auVar129);
    auVar138 = vfmadd231ps_avx512vl(auVar138,auVar128,auVar128);
    auVar139 = vmulps_avx512vl(auVar280._0_32_,auVar124);
    auVar139 = vfmadd231ps_avx512vl(auVar139,auVar123,local_620);
    auVar139 = vfmadd231ps_avx512vl(auVar139,auVar122,auVar279._0_32_);
    auVar124 = vmulps_avx512vl(auVar136,auVar124);
    auVar123 = vfmadd231ps_avx512vl(auVar124,auVar129,auVar123);
    auVar122 = vfmadd231ps_avx512vl(auVar123,auVar128,auVar122);
    auVar123 = vmulps_avx512vl(auVar139,auVar139);
    auVar140 = vsubps_avx512vl(local_560,auVar123);
    auVar124 = vmulps_avx512vl(auVar139,auVar122);
    auVar124 = vsubps_avx512vl(auVar137,auVar124);
    auVar137 = vaddps_avx512vl(auVar124,auVar124);
    auVar124 = vmulps_avx512vl(auVar122,auVar122);
    auVar138 = vsubps_avx512vl(auVar138,auVar124);
    auVar115 = vsubps_avx512vl(auVar138,auVar115);
    local_760 = vmulps_avx512vl(auVar137,auVar137);
    auVar124._8_4_ = 0x40800000;
    auVar124._0_8_ = 0x4080000040800000;
    auVar124._12_4_ = 0x40800000;
    auVar124._16_4_ = 0x40800000;
    auVar124._20_4_ = 0x40800000;
    auVar124._24_4_ = 0x40800000;
    auVar124._28_4_ = 0x40800000;
    _local_780 = vmulps_avx512vl(auVar140,auVar124);
    auVar124 = vmulps_avx512vl(_local_780,auVar115);
    auVar124 = vsubps_avx512vl(local_760,auVar124);
    uVar79 = vcmpps_avx512vl(auVar124,auVar141,5);
    bVar67 = (byte)uVar79;
    if (bVar67 == 0) {
LAB_018a333c:
      auVar251 = ZEXT3264(_DAT_01f7b040);
      auVar280 = ZEXT3264(local_a20);
      auVar279 = ZEXT3264(local_a00);
      auVar268 = ZEXT3264(local_ac0);
      auVar263 = ZEXT3264(local_a80);
      auVar261 = ZEXT3264(local_a60);
      auVar241 = ZEXT3264(local_9e0);
      auVar256 = ZEXT3264(local_aa0);
      auVar117 = vmovdqa64_avx512vl(auVar105);
      auVar277 = ZEXT3264(auVar117);
      auVar117 = vmovdqa64_avx512vl(auVar106);
      auVar278 = ZEXT3264(auVar117);
    }
    else {
      local_900._0_32_ = auVar138;
      auVar124 = vsqrtps_avx512vl(auVar124);
      local_7a0 = vaddps_avx512vl(auVar140,auVar140);
      local_7c0 = vrcp14ps_avx512vl(local_7a0);
      auVar116 = vfnmadd213ps_avx512vl(local_7c0,local_7a0,auVar116);
      auVar141 = vfmadd132ps_avx512vl(auVar116,local_7c0,local_7c0);
      auVar116._8_4_ = 0x80000000;
      auVar116._0_8_ = 0x8000000080000000;
      auVar116._12_4_ = 0x80000000;
      auVar116._16_4_ = 0x80000000;
      auVar116._20_4_ = 0x80000000;
      auVar116._24_4_ = 0x80000000;
      auVar116._28_4_ = 0x80000000;
      local_7e0 = vxorps_avx512vl(auVar137,auVar116);
      auVar116 = vsubps_avx512vl(local_7e0,auVar124);
      local_9a0 = vmulps_avx512vl(auVar116,auVar141);
      auVar124 = vsubps_avx512vl(auVar124,auVar137);
      local_800 = vmulps_avx512vl(auVar124,auVar141);
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar116 = vblendmps_avx512vl(auVar124,local_9a0);
      auVar142._0_4_ =
           (uint)(bVar67 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar124._0_4_;
      bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar142._4_4_ = (uint)bVar78 * auVar116._4_4_ | (uint)!bVar78 * auVar124._4_4_;
      bVar78 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar142._8_4_ = (uint)bVar78 * auVar116._8_4_ | (uint)!bVar78 * auVar124._8_4_;
      bVar78 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar142._12_4_ = (uint)bVar78 * auVar116._12_4_ | (uint)!bVar78 * auVar124._12_4_;
      bVar78 = (bool)((byte)(uVar79 >> 4) & 1);
      auVar142._16_4_ = (uint)bVar78 * auVar116._16_4_ | (uint)!bVar78 * auVar124._16_4_;
      bVar78 = (bool)((byte)(uVar79 >> 5) & 1);
      auVar142._20_4_ = (uint)bVar78 * auVar116._20_4_ | (uint)!bVar78 * auVar124._20_4_;
      bVar78 = (bool)((byte)(uVar79 >> 6) & 1);
      auVar142._24_4_ = (uint)bVar78 * auVar116._24_4_ | (uint)!bVar78 * auVar124._24_4_;
      bVar78 = SUB81(uVar79 >> 7,0);
      auVar142._28_4_ = (uint)bVar78 * auVar116._28_4_ | (uint)!bVar78 * auVar124._28_4_;
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar116 = vblendmps_avx512vl(auVar124,local_800);
      auVar143._0_4_ =
           (uint)(bVar67 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar124._0_4_;
      bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar143._4_4_ = (uint)bVar78 * auVar116._4_4_ | (uint)!bVar78 * auVar124._4_4_;
      bVar78 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar143._8_4_ = (uint)bVar78 * auVar116._8_4_ | (uint)!bVar78 * auVar124._8_4_;
      bVar78 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar143._12_4_ = (uint)bVar78 * auVar116._12_4_ | (uint)!bVar78 * auVar124._12_4_;
      bVar78 = (bool)((byte)(uVar79 >> 4) & 1);
      auVar143._16_4_ = (uint)bVar78 * auVar116._16_4_ | (uint)!bVar78 * auVar124._16_4_;
      bVar78 = (bool)((byte)(uVar79 >> 5) & 1);
      auVar143._20_4_ = (uint)bVar78 * auVar116._20_4_ | (uint)!bVar78 * auVar124._20_4_;
      bVar78 = (bool)((byte)(uVar79 >> 6) & 1);
      auVar143._24_4_ = (uint)bVar78 * auVar116._24_4_ | (uint)!bVar78 * auVar124._24_4_;
      bVar78 = SUB81(uVar79 >> 7,0);
      auVar143._28_4_ = (uint)bVar78 * auVar116._28_4_ | (uint)!bVar78 * auVar124._28_4_;
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar123,auVar124);
      local_9c0 = vmaxps_avx512vl(local_580,auVar124);
      auVar141._8_4_ = 0x36000000;
      auVar141._0_8_ = 0x3600000036000000;
      auVar141._12_4_ = 0x36000000;
      auVar141._16_4_ = 0x36000000;
      auVar141._20_4_ = 0x36000000;
      auVar141._24_4_ = 0x36000000;
      auVar141._28_4_ = 0x36000000;
      local_820 = vmulps_avx512vl(local_9c0,auVar141);
      vandps_avx512vl(auVar140,auVar124);
      uVar71 = vcmpps_avx512vl(local_820,local_820,1);
      uVar79 = uVar79 & uVar71;
      bVar74 = (byte)uVar79;
      if (bVar74 != 0) {
        uVar71 = vcmpps_avx512vl(auVar115,_DAT_01f7b000,2);
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar123 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar124 = vblendmps_avx512vl(auVar115,auVar123);
        bVar73 = (byte)uVar71;
        uVar80 = (uint)(bVar73 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar73 & 1) * local_820._0_4_;
        bVar78 = (bool)((byte)(uVar71 >> 1) & 1);
        uVar151 = (uint)bVar78 * auVar124._4_4_ | (uint)!bVar78 * local_820._4_4_;
        bVar78 = (bool)((byte)(uVar71 >> 2) & 1);
        uVar152 = (uint)bVar78 * auVar124._8_4_ | (uint)!bVar78 * local_820._8_4_;
        bVar78 = (bool)((byte)(uVar71 >> 3) & 1);
        uVar153 = (uint)bVar78 * auVar124._12_4_ | (uint)!bVar78 * local_820._12_4_;
        bVar78 = (bool)((byte)(uVar71 >> 4) & 1);
        uVar154 = (uint)bVar78 * auVar124._16_4_ | (uint)!bVar78 * local_820._16_4_;
        bVar78 = (bool)((byte)(uVar71 >> 5) & 1);
        uVar155 = (uint)bVar78 * auVar124._20_4_ | (uint)!bVar78 * local_820._20_4_;
        bVar78 = (bool)((byte)(uVar71 >> 6) & 1);
        uVar156 = (uint)bVar78 * auVar124._24_4_ | (uint)!bVar78 * local_820._24_4_;
        bVar78 = SUB81(uVar71 >> 7,0);
        uVar157 = (uint)bVar78 * auVar124._28_4_ | (uint)!bVar78 * local_820._28_4_;
        auVar142._0_4_ = (bVar74 & 1) * uVar80 | !(bool)(bVar74 & 1) * auVar142._0_4_;
        bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar142._4_4_ = bVar78 * uVar151 | !bVar78 * auVar142._4_4_;
        bVar78 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar142._8_4_ = bVar78 * uVar152 | !bVar78 * auVar142._8_4_;
        bVar78 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar142._12_4_ = bVar78 * uVar153 | !bVar78 * auVar142._12_4_;
        bVar78 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar142._16_4_ = bVar78 * uVar154 | !bVar78 * auVar142._16_4_;
        bVar78 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar142._20_4_ = bVar78 * uVar155 | !bVar78 * auVar142._20_4_;
        bVar78 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar142._24_4_ = bVar78 * uVar156 | !bVar78 * auVar142._24_4_;
        bVar78 = SUB81(uVar79 >> 7,0);
        auVar142._28_4_ = bVar78 * uVar157 | !bVar78 * auVar142._28_4_;
        auVar115 = vblendmps_avx512vl(auVar123,auVar115);
        bVar78 = (bool)((byte)(uVar71 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar71 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar71 >> 3) & 1);
        bVar17 = (bool)((byte)(uVar71 >> 4) & 1);
        bVar18 = (bool)((byte)(uVar71 >> 5) & 1);
        bVar19 = (bool)((byte)(uVar71 >> 6) & 1);
        bVar20 = SUB81(uVar71 >> 7,0);
        auVar143._0_4_ =
             (uint)(bVar74 & 1) *
             ((uint)(bVar73 & 1) * auVar115._0_4_ | !(bool)(bVar73 & 1) * uVar80) |
             !(bool)(bVar74 & 1) * auVar143._0_4_;
        bVar14 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar143._4_4_ =
             (uint)bVar14 * ((uint)bVar78 * auVar115._4_4_ | !bVar78 * uVar151) |
             !bVar14 * auVar143._4_4_;
        bVar78 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar143._8_4_ =
             (uint)bVar78 * ((uint)bVar15 * auVar115._8_4_ | !bVar15 * uVar152) |
             !bVar78 * auVar143._8_4_;
        bVar78 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar143._12_4_ =
             (uint)bVar78 * ((uint)bVar16 * auVar115._12_4_ | !bVar16 * uVar153) |
             !bVar78 * auVar143._12_4_;
        bVar78 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar143._16_4_ =
             (uint)bVar78 * ((uint)bVar17 * auVar115._16_4_ | !bVar17 * uVar154) |
             !bVar78 * auVar143._16_4_;
        bVar78 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar143._20_4_ =
             (uint)bVar78 * ((uint)bVar18 * auVar115._20_4_ | !bVar18 * uVar155) |
             !bVar78 * auVar143._20_4_;
        bVar78 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar143._24_4_ =
             (uint)bVar78 * ((uint)bVar19 * auVar115._24_4_ | !bVar19 * uVar156) |
             !bVar78 * auVar143._24_4_;
        bVar78 = SUB81(uVar79 >> 7,0);
        auVar143._28_4_ =
             (uint)bVar78 * ((uint)bVar20 * auVar115._28_4_ | !bVar20 * uVar157) |
             !bVar78 * auVar143._28_4_;
        bVar67 = (~bVar74 | bVar73) & bVar67;
      }
      if ((bVar67 & 0x7f) == 0) goto LAB_018a333c;
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar123 = vxorps_avx512vl(auVar135,auVar115);
      auVar124 = vxorps_avx512vl(auVar133,auVar115);
      auVar172 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
      auVar116 = vxorps_avx512vl(auVar134,auVar115);
      auVar100 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x200)),
                                ZEXT416((uint)local_970._0_4_));
      auVar133 = vbroadcastss_avx512vl(auVar100);
      auVar133 = vminps_avx512vl(auVar133,auVar143);
      auVar135._4_4_ = fStack_59c;
      auVar135._0_4_ = local_5a0;
      auVar135._8_4_ = fStack_598;
      auVar135._12_4_ = fStack_594;
      auVar135._16_4_ = fStack_590;
      auVar135._20_4_ = fStack_58c;
      auVar135._24_4_ = fStack_588;
      auVar135._28_4_ = fStack_584;
      auVar135 = vmaxps_avx512vl(auVar135,auVar142);
      auVar134 = vmulps_avx512vl(auVar136,auVar127);
      auVar129 = vfmadd213ps_avx512vl(auVar129,auVar145,auVar134);
      auVar100 = vfmadd213ps_fma(auVar128,auVar144,auVar129);
      auVar127 = vmulps_avx512vl(local_a20,auVar127);
      auVar127 = vfmadd231ps_avx512vl(auVar127,local_620,auVar145);
      auVar127 = vfmadd231ps_avx512vl(auVar127,local_a00,auVar144);
      auVar128 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar127,auVar128);
      auVar129 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar29 = vcmpps_avx512vl(auVar128,auVar129,1);
      auVar136 = vxorps_avx512vl(ZEXT1632(auVar100),auVar115);
      auVar140 = vrcp14ps_avx512vl(auVar127);
      auVar144 = vxorps_avx512vl(auVar127,auVar115);
      auVar145 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar134 = vfnmadd213ps_avx512vl(auVar140,auVar127,auVar145);
      auVar100 = vfmadd132ps_fma(auVar134,auVar140,auVar140);
      fVar173 = auVar100._0_4_ * auVar136._0_4_;
      fVar188 = auVar100._4_4_ * auVar136._4_4_;
      auVar134._4_4_ = fVar188;
      auVar134._0_4_ = fVar173;
      fVar189 = auVar100._8_4_ * auVar136._8_4_;
      auVar134._8_4_ = fVar189;
      fVar190 = auVar100._12_4_ * auVar136._12_4_;
      auVar134._12_4_ = fVar190;
      fVar192 = auVar136._16_4_ * 0.0;
      auVar134._16_4_ = fVar192;
      fVar191 = auVar136._20_4_ * 0.0;
      auVar134._20_4_ = fVar191;
      fVar193 = auVar136._24_4_ * 0.0;
      auVar134._24_4_ = fVar193;
      auVar134._28_4_ = auVar136._28_4_;
      uVar31 = vcmpps_avx512vl(auVar127,auVar144,1);
      bVar74 = (byte)uVar29 | (byte)uVar31;
      auVar141 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar134 = vblendmps_avx512vl(auVar134,auVar141);
      auVar146._0_4_ =
           (uint)(bVar74 & 1) * auVar134._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar140._0_4_;
      bVar78 = (bool)(bVar74 >> 1 & 1);
      auVar146._4_4_ = (uint)bVar78 * auVar134._4_4_ | (uint)!bVar78 * auVar140._4_4_;
      bVar78 = (bool)(bVar74 >> 2 & 1);
      auVar146._8_4_ = (uint)bVar78 * auVar134._8_4_ | (uint)!bVar78 * auVar140._8_4_;
      bVar78 = (bool)(bVar74 >> 3 & 1);
      auVar146._12_4_ = (uint)bVar78 * auVar134._12_4_ | (uint)!bVar78 * auVar140._12_4_;
      bVar78 = (bool)(bVar74 >> 4 & 1);
      auVar146._16_4_ = (uint)bVar78 * auVar134._16_4_ | (uint)!bVar78 * auVar140._16_4_;
      bVar78 = (bool)(bVar74 >> 5 & 1);
      auVar146._20_4_ = (uint)bVar78 * auVar134._20_4_ | (uint)!bVar78 * auVar140._20_4_;
      bVar78 = (bool)(bVar74 >> 6 & 1);
      auVar146._24_4_ = (uint)bVar78 * auVar134._24_4_ | (uint)!bVar78 * auVar140._24_4_;
      auVar146._28_4_ =
           (uint)(bVar74 >> 7) * auVar134._28_4_ | (uint)!(bool)(bVar74 >> 7) * auVar140._28_4_;
      auVar134 = vmaxps_avx512vl(auVar135,auVar146);
      uVar31 = vcmpps_avx512vl(auVar127,auVar144,6);
      bVar74 = (byte)uVar29 | (byte)uVar31;
      auVar140._0_4_ = (uint)(bVar74 & 1) * 0x7f800000 | (uint)!(bool)(bVar74 & 1) * (int)fVar173;
      bVar78 = (bool)(bVar74 >> 1 & 1);
      auVar140._4_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar188;
      bVar78 = (bool)(bVar74 >> 2 & 1);
      auVar140._8_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar189;
      bVar78 = (bool)(bVar74 >> 3 & 1);
      auVar140._12_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar190;
      bVar78 = (bool)(bVar74 >> 4 & 1);
      auVar140._16_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar192;
      bVar78 = (bool)(bVar74 >> 5 & 1);
      auVar140._20_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar191;
      bVar78 = (bool)(bVar74 >> 6 & 1);
      auVar140._24_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar193;
      auVar140._28_4_ =
           (uint)(bVar74 >> 7) * 0x7f800000 | (uint)!(bool)(bVar74 >> 7) * auVar136._28_4_;
      auVar127 = vminps_avx512vl(auVar133,auVar140);
      auVar100 = vxorps_avx512vl(auVar135._0_16_,auVar135._0_16_);
      auVar130 = vsubps_avx512vl(ZEXT1632(auVar100),auVar130);
      auVar131 = vsubps_avx512vl(ZEXT1632(auVar100),auVar131);
      auVar133 = ZEXT1632(auVar100);
      auVar132 = vsubps_avx512vl(auVar133,auVar132);
      auVar132 = vmulps_avx512vl(auVar132,auVar123);
      auVar131 = vfmadd231ps_avx512vl(auVar132,auVar116,auVar131);
      auVar130 = vfmadd231ps_avx512vl(auVar131,auVar124,auVar130);
      auVar123 = vmulps_avx512vl(local_a20,auVar123);
      auVar123 = vfmadd231ps_avx512vl(auVar123,local_620,auVar116);
      auVar123 = vfmadd231ps_avx512vl(auVar123,local_a00,auVar124);
      vandps_avx512vl(auVar123,auVar128);
      uVar29 = vcmpps_avx512vl(auVar123,auVar129,1);
      auVar124 = vxorps_avx512vl(auVar130,auVar115);
      auVar130 = vrcp14ps_avx512vl(auVar123);
      auVar115 = vxorps_avx512vl(auVar123,auVar115);
      auVar128 = vfnmadd213ps_avx512vl(auVar130,auVar123,auVar145);
      auVar100 = vfmadd132ps_fma(auVar128,auVar130,auVar130);
      fVar173 = auVar100._0_4_ * auVar124._0_4_;
      fVar188 = auVar100._4_4_ * auVar124._4_4_;
      auVar131._4_4_ = fVar188;
      auVar131._0_4_ = fVar173;
      fVar189 = auVar100._8_4_ * auVar124._8_4_;
      auVar131._8_4_ = fVar189;
      fVar190 = auVar100._12_4_ * auVar124._12_4_;
      auVar131._12_4_ = fVar190;
      fVar192 = auVar124._16_4_ * 0.0;
      auVar131._16_4_ = fVar192;
      fVar191 = auVar124._20_4_ * 0.0;
      auVar131._20_4_ = fVar191;
      fVar193 = auVar124._24_4_ * 0.0;
      auVar131._24_4_ = fVar193;
      auVar131._28_4_ = auVar124._28_4_;
      uVar31 = vcmpps_avx512vl(auVar123,auVar115,1);
      bVar74 = (byte)uVar29 | (byte)uVar31;
      auVar128 = vblendmps_avx512vl(auVar131,auVar141);
      auVar132._0_4_ =
           (uint)(bVar74 & 1) * auVar128._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar130._0_4_;
      bVar78 = (bool)(bVar74 >> 1 & 1);
      auVar132._4_4_ = (uint)bVar78 * auVar128._4_4_ | (uint)!bVar78 * auVar130._4_4_;
      bVar78 = (bool)(bVar74 >> 2 & 1);
      auVar132._8_4_ = (uint)bVar78 * auVar128._8_4_ | (uint)!bVar78 * auVar130._8_4_;
      bVar78 = (bool)(bVar74 >> 3 & 1);
      auVar132._12_4_ = (uint)bVar78 * auVar128._12_4_ | (uint)!bVar78 * auVar130._12_4_;
      bVar78 = (bool)(bVar74 >> 4 & 1);
      auVar132._16_4_ = (uint)bVar78 * auVar128._16_4_ | (uint)!bVar78 * auVar130._16_4_;
      bVar78 = (bool)(bVar74 >> 5 & 1);
      auVar132._20_4_ = (uint)bVar78 * auVar128._20_4_ | (uint)!bVar78 * auVar130._20_4_;
      bVar78 = (bool)(bVar74 >> 6 & 1);
      auVar132._24_4_ = (uint)bVar78 * auVar128._24_4_ | (uint)!bVar78 * auVar130._24_4_;
      auVar132._28_4_ =
           (uint)(bVar74 >> 7) * auVar128._28_4_ | (uint)!(bool)(bVar74 >> 7) * auVar130._28_4_;
      local_740 = vmaxps_avx(auVar134,auVar132);
      uVar31 = vcmpps_avx512vl(auVar123,auVar115,6);
      bVar74 = (byte)uVar29 | (byte)uVar31;
      auVar136._0_4_ = (uint)(bVar74 & 1) * 0x7f800000 | (uint)!(bool)(bVar74 & 1) * (int)fVar173;
      bVar78 = (bool)(bVar74 >> 1 & 1);
      auVar136._4_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar188;
      bVar78 = (bool)(bVar74 >> 2 & 1);
      auVar136._8_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar189;
      bVar78 = (bool)(bVar74 >> 3 & 1);
      auVar136._12_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar190;
      bVar78 = (bool)(bVar74 >> 4 & 1);
      auVar136._16_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar192;
      bVar78 = (bool)(bVar74 >> 5 & 1);
      auVar136._20_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar191;
      bVar78 = (bool)(bVar74 >> 6 & 1);
      auVar136._24_4_ = (uint)bVar78 * 0x7f800000 | (uint)!bVar78 * (int)fVar193;
      auVar136._28_4_ =
           (uint)(bVar74 >> 7) * 0x7f800000 | (uint)!(bool)(bVar74 >> 7) * auVar124._28_4_;
      local_5e0 = vminps_avx(auVar127,auVar136);
      uVar29 = vcmpps_avx512vl(local_740,local_5e0,2);
      bVar67 = bVar67 & 0x7f & (byte)uVar29;
      if (bVar67 == 0) {
        auVar281 = ZEXT3264(local_b00);
        goto LAB_018a333c;
      }
      auVar115 = vmaxps_avx512vl(auVar133,auVar117);
      auVar117 = vfmadd213ps_avx512vl(local_9a0,auVar139,auVar122);
      fVar173 = auVar121._0_4_;
      fVar188 = auVar121._4_4_;
      auVar46._4_4_ = fVar188 * auVar117._4_4_;
      auVar46._0_4_ = fVar173 * auVar117._0_4_;
      fVar189 = auVar121._8_4_;
      auVar46._8_4_ = fVar189 * auVar117._8_4_;
      fVar190 = auVar121._12_4_;
      auVar46._12_4_ = fVar190 * auVar117._12_4_;
      fVar192 = auVar121._16_4_;
      auVar46._16_4_ = fVar192 * auVar117._16_4_;
      fVar191 = auVar121._20_4_;
      auVar46._20_4_ = fVar191 * auVar117._20_4_;
      fVar193 = auVar121._24_4_;
      auVar46._24_4_ = fVar193 * auVar117._24_4_;
      auVar46._28_4_ = auVar117._28_4_;
      auVar117 = vfmadd213ps_avx512vl(local_800,auVar139,auVar122);
      auVar47._4_4_ = fVar188 * auVar117._4_4_;
      auVar47._0_4_ = fVar173 * auVar117._0_4_;
      auVar47._8_4_ = fVar189 * auVar117._8_4_;
      auVar47._12_4_ = fVar190 * auVar117._12_4_;
      auVar47._16_4_ = fVar192 * auVar117._16_4_;
      auVar47._20_4_ = fVar191 * auVar117._20_4_;
      auVar47._24_4_ = fVar193 * auVar117._24_4_;
      auVar47._28_4_ = auVar117._28_4_;
      auVar117 = vminps_avx512vl(auVar46,auVar145);
      auVar123 = ZEXT832(0) << 0x20;
      auVar117 = vmaxps_avx(auVar117,ZEXT832(0) << 0x20);
      auVar124 = vminps_avx512vl(auVar47,auVar145);
      auVar48._4_4_ = (auVar117._4_4_ + 1.0) * 0.125;
      auVar48._0_4_ = (auVar117._0_4_ + 0.0) * 0.125;
      auVar48._8_4_ = (auVar117._8_4_ + 2.0) * 0.125;
      auVar48._12_4_ = (auVar117._12_4_ + 3.0) * 0.125;
      auVar48._16_4_ = (auVar117._16_4_ + 4.0) * 0.125;
      auVar48._20_4_ = (auVar117._20_4_ + 5.0) * 0.125;
      auVar48._24_4_ = (auVar117._24_4_ + 6.0) * 0.125;
      auVar48._28_4_ = auVar117._28_4_ + 7.0;
      local_4e0 = vfmadd213ps_avx512vl(auVar48,auVar233,auVar211);
      auVar117 = vmaxps_avx(auVar124,ZEXT832(0) << 0x20);
      auVar49._4_4_ = (auVar117._4_4_ + 1.0) * 0.125;
      auVar49._0_4_ = (auVar117._0_4_ + 0.0) * 0.125;
      auVar49._8_4_ = (auVar117._8_4_ + 2.0) * 0.125;
      auVar49._12_4_ = (auVar117._12_4_ + 3.0) * 0.125;
      auVar49._16_4_ = (auVar117._16_4_ + 4.0) * 0.125;
      auVar49._20_4_ = (auVar117._20_4_ + 5.0) * 0.125;
      auVar49._24_4_ = (auVar117._24_4_ + 6.0) * 0.125;
      auVar49._28_4_ = auVar117._28_4_ + 7.0;
      local_500 = vfmadd213ps_avx512vl(auVar49,auVar233,auVar211);
      auVar50._4_4_ = auVar115._4_4_ * auVar115._4_4_;
      auVar50._0_4_ = auVar115._0_4_ * auVar115._0_4_;
      auVar50._8_4_ = auVar115._8_4_ * auVar115._8_4_;
      auVar50._12_4_ = auVar115._12_4_ * auVar115._12_4_;
      auVar50._16_4_ = auVar115._16_4_ * auVar115._16_4_;
      auVar50._20_4_ = auVar115._20_4_ * auVar115._20_4_;
      auVar50._24_4_ = auVar115._24_4_ * auVar115._24_4_;
      auVar50._28_4_ = auVar115._28_4_;
      auVar117 = vsubps_avx(auVar138,auVar50);
      auVar138._4_4_ = auVar117._4_4_ * (float)local_780._4_4_;
      auVar138._0_4_ = auVar117._0_4_ * (float)local_780._0_4_;
      auVar138._8_4_ = auVar117._8_4_ * fStack_778;
      auVar138._12_4_ = auVar117._12_4_ * fStack_774;
      auVar138._16_4_ = auVar117._16_4_ * fStack_770;
      auVar138._20_4_ = auVar117._20_4_ * fStack_76c;
      auVar138._24_4_ = auVar117._24_4_ * fStack_768;
      auVar138._28_4_ = auVar115._28_4_;
      auVar115 = vsubps_avx(local_760,auVar138);
      uVar29 = vcmpps_avx512vl(auVar115,ZEXT832(0) << 0x20,5);
      bVar74 = (byte)uVar29;
      auVar281 = ZEXT3264(local_b00);
      if (bVar74 == 0) {
        bVar74 = 0;
        auVar119 = ZEXT832(0) << 0x20;
        auVar120 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar124 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar130 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar115 = ZEXT832(0) << 0x20;
        auVar137._8_4_ = 0x7f800000;
        auVar137._0_8_ = 0x7f8000007f800000;
        auVar137._12_4_ = 0x7f800000;
        auVar137._16_4_ = 0x7f800000;
        auVar137._20_4_ = 0x7f800000;
        auVar137._24_4_ = 0x7f800000;
        auVar137._28_4_ = 0x7f800000;
        auVar139._8_4_ = 0xff800000;
        auVar139._0_8_ = 0xff800000ff800000;
        auVar139._12_4_ = 0xff800000;
        auVar139._16_4_ = 0xff800000;
        auVar139._20_4_ = 0xff800000;
        auVar139._24_4_ = 0xff800000;
        auVar139._28_4_ = 0xff800000;
      }
      else {
        auVar94 = vxorps_avx512vl(auVar218,auVar218);
        uVar79 = vcmpps_avx512vl(auVar115,auVar133,5);
        auVar115 = vsqrtps_avx(auVar115);
        auVar123 = vfnmadd213ps_avx512vl(local_7a0,local_7c0,auVar145);
        auVar100 = vfmadd132ps_fma(auVar123,local_7c0,local_7c0);
        auVar123 = vsubps_avx(local_7e0,auVar115);
        auVar51._4_4_ = auVar100._4_4_ * auVar123._4_4_;
        auVar51._0_4_ = auVar100._0_4_ * auVar123._0_4_;
        auVar51._8_4_ = auVar100._8_4_ * auVar123._8_4_;
        auVar51._12_4_ = auVar100._12_4_ * auVar123._12_4_;
        auVar51._16_4_ = auVar123._16_4_ * 0.0;
        auVar51._20_4_ = auVar123._20_4_ * 0.0;
        auVar51._24_4_ = auVar123._24_4_ * 0.0;
        auVar51._28_4_ = 0x3e000000;
        auVar115 = vsubps_avx512vl(auVar115,auVar137);
        auVar52._4_4_ = auVar100._4_4_ * auVar115._4_4_;
        auVar52._0_4_ = auVar100._0_4_ * auVar115._0_4_;
        auVar52._8_4_ = auVar100._8_4_ * auVar115._8_4_;
        auVar52._12_4_ = auVar100._12_4_ * auVar115._12_4_;
        auVar52._16_4_ = auVar115._16_4_ * 0.0;
        auVar52._20_4_ = auVar115._20_4_ * 0.0;
        auVar52._24_4_ = auVar115._24_4_ * 0.0;
        auVar52._28_4_ = auVar211._0_4_;
        auVar115 = vfmadd213ps_avx512vl(auVar139,auVar51,auVar122);
        auVar267._0_4_ = fVar173 * auVar115._0_4_;
        auVar267._4_4_ = fVar188 * auVar115._4_4_;
        auVar267._8_4_ = fVar189 * auVar115._8_4_;
        auVar267._12_4_ = fVar190 * auVar115._12_4_;
        auVar267._16_4_ = fVar192 * auVar115._16_4_;
        auVar267._20_4_ = fVar191 * auVar115._20_4_;
        auVar267._24_4_ = fVar193 * auVar115._24_4_;
        auVar267._28_4_ = 0;
        auVar115 = vmulps_avx512vl(local_a00,auVar51);
        auVar123 = vmulps_avx512vl(local_620,auVar51);
        auVar127 = vmulps_avx512vl(local_a20,auVar51);
        auVar124 = vfmadd213ps_avx512vl(auVar119,auVar267,auVar240);
        auVar124 = vsubps_avx512vl(auVar115,auVar124);
        auVar115 = vfmadd213ps_avx512vl(auVar120,auVar267,auVar125);
        auVar130 = vsubps_avx512vl(auVar123,auVar115);
        auVar100 = vfmadd213ps_fma(auVar267,auVar118,auVar126);
        auVar115 = vsubps_avx(auVar127,ZEXT1632(auVar100));
        auVar122 = vfmadd213ps_avx512vl(auVar139,auVar52,auVar122);
        auVar121 = vmulps_avx512vl(auVar121,auVar122);
        auVar276 = ZEXT3264(auVar121);
        auVar122 = vmulps_avx512vl(local_a00,auVar52);
        auVar127 = vmulps_avx512vl(local_620,auVar52);
        auVar128 = vmulps_avx512vl(local_a20,auVar52);
        auVar100 = vfmadd213ps_fma(auVar119,auVar121,auVar240);
        auVar123 = vsubps_avx(auVar122,ZEXT1632(auVar100));
        auVar100 = vfmadd213ps_fma(auVar120,auVar121,auVar125);
        auVar119 = vsubps_avx512vl(auVar127,ZEXT1632(auVar100));
        auVar100 = vfmadd213ps_fma(auVar118,auVar121,auVar126);
        auVar120 = vsubps_avx512vl(auVar128,ZEXT1632(auVar100));
        auVar212._8_4_ = 0x7f800000;
        auVar212._0_8_ = 0x7f8000007f800000;
        auVar212._12_4_ = 0x7f800000;
        auVar212._16_4_ = 0x7f800000;
        auVar212._20_4_ = 0x7f800000;
        auVar212._24_4_ = 0x7f800000;
        auVar212._28_4_ = 0x7f800000;
        auVar118 = vblendmps_avx512vl(auVar212,auVar51);
        bVar78 = (bool)((byte)uVar79 & 1);
        auVar137._0_4_ = (uint)bVar78 * auVar118._0_4_ | (uint)!bVar78 * auVar87._0_4_;
        bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar137._4_4_ = (uint)bVar78 * auVar118._4_4_ | (uint)!bVar78 * auVar87._4_4_;
        bVar78 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar137._8_4_ = (uint)bVar78 * auVar118._8_4_ | (uint)!bVar78 * auVar87._8_4_;
        bVar78 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar137._12_4_ = (uint)bVar78 * auVar118._12_4_ | (uint)!bVar78 * auVar87._12_4_;
        iVar1 = (uint)((byte)(uVar79 >> 4) & 1) * auVar118._16_4_;
        auVar137._16_4_ = iVar1;
        iVar2 = (uint)((byte)(uVar79 >> 5) & 1) * auVar118._20_4_;
        auVar137._20_4_ = iVar2;
        iVar3 = (uint)((byte)(uVar79 >> 6) & 1) * auVar118._24_4_;
        auVar137._24_4_ = iVar3;
        iVar4 = (uint)(byte)(uVar79 >> 7) * auVar118._28_4_;
        auVar137._28_4_ = iVar4;
        auVar213._8_4_ = 0xff800000;
        auVar213._0_8_ = 0xff800000ff800000;
        auVar213._12_4_ = 0xff800000;
        auVar213._16_4_ = 0xff800000;
        auVar213._20_4_ = 0xff800000;
        auVar213._24_4_ = 0xff800000;
        auVar213._28_4_ = 0xff800000;
        auVar118 = vblendmps_avx512vl(auVar213,auVar52);
        bVar78 = (bool)((byte)uVar79 & 1);
        auVar139._0_4_ = (uint)bVar78 * auVar118._0_4_ | (uint)!bVar78 * -0x800000;
        bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar139._4_4_ = (uint)bVar78 * auVar118._4_4_ | (uint)!bVar78 * -0x800000;
        bVar78 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar139._8_4_ = (uint)bVar78 * auVar118._8_4_ | (uint)!bVar78 * -0x800000;
        bVar78 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar139._12_4_ = (uint)bVar78 * auVar118._12_4_ | (uint)!bVar78 * -0x800000;
        bVar78 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar139._16_4_ = (uint)bVar78 * auVar118._16_4_ | (uint)!bVar78 * -0x800000;
        bVar78 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar139._20_4_ = (uint)bVar78 * auVar118._20_4_ | (uint)!bVar78 * -0x800000;
        bVar78 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar139._24_4_ = (uint)bVar78 * auVar118._24_4_ | (uint)!bVar78 * -0x800000;
        bVar78 = SUB81(uVar79 >> 7,0);
        auVar139._28_4_ = (uint)bVar78 * auVar118._28_4_ | (uint)!bVar78 * -0x800000;
        auVar240._8_4_ = 0x36000000;
        auVar240._0_8_ = 0x3600000036000000;
        auVar240._12_4_ = 0x36000000;
        auVar240._16_4_ = 0x36000000;
        auVar240._20_4_ = 0x36000000;
        auVar240._24_4_ = 0x36000000;
        auVar240._28_4_ = 0x36000000;
        auVar118 = vmulps_avx512vl(local_9c0,auVar240);
        uVar71 = vcmpps_avx512vl(auVar118,local_820,0xe);
        uVar79 = uVar79 & uVar71;
        bVar73 = (byte)uVar79;
        if (bVar73 != 0) {
          uVar71 = vcmpps_avx512vl(auVar117,ZEXT1632(auVar94),2);
          auVar262._8_4_ = 0x7f800000;
          auVar262._0_8_ = 0x7f8000007f800000;
          auVar262._12_4_ = 0x7f800000;
          auVar262._16_4_ = 0x7f800000;
          auVar262._20_4_ = 0x7f800000;
          auVar262._24_4_ = 0x7f800000;
          auVar262._28_4_ = 0x7f800000;
          auVar271._8_4_ = 0xff800000;
          auVar271._0_8_ = 0xff800000ff800000;
          auVar271._12_4_ = 0xff800000;
          auVar271._16_4_ = 0xff800000;
          auVar271._20_4_ = 0xff800000;
          auVar271._24_4_ = 0xff800000;
          auVar271._28_4_ = 0xff800000;
          auVar117 = vblendmps_avx512vl(auVar262,auVar271);
          bVar68 = (byte)uVar71;
          uVar80 = (uint)(bVar68 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar118._0_4_;
          bVar78 = (bool)((byte)(uVar71 >> 1) & 1);
          uVar151 = (uint)bVar78 * auVar117._4_4_ | (uint)!bVar78 * auVar118._4_4_;
          bVar78 = (bool)((byte)(uVar71 >> 2) & 1);
          uVar152 = (uint)bVar78 * auVar117._8_4_ | (uint)!bVar78 * auVar118._8_4_;
          bVar78 = (bool)((byte)(uVar71 >> 3) & 1);
          uVar153 = (uint)bVar78 * auVar117._12_4_ | (uint)!bVar78 * auVar118._12_4_;
          bVar78 = (bool)((byte)(uVar71 >> 4) & 1);
          uVar154 = (uint)bVar78 * auVar117._16_4_ | (uint)!bVar78 * auVar118._16_4_;
          bVar78 = (bool)((byte)(uVar71 >> 5) & 1);
          uVar155 = (uint)bVar78 * auVar117._20_4_ | (uint)!bVar78 * auVar118._20_4_;
          bVar78 = (bool)((byte)(uVar71 >> 6) & 1);
          uVar156 = (uint)bVar78 * auVar117._24_4_ | (uint)!bVar78 * auVar118._24_4_;
          bVar78 = SUB81(uVar71 >> 7,0);
          uVar157 = (uint)bVar78 * auVar117._28_4_ | (uint)!bVar78 * auVar118._28_4_;
          auVar137._0_4_ = (bVar73 & 1) * uVar80 | !(bool)(bVar73 & 1) * auVar137._0_4_;
          bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
          auVar137._4_4_ = bVar78 * uVar151 | !bVar78 * auVar137._4_4_;
          bVar78 = (bool)((byte)(uVar79 >> 2) & 1);
          auVar137._8_4_ = bVar78 * uVar152 | !bVar78 * auVar137._8_4_;
          bVar78 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar137._12_4_ = bVar78 * uVar153 | !bVar78 * auVar137._12_4_;
          bVar78 = (bool)((byte)(uVar79 >> 4) & 1);
          auVar137._16_4_ = bVar78 * uVar154 | (uint)!bVar78 * iVar1;
          bVar78 = (bool)((byte)(uVar79 >> 5) & 1);
          auVar137._20_4_ = bVar78 * uVar155 | (uint)!bVar78 * iVar2;
          bVar78 = (bool)((byte)(uVar79 >> 6) & 1);
          auVar137._24_4_ = bVar78 * uVar156 | (uint)!bVar78 * iVar3;
          bVar78 = SUB81(uVar79 >> 7,0);
          auVar137._28_4_ = bVar78 * uVar157 | (uint)!bVar78 * iVar4;
          auVar117 = vblendmps_avx512vl(auVar271,auVar262);
          bVar78 = (bool)((byte)(uVar71 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar71 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar71 >> 3) & 1);
          bVar17 = (bool)((byte)(uVar71 >> 4) & 1);
          bVar18 = (bool)((byte)(uVar71 >> 5) & 1);
          bVar19 = (bool)((byte)(uVar71 >> 6) & 1);
          bVar20 = SUB81(uVar71 >> 7,0);
          auVar139._0_4_ =
               (uint)(bVar73 & 1) *
               ((uint)(bVar68 & 1) * auVar117._0_4_ | !(bool)(bVar68 & 1) * uVar80) |
               !(bool)(bVar73 & 1) * auVar139._0_4_;
          bVar14 = (bool)((byte)(uVar79 >> 1) & 1);
          auVar139._4_4_ =
               (uint)bVar14 * ((uint)bVar78 * auVar117._4_4_ | !bVar78 * uVar151) |
               !bVar14 * auVar139._4_4_;
          bVar78 = (bool)((byte)(uVar79 >> 2) & 1);
          auVar139._8_4_ =
               (uint)bVar78 * ((uint)bVar15 * auVar117._8_4_ | !bVar15 * uVar152) |
               !bVar78 * auVar139._8_4_;
          bVar78 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar139._12_4_ =
               (uint)bVar78 * ((uint)bVar16 * auVar117._12_4_ | !bVar16 * uVar153) |
               !bVar78 * auVar139._12_4_;
          bVar78 = (bool)((byte)(uVar79 >> 4) & 1);
          auVar139._16_4_ =
               (uint)bVar78 * ((uint)bVar17 * auVar117._16_4_ | !bVar17 * uVar154) |
               !bVar78 * auVar139._16_4_;
          bVar78 = (bool)((byte)(uVar79 >> 5) & 1);
          auVar139._20_4_ =
               (uint)bVar78 * ((uint)bVar18 * auVar117._20_4_ | !bVar18 * uVar155) |
               !bVar78 * auVar139._20_4_;
          bVar78 = (bool)((byte)(uVar79 >> 6) & 1);
          auVar139._24_4_ =
               (uint)bVar78 * ((uint)bVar19 * auVar117._24_4_ | !bVar19 * uVar156) |
               !bVar78 * auVar139._24_4_;
          bVar78 = SUB81(uVar79 >> 7,0);
          auVar139._28_4_ =
               (uint)bVar78 * ((uint)bVar20 * auVar117._28_4_ | !bVar20 * uVar157) |
               !bVar78 * auVar139._28_4_;
          bVar74 = (~bVar73 | bVar68) & bVar74;
        }
      }
      auVar117 = vmovdqa64_avx512vl(auVar105);
      auVar277 = ZEXT3264(auVar117);
      auVar117 = vmovdqa64_avx512vl(auVar106);
      auVar278 = ZEXT3264(auVar117);
      auVar280 = ZEXT3264(local_a20);
      auVar117 = vmulps_avx512vl(local_a20,auVar120);
      auVar117 = vfmadd231ps_avx512vl(auVar117,local_620,auVar119);
      auVar279 = ZEXT3264(local_a00);
      auVar117 = vfmadd231ps_avx512vl(auVar117,local_a00,auVar123);
      _local_540 = local_740;
      local_520 = vminps_avx(local_5e0,auVar137);
      auVar260._8_4_ = 0x7fffffff;
      auVar260._0_8_ = 0x7fffffff7fffffff;
      auVar260._12_4_ = 0x7fffffff;
      auVar260._16_4_ = 0x7fffffff;
      auVar260._20_4_ = 0x7fffffff;
      auVar260._24_4_ = 0x7fffffff;
      auVar260._28_4_ = 0x7fffffff;
      auVar117 = vandps_avx(auVar117,auVar260);
      _local_6a0 = vmaxps_avx(local_740,auVar139);
      auVar255._8_4_ = 0x3e99999a;
      auVar255._0_8_ = 0x3e99999a3e99999a;
      auVar255._12_4_ = 0x3e99999a;
      auVar255._16_4_ = 0x3e99999a;
      auVar255._20_4_ = 0x3e99999a;
      auVar255._24_4_ = 0x3e99999a;
      auVar255._28_4_ = 0x3e99999a;
      uVar29 = vcmpps_avx512vl(auVar117,auVar255,1);
      uVar31 = vcmpps_avx512vl(local_740,local_520,2);
      bVar73 = (byte)uVar31 & bVar67;
      uVar30 = vcmpps_avx512vl(_local_6a0,local_5e0,2);
      if ((bVar67 & ((byte)uVar30 | (byte)uVar31)) == 0) {
        auVar251 = ZEXT3264(_DAT_01f7b040);
        auVar268 = ZEXT3264(local_ac0);
        auVar261 = ZEXT3264(local_a60);
        auVar263 = ZEXT3264(local_a80);
        auVar241 = ZEXT3264(local_9e0);
        auVar256 = ZEXT3264(local_aa0);
      }
      else {
        bVar68 = (byte)uVar29 | ~bVar74;
        auVar117 = vmulps_avx512vl(local_a20,auVar115);
        auVar100 = vfmadd213ps_fma(auVar130,local_620,auVar117);
        auVar117 = vfmadd213ps_avx512vl(auVar124,local_a00,ZEXT1632(auVar100));
        auVar117 = vandps_avx(auVar117,auVar260);
        uVar29 = vcmpps_avx512vl(auVar117,auVar255,1);
        bVar74 = (byte)uVar29 | ~bVar74;
        auVar167._8_4_ = 2;
        auVar167._0_8_ = 0x200000002;
        auVar167._12_4_ = 2;
        auVar167._16_4_ = 2;
        auVar167._20_4_ = 2;
        auVar167._24_4_ = 2;
        auVar167._28_4_ = 2;
        auVar43._8_4_ = 3;
        auVar43._0_8_ = 0x300000003;
        auVar43._12_4_ = 3;
        auVar43._16_4_ = 3;
        auVar43._20_4_ = 3;
        auVar43._24_4_ = 3;
        auVar43._28_4_ = 3;
        auVar117 = vpblendmd_avx512vl(auVar167,auVar43);
        local_5c0._0_4_ = (uint)(bVar74 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar74 & 1) * 2;
        bVar78 = (bool)(bVar74 >> 1 & 1);
        local_5c0._4_4_ = (uint)bVar78 * auVar117._4_4_ | (uint)!bVar78 * 2;
        bVar78 = (bool)(bVar74 >> 2 & 1);
        local_5c0._8_4_ = (uint)bVar78 * auVar117._8_4_ | (uint)!bVar78 * 2;
        bVar78 = (bool)(bVar74 >> 3 & 1);
        local_5c0._12_4_ = (uint)bVar78 * auVar117._12_4_ | (uint)!bVar78 * 2;
        bVar78 = (bool)(bVar74 >> 4 & 1);
        local_5c0._16_4_ = (uint)bVar78 * auVar117._16_4_ | (uint)!bVar78 * 2;
        bVar78 = (bool)(bVar74 >> 5 & 1);
        local_5c0._20_4_ = (uint)bVar78 * auVar117._20_4_ | (uint)!bVar78 * 2;
        bVar78 = (bool)(bVar74 >> 6 & 1);
        local_5c0._24_4_ = (uint)bVar78 * auVar117._24_4_ | (uint)!bVar78 * 2;
        local_5c0._28_4_ = (uint)(bVar74 >> 7) * auVar117._28_4_ | (uint)!(bool)(bVar74 >> 7) * 2;
        local_640 = vpbroadcastd_avx512vl();
        uVar29 = vpcmpd_avx512vl(local_640,local_5c0,5);
        local_680 = local_740._0_4_ + (float)local_720._0_4_;
        fStack_67c = local_740._4_4_ + (float)local_720._4_4_;
        fStack_678 = local_740._8_4_ + fStack_718;
        fStack_674 = local_740._12_4_ + fStack_714;
        fStack_670 = local_740._16_4_ + fStack_710;
        fStack_66c = local_740._20_4_ + fStack_70c;
        fStack_668 = local_740._24_4_ + fStack_708;
        fStack_664 = local_740._28_4_ + fStack_704;
        _local_600 = _local_6a0;
        for (bVar74 = (byte)uVar29 & bVar73; bVar74 != 0;
            bVar74 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar74 & (byte)uVar29) {
          auVar168._8_4_ = 0x7f800000;
          auVar168._0_8_ = 0x7f8000007f800000;
          auVar168._12_4_ = 0x7f800000;
          auVar168._16_4_ = 0x7f800000;
          auVar168._20_4_ = 0x7f800000;
          auVar168._24_4_ = 0x7f800000;
          auVar168._28_4_ = 0x7f800000;
          auVar117 = vblendmps_avx512vl(auVar168,local_740);
          auVar148._0_4_ =
               (uint)(bVar74 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar74 & 1) * 0x7f800000;
          bVar78 = (bool)(bVar74 >> 1 & 1);
          auVar148._4_4_ = (uint)bVar78 * auVar117._4_4_ | (uint)!bVar78 * 0x7f800000;
          bVar78 = (bool)(bVar74 >> 2 & 1);
          auVar148._8_4_ = (uint)bVar78 * auVar117._8_4_ | (uint)!bVar78 * 0x7f800000;
          bVar78 = (bool)(bVar74 >> 3 & 1);
          auVar148._12_4_ = (uint)bVar78 * auVar117._12_4_ | (uint)!bVar78 * 0x7f800000;
          bVar78 = (bool)(bVar74 >> 4 & 1);
          auVar148._16_4_ = (uint)bVar78 * auVar117._16_4_ | (uint)!bVar78 * 0x7f800000;
          bVar78 = (bool)(bVar74 >> 5 & 1);
          auVar148._20_4_ = (uint)bVar78 * auVar117._20_4_ | (uint)!bVar78 * 0x7f800000;
          auVar148._24_4_ =
               (uint)(bVar74 >> 6) * auVar117._24_4_ | (uint)!(bool)(bVar74 >> 6) * 0x7f800000;
          auVar148._28_4_ = 0x7f800000;
          auVar117 = vshufps_avx(auVar148,auVar148,0xb1);
          auVar117 = vminps_avx(auVar148,auVar117);
          auVar115 = vshufpd_avx(auVar117,auVar117,5);
          auVar117 = vminps_avx(auVar117,auVar115);
          auVar115 = vpermpd_avx2(auVar117,0x4e);
          auVar117 = vminps_avx(auVar117,auVar115);
          uVar29 = vcmpps_avx512vl(auVar148,auVar117,0);
          bVar69 = (byte)uVar29 & bVar74;
          bVar70 = bVar74;
          if (bVar69 != 0) {
            bVar70 = bVar69;
          }
          iVar2 = 0;
          for (uVar80 = (uint)bVar70; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
            iVar2 = iVar2 + 1;
          }
          uVar80 = *(uint *)(local_4e0 + (uint)(iVar2 << 2));
          uVar151 = *(uint *)(local_540 + (uint)(iVar2 << 2));
          fVar173 = auVar98._0_4_;
          if ((float)local_a40._0_4_ < 0.0) {
            auVar276 = ZEXT1664(auVar276._0_16_);
            fVar173 = sqrtf((float)local_a40._0_4_);
            auVar117 = vmovdqa64_avx512vl(auVar106);
            auVar278 = ZEXT3264(auVar117);
            auVar117 = vmovdqa64_avx512vl(auVar105);
            auVar277 = ZEXT3264(auVar117);
            auVar281 = ZEXT3264(local_b00);
          }
          auVar94 = vminps_avx(local_840._0_16_,local_880._0_16_);
          auVar100 = vmaxps_avx(local_840._0_16_,local_880._0_16_);
          auVar101 = vminps_avx(local_860._0_16_,local_8a0._0_16_);
          auVar91 = vminps_avx(auVar94,auVar101);
          auVar94 = vmaxps_avx(local_860._0_16_,local_8a0._0_16_);
          auVar101 = vmaxps_avx(auVar100,auVar94);
          auVar219._8_4_ = 0x7fffffff;
          auVar219._0_8_ = 0x7fffffff7fffffff;
          auVar219._12_4_ = 0x7fffffff;
          auVar100 = vandps_avx(auVar91,auVar219);
          auVar94 = vandps_avx(auVar101,auVar219);
          auVar100 = vmaxps_avx(auVar100,auVar94);
          auVar94 = vmovshdup_avx(auVar100);
          auVar94 = vmaxss_avx(auVar94,auVar100);
          auVar100 = vshufpd_avx(auVar100,auVar100,1);
          auVar100 = vmaxss_avx(auVar100,auVar94);
          local_820._0_4_ = auVar100._0_4_ * 1.9073486e-06;
          local_ae0._0_4_ = fVar173 * 1.9073486e-06;
          local_960 = vshufps_avx(auVar101,auVar101,0xff);
          auVar100 = vinsertps_avx(ZEXT416(uVar151),ZEXT416(uVar80),0x10);
          auVar172 = ZEXT1664(auVar100);
          lVar72 = 5;
          do {
            do {
              bVar78 = lVar72 == 0;
              lVar72 = lVar72 + -1;
              if (bVar78) goto LAB_018a3f11;
              uVar174 = auVar172._0_4_;
              auVar160._4_4_ = uVar174;
              auVar160._0_4_ = uVar174;
              auVar160._8_4_ = uVar174;
              auVar160._12_4_ = uVar174;
              auVar94 = vfmadd132ps_fma(auVar160,ZEXT816(0) << 0x40,local_a30);
              auVar101 = auVar172._0_16_;
              auVar100 = vmovshdup_avx(auVar101);
              local_7a0._0_16_ = auVar100;
              fVar192 = 1.0 - auVar100._0_4_;
              auVar100 = vshufps_avx(auVar101,auVar101,0x55);
              fVar173 = auVar100._0_4_;
              auVar197._0_4_ = local_880._0_4_ * fVar173;
              fVar188 = auVar100._4_4_;
              auVar197._4_4_ = local_880._4_4_ * fVar188;
              fVar189 = auVar100._8_4_;
              auVar197._8_4_ = local_880._8_4_ * fVar189;
              fVar190 = auVar100._12_4_;
              auVar197._12_4_ = local_880._12_4_ * fVar190;
              _local_780 = ZEXT416((uint)fVar192);
              auVar220._4_4_ = fVar192;
              auVar220._0_4_ = fVar192;
              auVar220._8_4_ = fVar192;
              auVar220._12_4_ = fVar192;
              auVar100 = vfmadd231ps_fma(auVar197,auVar220,local_840._0_16_);
              auVar236._0_4_ = local_860._0_4_ * fVar173;
              auVar236._4_4_ = local_860._4_4_ * fVar188;
              auVar236._8_4_ = local_860._8_4_ * fVar189;
              auVar236._12_4_ = local_860._12_4_ * fVar190;
              auVar101 = vfmadd231ps_fma(auVar236,auVar220,local_880._0_16_);
              auVar245._0_4_ = fVar173 * (float)local_8a0._0_4_;
              auVar245._4_4_ = fVar188 * (float)local_8a0._4_4_;
              auVar245._8_4_ = fVar189 * fStack_898;
              auVar245._12_4_ = fVar190 * fStack_894;
              auVar91 = vfmadd231ps_fma(auVar245,auVar220,local_860._0_16_);
              auVar253._0_4_ = fVar173 * auVar101._0_4_;
              auVar253._4_4_ = fVar188 * auVar101._4_4_;
              auVar253._8_4_ = fVar189 * auVar101._8_4_;
              auVar253._12_4_ = fVar190 * auVar101._12_4_;
              auVar100 = vfmadd231ps_fma(auVar253,auVar220,auVar100);
              auVar198._0_4_ = fVar173 * auVar91._0_4_;
              auVar198._4_4_ = fVar188 * auVar91._4_4_;
              auVar198._8_4_ = fVar189 * auVar91._8_4_;
              auVar198._12_4_ = fVar190 * auVar91._12_4_;
              auVar101 = vfmadd231ps_fma(auVar198,auVar220,auVar101);
              auVar237._0_4_ = fVar173 * auVar101._0_4_;
              auVar237._4_4_ = fVar188 * auVar101._4_4_;
              auVar237._8_4_ = fVar189 * auVar101._8_4_;
              auVar237._12_4_ = fVar190 * auVar101._12_4_;
              auVar91 = vfmadd231ps_fma(auVar237,auVar100,auVar220);
              auVar100 = vsubps_avx(auVar101,auVar100);
              auVar32._8_4_ = 0x40400000;
              auVar32._0_8_ = 0x4040000040400000;
              auVar32._12_4_ = 0x40400000;
              auVar101 = vmulps_avx512vl(auVar100,auVar32);
              local_760._0_16_ = auVar91;
              auVar94 = vsubps_avx(auVar94,auVar91);
              auVar100 = vdpps_avx(auVar94,auVar94,0x7f);
              fVar173 = auVar100._0_4_;
              local_900 = auVar172;
              if (fVar173 < 0.0) {
                auVar241._0_4_ = sqrtf(fVar173);
                auVar241._4_60_ = extraout_var;
                auVar91 = auVar241._0_16_;
              }
              else {
                auVar91 = vsqrtss_avx(auVar100,auVar100);
              }
              local_7c0._0_16_ = vdpps_avx(auVar101,auVar101,0x7f);
              fVar188 = local_7c0._0_4_;
              auVar199._4_12_ = ZEXT812(0) << 0x20;
              auVar199._0_4_ = fVar188;
              local_9c0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar199);
              fVar189 = local_9c0._0_4_;
              local_7e0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar199);
              auVar33._8_4_ = 0x80000000;
              auVar33._0_8_ = 0x8000000080000000;
              auVar33._12_4_ = 0x80000000;
              auVar87 = vxorps_avx512vl(local_7c0._0_16_,auVar33);
              auVar90 = vfnmadd213ss_fma(local_7e0._0_16_,local_7c0._0_16_,ZEXT416(0x40000000));
              local_800._0_4_ = auVar90._0_4_;
              local_9a0._0_4_ = auVar91._0_4_;
              if (fVar188 < auVar87._0_4_) {
                fVar190 = sqrtf(fVar188);
                auVar91 = ZEXT416((uint)local_9a0._0_4_);
              }
              else {
                auVar90 = vsqrtss_avx(local_7c0._0_16_,local_7c0._0_16_);
                fVar190 = auVar90._0_4_;
              }
              fVar192 = local_9c0._0_4_;
              fVar188 = fVar189 * 1.5 + fVar188 * -0.5 * fVar192 * fVar192 * fVar192;
              local_9c0._0_4_ = auVar101._0_4_ * fVar188;
              local_9c0._4_4_ = auVar101._4_4_ * fVar188;
              local_9c0._8_4_ = auVar101._8_4_ * fVar188;
              local_9c0._12_4_ = auVar101._12_4_ * fVar188;
              auVar90 = vdpps_avx(auVar94,local_9c0._0_16_,0x7f);
              fVar191 = auVar91._0_4_;
              fVar189 = auVar90._0_4_;
              auVar161._0_4_ = fVar189 * fVar189;
              auVar161._4_4_ = auVar90._4_4_ * auVar90._4_4_;
              auVar161._8_4_ = auVar90._8_4_ * auVar90._8_4_;
              auVar161._12_4_ = auVar90._12_4_ * auVar90._12_4_;
              auVar100 = vsubps_avx(auVar100,auVar161);
              fVar192 = auVar100._0_4_;
              auVar178._4_12_ = ZEXT812(0) << 0x20;
              auVar178._0_4_ = fVar192;
              auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar178);
              auVar88 = vmulss_avx512f(auVar87,ZEXT416(0x3fc00000));
              auVar89 = vmulss_avx512f(auVar100,ZEXT416(0xbf000000));
              if (fVar192 < 0.0) {
                local_920._0_4_ = fVar190;
                local_940._0_4_ = auVar88._0_4_;
                local_950._4_4_ = fVar188;
                local_950._0_4_ = fVar188;
                fStack_948 = fVar188;
                fStack_944 = fVar188;
                local_930 = auVar87;
                fVar192 = sqrtf(fVar192);
                auVar89 = ZEXT416(auVar89._0_4_);
                auVar88 = ZEXT416((uint)local_940._0_4_);
                auVar91 = ZEXT416((uint)local_9a0._0_4_);
                auVar87 = local_930;
                fVar188 = (float)local_950._0_4_;
                fVar193 = (float)local_950._4_4_;
                fVar194 = fStack_948;
                fVar273 = fStack_944;
                fVar190 = (float)local_920._0_4_;
              }
              else {
                auVar100 = vsqrtss_avx(auVar100,auVar100);
                fVar192 = auVar100._0_4_;
                fVar193 = fVar188;
                fVar194 = fVar188;
                fVar273 = fVar188;
              }
              auVar276 = ZEXT1664(auVar90);
              auVar281 = ZEXT3264(local_b00);
              auVar117 = vmovdqa64_avx512vl(auVar105);
              auVar277 = ZEXT3264(auVar117);
              auVar117 = vmovdqa64_avx512vl(auVar106);
              auVar278 = ZEXT3264(auVar117);
              auVar92 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_780,local_7a0._0_16_);
              auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7a0._0_16_,_local_780)
              ;
              fVar195 = auVar100._0_4_ * 6.0;
              fVar27 = local_7a0._0_4_ * 6.0;
              auVar221._0_4_ = fVar27 * (float)local_8a0._0_4_;
              auVar221._4_4_ = fVar27 * (float)local_8a0._4_4_;
              auVar221._8_4_ = fVar27 * fStack_898;
              auVar221._12_4_ = fVar27 * fStack_894;
              auVar200._4_4_ = fVar195;
              auVar200._0_4_ = fVar195;
              auVar200._8_4_ = fVar195;
              auVar200._12_4_ = fVar195;
              auVar100 = vfmadd132ps_fma(auVar200,auVar221,local_860._0_16_);
              fVar195 = auVar92._0_4_ * 6.0;
              auVar179._4_4_ = fVar195;
              auVar179._0_4_ = fVar195;
              auVar179._8_4_ = fVar195;
              auVar179._12_4_ = fVar195;
              auVar100 = vfmadd132ps_fma(auVar179,auVar100,local_880._0_16_);
              fVar195 = local_780._0_4_ * 6.0;
              auVar201._4_4_ = fVar195;
              auVar201._0_4_ = fVar195;
              auVar201._8_4_ = fVar195;
              auVar201._12_4_ = fVar195;
              auVar100 = vfmadd132ps_fma(auVar201,auVar100,local_840._0_16_);
              auVar180._0_4_ = auVar100._0_4_ * (float)local_7c0._0_4_;
              auVar180._4_4_ = auVar100._4_4_ * (float)local_7c0._0_4_;
              auVar180._8_4_ = auVar100._8_4_ * (float)local_7c0._0_4_;
              auVar180._12_4_ = auVar100._12_4_ * (float)local_7c0._0_4_;
              auVar100 = vdpps_avx(auVar101,auVar100,0x7f);
              fVar195 = auVar100._0_4_;
              auVar202._0_4_ = auVar101._0_4_ * fVar195;
              auVar202._4_4_ = auVar101._4_4_ * fVar195;
              auVar202._8_4_ = auVar101._8_4_ * fVar195;
              auVar202._12_4_ = auVar101._12_4_ * fVar195;
              auVar100 = vsubps_avx(auVar180,auVar202);
              fVar195 = (float)local_800._0_4_ * (float)local_7e0._0_4_;
              auVar92 = vmaxss_avx(ZEXT416((uint)local_820._0_4_),
                                   ZEXT416((uint)(local_900._0_4_ * (float)local_ae0._0_4_)));
              auVar34._8_4_ = 0x80000000;
              auVar34._0_8_ = 0x8000000080000000;
              auVar34._12_4_ = 0x80000000;
              auVar102 = vxorps_avx512vl(auVar101,auVar34);
              auVar203._0_4_ = fVar188 * auVar100._0_4_ * fVar195;
              auVar203._4_4_ = fVar193 * auVar100._4_4_ * fVar195;
              auVar203._8_4_ = fVar194 * auVar100._8_4_ * fVar195;
              auVar203._12_4_ = fVar273 * auVar100._12_4_ * fVar195;
              auVar100 = vdpps_avx(auVar102,local_9c0._0_16_,0x7f);
              auVar93 = vfmadd213ss_fma(auVar91,ZEXT416((uint)local_820._0_4_),auVar92);
              auVar91 = vdpps_avx(auVar94,auVar203,0x7f);
              auVar93 = vfmadd213ss_fma(ZEXT416((uint)(fVar191 + 1.0)),
                                        ZEXT416((uint)((float)local_820._0_4_ / fVar190)),auVar93);
              fVar188 = auVar100._0_4_ + auVar91._0_4_;
              auVar100 = vdpps_avx(local_a30,local_9c0._0_16_,0x7f);
              auVar91 = vdpps_avx(auVar94,auVar102,0x7f);
              auVar89 = vmulss_avx512f(auVar89,auVar87);
              auVar87 = vmulss_avx512f(auVar87,auVar87);
              auVar102 = vaddss_avx512f(auVar88,ZEXT416((uint)(auVar89._0_4_ * auVar87._0_4_)));
              auVar87 = vdpps_avx(auVar94,local_a30,0x7f);
              auVar89 = vfnmadd231ss_fma(auVar91,auVar90,ZEXT416((uint)fVar188));
              auVar87 = vfnmadd231ss_fma(auVar87,auVar90,auVar100);
              auVar91 = vpermilps_avx(local_760._0_16_,0xff);
              fVar192 = fVar192 - auVar91._0_4_;
              auVar88 = vshufps_avx(auVar101,auVar101,0xff);
              auVar91 = vfmsub213ss_fma(auVar89,auVar102,auVar88);
              auVar258._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
              auVar258._8_4_ = auVar91._8_4_ ^ 0x80000000;
              auVar258._12_4_ = auVar91._12_4_ ^ 0x80000000;
              auVar87 = ZEXT416((uint)(auVar87._0_4_ * auVar102._0_4_));
              auVar89 = vfmsub231ss_fma(ZEXT416((uint)(auVar100._0_4_ * auVar91._0_4_)),
                                        ZEXT416((uint)fVar188),auVar87);
              auVar91 = vinsertps_avx(auVar258,auVar87,0x1c);
              auVar246._0_8_ = auVar100._0_8_ ^ 0x8000000080000000;
              auVar246._8_4_ = auVar100._8_4_ ^ 0x80000000;
              auVar246._12_4_ = auVar100._12_4_ ^ 0x80000000;
              auVar87 = vinsertps_avx(ZEXT416((uint)fVar188),auVar246,0x10);
              auVar222._0_4_ = auVar89._0_4_;
              auVar222._4_4_ = auVar222._0_4_;
              auVar222._8_4_ = auVar222._0_4_;
              auVar222._12_4_ = auVar222._0_4_;
              auVar100 = vdivps_avx(auVar91,auVar222);
              auVar91 = vdivps_avx(auVar87,auVar222);
              auVar223._0_4_ = fVar189 * auVar100._0_4_ + fVar192 * auVar91._0_4_;
              auVar223._4_4_ = fVar189 * auVar100._4_4_ + fVar192 * auVar91._4_4_;
              auVar223._8_4_ = fVar189 * auVar100._8_4_ + fVar192 * auVar91._8_4_;
              auVar223._12_4_ = fVar189 * auVar100._12_4_ + fVar192 * auVar91._12_4_;
              auVar100 = vsubps_avx(local_900._0_16_,auVar223);
              auVar172 = ZEXT1664(auVar100);
              auVar35._8_4_ = 0x7fffffff;
              auVar35._0_8_ = 0x7fffffff7fffffff;
              auVar35._12_4_ = 0x7fffffff;
              auVar91 = vandps_avx512vl(auVar90,auVar35);
            } while (auVar93._0_4_ <= auVar91._0_4_);
            auVar91 = vfmadd231ss_fma(ZEXT416((uint)(auVar93._0_4_ + auVar92._0_4_)),local_960,
                                      ZEXT416(0x36000000));
            auVar36._8_4_ = 0x7fffffff;
            auVar36._0_8_ = 0x7fffffff7fffffff;
            auVar36._12_4_ = 0x7fffffff;
            auVar87 = vandps_avx512vl(ZEXT416((uint)fVar192),auVar36);
          } while (auVar91._0_4_ <= auVar87._0_4_);
          fVar188 = auVar100._0_4_ + (float)local_970._0_4_;
          if ((fVar6 <= fVar188) && (fVar189 = *(float *)(ray + k * 4 + 0x200), fVar188 <= fVar189))
          {
            auVar100 = vmovshdup_avx(auVar100);
            fVar190 = auVar100._0_4_;
            if ((0.0 <= fVar190) && (fVar190 <= 1.0)) {
              auVar100 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)fVar173));
              fVar192 = auVar100._0_4_;
              pGVar8 = (context->scene->geometries).items[uVar7].ptr;
              if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                fVar173 = fVar192 * 1.5 + fVar173 * -0.5 * fVar192 * fVar192 * fVar192;
                auVar224._0_4_ = auVar94._0_4_ * fVar173;
                auVar224._4_4_ = auVar94._4_4_ * fVar173;
                auVar224._8_4_ = auVar94._8_4_ * fVar173;
                auVar224._12_4_ = auVar94._12_4_ * fVar173;
                auVar91 = vfmadd213ps_fma(auVar88,auVar224,auVar101);
                auVar100 = vshufps_avx(auVar224,auVar224,0xc9);
                auVar94 = vshufps_avx(auVar101,auVar101,0xc9);
                auVar225._0_4_ = auVar224._0_4_ * auVar94._0_4_;
                auVar225._4_4_ = auVar224._4_4_ * auVar94._4_4_;
                auVar225._8_4_ = auVar224._8_4_ * auVar94._8_4_;
                auVar225._12_4_ = auVar224._12_4_ * auVar94._12_4_;
                auVar101 = vfmsub231ps_fma(auVar225,auVar101,auVar100);
                auVar100 = vshufps_avx(auVar101,auVar101,0xc9);
                auVar94 = vshufps_avx(auVar91,auVar91,0xc9);
                auVar101 = vshufps_avx(auVar101,auVar101,0xd2);
                auVar162._0_4_ = auVar91._0_4_ * auVar101._0_4_;
                auVar162._4_4_ = auVar91._4_4_ * auVar101._4_4_;
                auVar162._8_4_ = auVar91._8_4_ * auVar101._8_4_;
                auVar162._12_4_ = auVar91._12_4_ * auVar101._12_4_;
                auVar100 = vfmsub231ps_fma(auVar162,auVar100,auVar94);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x200) = fVar188;
                  uVar174 = vextractps_avx(auVar100,1);
                  *(undefined4 *)(ray + k * 4 + 0x300) = uVar174;
                  uVar174 = vextractps_avx(auVar100,2);
                  *(undefined4 *)(ray + k * 4 + 0x340) = uVar174;
                  *(int *)(ray + k * 4 + 0x380) = auVar100._0_4_;
                  *(float *)(ray + k * 4 + 0x3c0) = fVar190;
                  *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                  *(int *)(ray + k * 4 + 0x440) = (int)local_ac8;
                  *(uint *)(ray + k * 4 + 0x480) = uVar7;
                  *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                }
                else {
                  pRVar12 = context->user;
                  auVar241 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar241,auVar172);
                  auVar172 = vpermps_avx512f(auVar241,ZEXT1664(auVar100));
                  auVar241 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar241,ZEXT1664(auVar100));
                  local_380 = vbroadcastss_avx512f(auVar100);
                  local_400[0] = (RTCHitN)auVar172[0];
                  local_400[1] = (RTCHitN)auVar172[1];
                  local_400[2] = (RTCHitN)auVar172[2];
                  local_400[3] = (RTCHitN)auVar172[3];
                  local_400[4] = (RTCHitN)auVar172[4];
                  local_400[5] = (RTCHitN)auVar172[5];
                  local_400[6] = (RTCHitN)auVar172[6];
                  local_400[7] = (RTCHitN)auVar172[7];
                  local_400[8] = (RTCHitN)auVar172[8];
                  local_400[9] = (RTCHitN)auVar172[9];
                  local_400[10] = (RTCHitN)auVar172[10];
                  local_400[0xb] = (RTCHitN)auVar172[0xb];
                  local_400[0xc] = (RTCHitN)auVar172[0xc];
                  local_400[0xd] = (RTCHitN)auVar172[0xd];
                  local_400[0xe] = (RTCHitN)auVar172[0xe];
                  local_400[0xf] = (RTCHitN)auVar172[0xf];
                  local_400[0x10] = (RTCHitN)auVar172[0x10];
                  local_400[0x11] = (RTCHitN)auVar172[0x11];
                  local_400[0x12] = (RTCHitN)auVar172[0x12];
                  local_400[0x13] = (RTCHitN)auVar172[0x13];
                  local_400[0x14] = (RTCHitN)auVar172[0x14];
                  local_400[0x15] = (RTCHitN)auVar172[0x15];
                  local_400[0x16] = (RTCHitN)auVar172[0x16];
                  local_400[0x17] = (RTCHitN)auVar172[0x17];
                  local_400[0x18] = (RTCHitN)auVar172[0x18];
                  local_400[0x19] = (RTCHitN)auVar172[0x19];
                  local_400[0x1a] = (RTCHitN)auVar172[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar172[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar172[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar172[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar172[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar172[0x1f];
                  local_400[0x20] = (RTCHitN)auVar172[0x20];
                  local_400[0x21] = (RTCHitN)auVar172[0x21];
                  local_400[0x22] = (RTCHitN)auVar172[0x22];
                  local_400[0x23] = (RTCHitN)auVar172[0x23];
                  local_400[0x24] = (RTCHitN)auVar172[0x24];
                  local_400[0x25] = (RTCHitN)auVar172[0x25];
                  local_400[0x26] = (RTCHitN)auVar172[0x26];
                  local_400[0x27] = (RTCHitN)auVar172[0x27];
                  local_400[0x28] = (RTCHitN)auVar172[0x28];
                  local_400[0x29] = (RTCHitN)auVar172[0x29];
                  local_400[0x2a] = (RTCHitN)auVar172[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar172[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar172[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar172[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar172[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar172[0x2f];
                  local_400[0x30] = (RTCHitN)auVar172[0x30];
                  local_400[0x31] = (RTCHitN)auVar172[0x31];
                  local_400[0x32] = (RTCHitN)auVar172[0x32];
                  local_400[0x33] = (RTCHitN)auVar172[0x33];
                  local_400[0x34] = (RTCHitN)auVar172[0x34];
                  local_400[0x35] = (RTCHitN)auVar172[0x35];
                  local_400[0x36] = (RTCHitN)auVar172[0x36];
                  local_400[0x37] = (RTCHitN)auVar172[0x37];
                  local_400[0x38] = (RTCHitN)auVar172[0x38];
                  local_400[0x39] = (RTCHitN)auVar172[0x39];
                  local_400[0x3a] = (RTCHitN)auVar172[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar172[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar172[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar172[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar172[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar172[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar172 = vmovdqa64_avx512f(local_440);
                  local_280 = vmovdqa64_avx512f(auVar172);
                  auVar117 = vpcmpeqd_avx2(auVar172._0_32_,auVar172._0_32_);
                  local_ad0[3] = auVar117;
                  local_ad0[2] = auVar117;
                  local_ad0[1] = auVar117;
                  *local_ad0 = auVar117;
                  local_240 = vbroadcastss_avx512f(ZEXT416(pRVar12->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(pRVar12->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar188;
                  auVar172 = vmovdqa64_avx512f(local_4c0);
                  local_700 = vmovdqa64_avx512f(auVar172);
                  local_b30.valid = (int *)local_700;
                  local_b30.geometryUserPtr = pGVar8->userPtr;
                  local_b30.context = context->user;
                  local_b30.hit = local_400;
                  local_b30.N = 0x10;
                  local_900._0_4_ = fVar189;
                  local_b30.ray = (RTCRayN *)ray;
                  if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar276 = ZEXT1664(auVar90);
                    (*pGVar8->intersectionFilterN)(&local_b30);
                    auVar117 = vmovdqa64_avx512vl(auVar106);
                    auVar278 = ZEXT3264(auVar117);
                    auVar117 = vmovdqa64_avx512vl(auVar105);
                    auVar277 = ZEXT3264(auVar117);
                    auVar281 = ZEXT3264(local_b00);
                    auVar172 = vmovdqa64_avx512f(local_700);
                    fVar189 = (float)local_900._0_4_;
                  }
                  uVar29 = vptestmd_avx512f(auVar172,auVar172);
                  if ((short)uVar29 != 0) {
                    p_Var13 = context->args->filter;
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar276 = ZEXT1664(auVar276._0_16_);
                      (*p_Var13)(&local_b30);
                      auVar117 = vmovdqa64_avx512vl(auVar106);
                      auVar278 = ZEXT3264(auVar117);
                      auVar117 = vmovdqa64_avx512vl(auVar105);
                      auVar277 = ZEXT3264(auVar117);
                      auVar281 = ZEXT3264(local_b00);
                      auVar172 = vmovdqa64_avx512f(local_700);
                      fVar189 = (float)local_900._0_4_;
                    }
                    uVar79 = vptestmd_avx512f(auVar172,auVar172);
                    if ((short)uVar79 != 0) {
                      iVar3 = *(int *)(local_b30.hit + 4);
                      iVar4 = *(int *)(local_b30.hit + 8);
                      iVar1 = *(int *)(local_b30.hit + 0xc);
                      iVar53 = *(int *)(local_b30.hit + 0x10);
                      iVar54 = *(int *)(local_b30.hit + 0x14);
                      iVar55 = *(int *)(local_b30.hit + 0x18);
                      iVar56 = *(int *)(local_b30.hit + 0x1c);
                      iVar57 = *(int *)(local_b30.hit + 0x20);
                      iVar58 = *(int *)(local_b30.hit + 0x24);
                      iVar59 = *(int *)(local_b30.hit + 0x28);
                      iVar60 = *(int *)(local_b30.hit + 0x2c);
                      iVar61 = *(int *)(local_b30.hit + 0x30);
                      iVar62 = *(int *)(local_b30.hit + 0x34);
                      iVar63 = *(int *)(local_b30.hit + 0x38);
                      iVar64 = *(int *)(local_b30.hit + 0x3c);
                      bVar70 = (byte)uVar79;
                      bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar79 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar79 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar79 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar79 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar79 >> 7) & 1);
                      bVar69 = (byte)(uVar79 >> 8);
                      bVar20 = (bool)((byte)(uVar79 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar79 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar79 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar79 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar79 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar79 >> 0xe) & 1);
                      bVar26 = SUB81(uVar79 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x300) =
                           (uint)(bVar70 & 1) * *(int *)local_b30.hit |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_b30.ray + 0x300);
                      *(uint *)(local_b30.ray + 0x304) =
                           (uint)bVar78 * iVar3 | (uint)!bVar78 * *(int *)(local_b30.ray + 0x304);
                      *(uint *)(local_b30.ray + 0x308) =
                           (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x308);
                      *(uint *)(local_b30.ray + 0x30c) =
                           (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x30c);
                      *(uint *)(local_b30.ray + 0x310) =
                           (uint)bVar16 * iVar53 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x310);
                      *(uint *)(local_b30.ray + 0x314) =
                           (uint)bVar17 * iVar54 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x314);
                      *(uint *)(local_b30.ray + 0x318) =
                           (uint)bVar18 * iVar55 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x318);
                      *(uint *)(local_b30.ray + 0x31c) =
                           (uint)bVar19 * iVar56 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x31c);
                      *(uint *)(local_b30.ray + 800) =
                           (uint)(bVar69 & 1) * iVar57 |
                           (uint)!(bool)(bVar69 & 1) * *(int *)(local_b30.ray + 800);
                      *(uint *)(local_b30.ray + 0x324) =
                           (uint)bVar20 * iVar58 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x324);
                      *(uint *)(local_b30.ray + 0x328) =
                           (uint)bVar21 * iVar59 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x328);
                      *(uint *)(local_b30.ray + 0x32c) =
                           (uint)bVar22 * iVar60 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x32c);
                      *(uint *)(local_b30.ray + 0x330) =
                           (uint)bVar23 * iVar61 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x330);
                      *(uint *)(local_b30.ray + 0x334) =
                           (uint)bVar24 * iVar62 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x334);
                      *(uint *)(local_b30.ray + 0x338) =
                           (uint)bVar25 * iVar63 | (uint)!bVar25 * *(int *)(local_b30.ray + 0x338);
                      *(uint *)(local_b30.ray + 0x33c) =
                           (uint)bVar26 * iVar64 | (uint)!bVar26 * *(int *)(local_b30.ray + 0x33c);
                      iVar3 = *(int *)(local_b30.hit + 0x44);
                      iVar4 = *(int *)(local_b30.hit + 0x48);
                      iVar1 = *(int *)(local_b30.hit + 0x4c);
                      iVar53 = *(int *)(local_b30.hit + 0x50);
                      iVar54 = *(int *)(local_b30.hit + 0x54);
                      iVar55 = *(int *)(local_b30.hit + 0x58);
                      iVar56 = *(int *)(local_b30.hit + 0x5c);
                      iVar57 = *(int *)(local_b30.hit + 0x60);
                      iVar58 = *(int *)(local_b30.hit + 100);
                      iVar59 = *(int *)(local_b30.hit + 0x68);
                      iVar60 = *(int *)(local_b30.hit + 0x6c);
                      iVar61 = *(int *)(local_b30.hit + 0x70);
                      iVar62 = *(int *)(local_b30.hit + 0x74);
                      iVar63 = *(int *)(local_b30.hit + 0x78);
                      iVar64 = *(int *)(local_b30.hit + 0x7c);
                      bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar79 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar79 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar79 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar79 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar79 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar79 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar79 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar79 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar79 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar79 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar79 >> 0xe) & 1);
                      bVar26 = SUB81(uVar79 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x340) =
                           (uint)(bVar70 & 1) * *(int *)(local_b30.hit + 0x40) |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_b30.ray + 0x340);
                      *(uint *)(local_b30.ray + 0x344) =
                           (uint)bVar78 * iVar3 | (uint)!bVar78 * *(int *)(local_b30.ray + 0x344);
                      *(uint *)(local_b30.ray + 0x348) =
                           (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x348);
                      *(uint *)(local_b30.ray + 0x34c) =
                           (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x34c);
                      *(uint *)(local_b30.ray + 0x350) =
                           (uint)bVar16 * iVar53 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x350);
                      *(uint *)(local_b30.ray + 0x354) =
                           (uint)bVar17 * iVar54 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x354);
                      *(uint *)(local_b30.ray + 0x358) =
                           (uint)bVar18 * iVar55 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x358);
                      *(uint *)(local_b30.ray + 0x35c) =
                           (uint)bVar19 * iVar56 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x35c);
                      *(uint *)(local_b30.ray + 0x360) =
                           (uint)(bVar69 & 1) * iVar57 |
                           (uint)!(bool)(bVar69 & 1) * *(int *)(local_b30.ray + 0x360);
                      *(uint *)(local_b30.ray + 0x364) =
                           (uint)bVar20 * iVar58 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x364);
                      *(uint *)(local_b30.ray + 0x368) =
                           (uint)bVar21 * iVar59 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x368);
                      *(uint *)(local_b30.ray + 0x36c) =
                           (uint)bVar22 * iVar60 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x36c);
                      *(uint *)(local_b30.ray + 0x370) =
                           (uint)bVar23 * iVar61 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x370);
                      *(uint *)(local_b30.ray + 0x374) =
                           (uint)bVar24 * iVar62 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x374);
                      *(uint *)(local_b30.ray + 0x378) =
                           (uint)bVar25 * iVar63 | (uint)!bVar25 * *(int *)(local_b30.ray + 0x378);
                      *(uint *)(local_b30.ray + 0x37c) =
                           (uint)bVar26 * iVar64 | (uint)!bVar26 * *(int *)(local_b30.ray + 0x37c);
                      iVar3 = *(int *)(local_b30.hit + 0x84);
                      iVar4 = *(int *)(local_b30.hit + 0x88);
                      iVar1 = *(int *)(local_b30.hit + 0x8c);
                      iVar53 = *(int *)(local_b30.hit + 0x90);
                      iVar54 = *(int *)(local_b30.hit + 0x94);
                      iVar55 = *(int *)(local_b30.hit + 0x98);
                      iVar56 = *(int *)(local_b30.hit + 0x9c);
                      iVar57 = *(int *)(local_b30.hit + 0xa0);
                      iVar58 = *(int *)(local_b30.hit + 0xa4);
                      iVar59 = *(int *)(local_b30.hit + 0xa8);
                      iVar60 = *(int *)(local_b30.hit + 0xac);
                      iVar61 = *(int *)(local_b30.hit + 0xb0);
                      iVar62 = *(int *)(local_b30.hit + 0xb4);
                      iVar63 = *(int *)(local_b30.hit + 0xb8);
                      iVar64 = *(int *)(local_b30.hit + 0xbc);
                      bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar79 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar79 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar79 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar79 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar79 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar79 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar79 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar79 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar79 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar79 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar79 >> 0xe) & 1);
                      bVar26 = SUB81(uVar79 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x380) =
                           (uint)(bVar70 & 1) * *(int *)(local_b30.hit + 0x80) |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_b30.ray + 0x380);
                      *(uint *)(local_b30.ray + 900) =
                           (uint)bVar78 * iVar3 | (uint)!bVar78 * *(int *)(local_b30.ray + 900);
                      *(uint *)(local_b30.ray + 0x388) =
                           (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x388);
                      *(uint *)(local_b30.ray + 0x38c) =
                           (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x38c);
                      *(uint *)(local_b30.ray + 0x390) =
                           (uint)bVar16 * iVar53 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x390);
                      *(uint *)(local_b30.ray + 0x394) =
                           (uint)bVar17 * iVar54 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x394);
                      *(uint *)(local_b30.ray + 0x398) =
                           (uint)bVar18 * iVar55 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x398);
                      *(uint *)(local_b30.ray + 0x39c) =
                           (uint)bVar19 * iVar56 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x39c);
                      *(uint *)(local_b30.ray + 0x3a0) =
                           (uint)(bVar69 & 1) * iVar57 |
                           (uint)!(bool)(bVar69 & 1) * *(int *)(local_b30.ray + 0x3a0);
                      *(uint *)(local_b30.ray + 0x3a4) =
                           (uint)bVar20 * iVar58 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x3a4);
                      *(uint *)(local_b30.ray + 0x3a8) =
                           (uint)bVar21 * iVar59 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x3a8);
                      *(uint *)(local_b30.ray + 0x3ac) =
                           (uint)bVar22 * iVar60 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x3ac);
                      *(uint *)(local_b30.ray + 0x3b0) =
                           (uint)bVar23 * iVar61 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x3b0);
                      *(uint *)(local_b30.ray + 0x3b4) =
                           (uint)bVar24 * iVar62 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x3b4);
                      *(uint *)(local_b30.ray + 0x3b8) =
                           (uint)bVar25 * iVar63 | (uint)!bVar25 * *(int *)(local_b30.ray + 0x3b8);
                      *(uint *)(local_b30.ray + 0x3bc) =
                           (uint)bVar26 * iVar64 | (uint)!bVar26 * *(int *)(local_b30.ray + 0x3bc);
                      iVar3 = *(int *)(local_b30.hit + 0xc4);
                      iVar4 = *(int *)(local_b30.hit + 200);
                      iVar1 = *(int *)(local_b30.hit + 0xcc);
                      iVar53 = *(int *)(local_b30.hit + 0xd0);
                      iVar54 = *(int *)(local_b30.hit + 0xd4);
                      iVar55 = *(int *)(local_b30.hit + 0xd8);
                      iVar56 = *(int *)(local_b30.hit + 0xdc);
                      iVar57 = *(int *)(local_b30.hit + 0xe0);
                      iVar58 = *(int *)(local_b30.hit + 0xe4);
                      iVar59 = *(int *)(local_b30.hit + 0xe8);
                      iVar60 = *(int *)(local_b30.hit + 0xec);
                      iVar61 = *(int *)(local_b30.hit + 0xf0);
                      iVar62 = *(int *)(local_b30.hit + 0xf4);
                      iVar63 = *(int *)(local_b30.hit + 0xf8);
                      iVar64 = *(int *)(local_b30.hit + 0xfc);
                      bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar79 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar79 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar79 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar79 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar79 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar79 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar79 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar79 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar79 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar79 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar79 >> 0xe) & 1);
                      bVar26 = SUB81(uVar79 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x3c0) =
                           (uint)(bVar70 & 1) * *(int *)(local_b30.hit + 0xc0) |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_b30.ray + 0x3c0);
                      *(uint *)(local_b30.ray + 0x3c4) =
                           (uint)bVar78 * iVar3 | (uint)!bVar78 * *(int *)(local_b30.ray + 0x3c4);
                      *(uint *)(local_b30.ray + 0x3c8) =
                           (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x3c8);
                      *(uint *)(local_b30.ray + 0x3cc) =
                           (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x3cc);
                      *(uint *)(local_b30.ray + 0x3d0) =
                           (uint)bVar16 * iVar53 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x3d0);
                      *(uint *)(local_b30.ray + 0x3d4) =
                           (uint)bVar17 * iVar54 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x3d4);
                      *(uint *)(local_b30.ray + 0x3d8) =
                           (uint)bVar18 * iVar55 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x3d8);
                      *(uint *)(local_b30.ray + 0x3dc) =
                           (uint)bVar19 * iVar56 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x3dc);
                      *(uint *)(local_b30.ray + 0x3e0) =
                           (uint)(bVar69 & 1) * iVar57 |
                           (uint)!(bool)(bVar69 & 1) * *(int *)(local_b30.ray + 0x3e0);
                      *(uint *)(local_b30.ray + 0x3e4) =
                           (uint)bVar20 * iVar58 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x3e4);
                      *(uint *)(local_b30.ray + 1000) =
                           (uint)bVar21 * iVar59 | (uint)!bVar21 * *(int *)(local_b30.ray + 1000);
                      *(uint *)(local_b30.ray + 0x3ec) =
                           (uint)bVar22 * iVar60 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x3ec);
                      *(uint *)(local_b30.ray + 0x3f0) =
                           (uint)bVar23 * iVar61 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x3f0);
                      *(uint *)(local_b30.ray + 0x3f4) =
                           (uint)bVar24 * iVar62 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x3f4);
                      *(uint *)(local_b30.ray + 0x3f8) =
                           (uint)bVar25 * iVar63 | (uint)!bVar25 * *(int *)(local_b30.ray + 0x3f8);
                      *(uint *)(local_b30.ray + 0x3fc) =
                           (uint)bVar26 * iVar64 | (uint)!bVar26 * *(int *)(local_b30.ray + 0x3fc);
                      iVar3 = *(int *)(local_b30.hit + 0x104);
                      iVar4 = *(int *)(local_b30.hit + 0x108);
                      iVar1 = *(int *)(local_b30.hit + 0x10c);
                      iVar53 = *(int *)(local_b30.hit + 0x110);
                      iVar54 = *(int *)(local_b30.hit + 0x114);
                      iVar55 = *(int *)(local_b30.hit + 0x118);
                      iVar56 = *(int *)(local_b30.hit + 0x11c);
                      iVar57 = *(int *)(local_b30.hit + 0x120);
                      iVar58 = *(int *)(local_b30.hit + 0x124);
                      iVar59 = *(int *)(local_b30.hit + 0x128);
                      iVar60 = *(int *)(local_b30.hit + 300);
                      iVar61 = *(int *)(local_b30.hit + 0x130);
                      iVar62 = *(int *)(local_b30.hit + 0x134);
                      iVar63 = *(int *)(local_b30.hit + 0x138);
                      iVar64 = *(int *)(local_b30.hit + 0x13c);
                      bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar79 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar79 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar79 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar79 >> 6) & 1);
                      bVar19 = (bool)((byte)(uVar79 >> 7) & 1);
                      bVar20 = (bool)((byte)(uVar79 >> 9) & 1);
                      bVar21 = (bool)((byte)(uVar79 >> 10) & 1);
                      bVar22 = (bool)((byte)(uVar79 >> 0xb) & 1);
                      bVar23 = (bool)((byte)(uVar79 >> 0xc) & 1);
                      bVar24 = (bool)((byte)(uVar79 >> 0xd) & 1);
                      bVar25 = (bool)((byte)(uVar79 >> 0xe) & 1);
                      bVar26 = SUB81(uVar79 >> 0xf,0);
                      *(uint *)(local_b30.ray + 0x400) =
                           (uint)(bVar70 & 1) * *(int *)(local_b30.hit + 0x100) |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_b30.ray + 0x400);
                      *(uint *)(local_b30.ray + 0x404) =
                           (uint)bVar78 * iVar3 | (uint)!bVar78 * *(int *)(local_b30.ray + 0x404);
                      *(uint *)(local_b30.ray + 0x408) =
                           (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x408);
                      *(uint *)(local_b30.ray + 0x40c) =
                           (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x40c);
                      *(uint *)(local_b30.ray + 0x410) =
                           (uint)bVar16 * iVar53 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x410);
                      *(uint *)(local_b30.ray + 0x414) =
                           (uint)bVar17 * iVar54 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x414);
                      *(uint *)(local_b30.ray + 0x418) =
                           (uint)bVar18 * iVar55 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x418);
                      *(uint *)(local_b30.ray + 0x41c) =
                           (uint)bVar19 * iVar56 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x41c);
                      *(uint *)(local_b30.ray + 0x420) =
                           (uint)(bVar69 & 1) * iVar57 |
                           (uint)!(bool)(bVar69 & 1) * *(int *)(local_b30.ray + 0x420);
                      *(uint *)(local_b30.ray + 0x424) =
                           (uint)bVar20 * iVar58 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x424);
                      *(uint *)(local_b30.ray + 0x428) =
                           (uint)bVar21 * iVar59 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x428);
                      *(uint *)(local_b30.ray + 0x42c) =
                           (uint)bVar22 * iVar60 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x42c);
                      *(uint *)(local_b30.ray + 0x430) =
                           (uint)bVar23 * iVar61 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x430);
                      *(uint *)(local_b30.ray + 0x434) =
                           (uint)bVar24 * iVar62 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x434);
                      *(uint *)(local_b30.ray + 0x438) =
                           (uint)bVar25 * iVar63 | (uint)!bVar25 * *(int *)(local_b30.ray + 0x438);
                      *(uint *)(local_b30.ray + 0x43c) =
                           (uint)bVar26 * iVar64 | (uint)!bVar26 * *(int *)(local_b30.ray + 0x43c);
                      auVar172 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x140));
                      auVar172 = vmovdqu32_avx512f(auVar172);
                      *(undefined1 (*) [64])(local_b30.ray + 0x440) = auVar172;
                      auVar172 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x180));
                      auVar172 = vmovdqu32_avx512f(auVar172);
                      *(undefined1 (*) [64])(local_b30.ray + 0x480) = auVar172;
                      auVar172 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x1c0));
                      auVar172 = vmovdqa32_avx512f(auVar172);
                      *(undefined1 (*) [64])(local_b30.ray + 0x4c0) = auVar172;
                      auVar172 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x200));
                      auVar172 = vmovdqa32_avx512f(auVar172);
                      *(undefined1 (*) [64])(local_b30.ray + 0x500) = auVar172;
                      goto LAB_018a3f11;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar189;
                }
              }
            }
          }
LAB_018a3f11:
          uVar174 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar249._4_4_ = uVar174;
          auVar249._0_4_ = uVar174;
          auVar249._8_4_ = uVar174;
          auVar249._12_4_ = uVar174;
          auVar249._16_4_ = uVar174;
          auVar249._20_4_ = uVar174;
          auVar249._24_4_ = uVar174;
          auVar249._28_4_ = uVar174;
          auVar172 = ZEXT3264(auVar249);
          auVar65._4_4_ = fStack_67c;
          auVar65._0_4_ = local_680;
          auVar65._8_4_ = fStack_678;
          auVar65._12_4_ = fStack_674;
          auVar65._16_4_ = fStack_670;
          auVar65._20_4_ = fStack_66c;
          auVar65._24_4_ = fStack_668;
          auVar65._28_4_ = fStack_664;
          uVar29 = vcmpps_avx512vl(auVar249,auVar65,0xd);
          auVar279 = ZEXT3264(local_a00);
          auVar280 = ZEXT3264(local_a20);
        }
        auVar169._0_4_ = (float)local_720._0_4_ + (float)local_6a0._0_4_;
        auVar169._4_4_ = (float)local_720._4_4_ + (float)local_6a0._4_4_;
        auVar169._8_4_ = fStack_718 + fStack_698;
        auVar169._12_4_ = fStack_714 + fStack_694;
        auVar169._16_4_ = fStack_710 + fStack_690;
        auVar169._20_4_ = fStack_70c + fStack_68c;
        auVar169._24_4_ = fStack_708 + fStack_688;
        auVar169._28_4_ = fStack_704 + fStack_684;
        uVar174 = auVar172._0_4_;
        auVar186._4_4_ = uVar174;
        auVar186._0_4_ = uVar174;
        auVar186._8_4_ = uVar174;
        auVar186._12_4_ = uVar174;
        auVar186._16_4_ = uVar174;
        auVar186._20_4_ = uVar174;
        auVar186._24_4_ = uVar174;
        auVar186._28_4_ = uVar174;
        uVar29 = vcmpps_avx512vl(auVar169,auVar186,2);
        auVar170._8_4_ = 2;
        auVar170._0_8_ = 0x200000002;
        auVar170._12_4_ = 2;
        auVar170._16_4_ = 2;
        auVar170._20_4_ = 2;
        auVar170._24_4_ = 2;
        auVar170._28_4_ = 2;
        auVar44._8_4_ = 3;
        auVar44._0_8_ = 0x300000003;
        auVar44._12_4_ = 3;
        auVar44._16_4_ = 3;
        auVar44._20_4_ = 3;
        auVar44._24_4_ = 3;
        auVar44._28_4_ = 3;
        auVar117 = vpblendmd_avx512vl(auVar170,auVar44);
        local_6a0._0_4_ = (uint)(bVar68 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar68 & 1) * 2;
        bVar78 = (bool)(bVar68 >> 1 & 1);
        local_6a0._4_4_ = (uint)bVar78 * auVar117._4_4_ | (uint)!bVar78 * 2;
        bVar78 = (bool)(bVar68 >> 2 & 1);
        fStack_698 = (float)((uint)bVar78 * auVar117._8_4_ | (uint)!bVar78 * 2);
        bVar78 = (bool)(bVar68 >> 3 & 1);
        fStack_694 = (float)((uint)bVar78 * auVar117._12_4_ | (uint)!bVar78 * 2);
        bVar78 = (bool)(bVar68 >> 4 & 1);
        fStack_690 = (float)((uint)bVar78 * auVar117._16_4_ | (uint)!bVar78 * 2);
        bVar78 = (bool)(bVar68 >> 5 & 1);
        fStack_68c = (float)((uint)bVar78 * auVar117._20_4_ | (uint)!bVar78 * 2);
        bVar78 = (bool)(bVar68 >> 6 & 1);
        fStack_688 = (float)((uint)bVar78 * auVar117._24_4_ | (uint)!bVar78 * 2);
        fStack_684 = (float)((uint)(bVar68 >> 7) * auVar117._28_4_ | (uint)!(bool)(bVar68 >> 7) * 2)
        ;
        bVar67 = (byte)uVar30 & bVar67 & (byte)uVar29;
        uVar29 = vpcmpd_avx512vl(_local_6a0,local_640,2);
        local_740 = _local_600;
        local_680 = (float)local_720._0_4_ + (float)local_600._0_4_;
        fStack_67c = (float)local_720._4_4_ + (float)local_600._4_4_;
        fStack_678 = fStack_718 + fStack_5f8;
        fStack_674 = fStack_714 + fStack_5f4;
        fStack_670 = fStack_710 + fStack_5f0;
        fStack_66c = fStack_70c + fStack_5ec;
        fStack_668 = fStack_708 + fStack_5e8;
        fStack_664 = fStack_704 + fStack_5e4;
        auVar268 = ZEXT3264(local_ac0);
        auVar261 = ZEXT3264(local_a60);
        auVar263 = ZEXT3264(local_a80);
        auVar256 = ZEXT3264(local_aa0);
        for (bVar74 = (byte)uVar29 & bVar67; auVar241 = ZEXT3264(local_9e0), bVar74 != 0;
            bVar74 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar74 & (byte)uVar29) {
          auVar171._8_4_ = 0x7f800000;
          auVar171._0_8_ = 0x7f8000007f800000;
          auVar171._12_4_ = 0x7f800000;
          auVar171._16_4_ = 0x7f800000;
          auVar171._20_4_ = 0x7f800000;
          auVar171._24_4_ = 0x7f800000;
          auVar171._28_4_ = 0x7f800000;
          auVar117 = vblendmps_avx512vl(auVar171,local_740);
          auVar149._0_4_ =
               (uint)(bVar74 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar74 & 1) * 0x7f800000;
          bVar78 = (bool)(bVar74 >> 1 & 1);
          auVar149._4_4_ = (uint)bVar78 * auVar117._4_4_ | (uint)!bVar78 * 0x7f800000;
          bVar78 = (bool)(bVar74 >> 2 & 1);
          auVar149._8_4_ = (uint)bVar78 * auVar117._8_4_ | (uint)!bVar78 * 0x7f800000;
          bVar78 = (bool)(bVar74 >> 3 & 1);
          auVar149._12_4_ = (uint)bVar78 * auVar117._12_4_ | (uint)!bVar78 * 0x7f800000;
          bVar78 = (bool)(bVar74 >> 4 & 1);
          auVar149._16_4_ = (uint)bVar78 * auVar117._16_4_ | (uint)!bVar78 * 0x7f800000;
          bVar78 = (bool)(bVar74 >> 5 & 1);
          auVar149._20_4_ = (uint)bVar78 * auVar117._20_4_ | (uint)!bVar78 * 0x7f800000;
          auVar149._24_4_ =
               (uint)(bVar74 >> 6) * auVar117._24_4_ | (uint)!(bool)(bVar74 >> 6) * 0x7f800000;
          auVar149._28_4_ = 0x7f800000;
          auVar117 = vshufps_avx(auVar149,auVar149,0xb1);
          auVar117 = vminps_avx(auVar149,auVar117);
          auVar115 = vshufpd_avx(auVar117,auVar117,5);
          auVar117 = vminps_avx(auVar117,auVar115);
          auVar115 = vpermpd_avx2(auVar117,0x4e);
          auVar117 = vminps_avx(auVar117,auVar115);
          uVar29 = vcmpps_avx512vl(auVar149,auVar117,0);
          bVar70 = (byte)uVar29 & bVar74;
          bVar68 = bVar74;
          if (bVar70 != 0) {
            bVar68 = bVar70;
          }
          iVar2 = 0;
          for (uVar80 = (uint)bVar68; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
            iVar2 = iVar2 + 1;
          }
          uVar80 = *(uint *)(local_500 + (uint)(iVar2 << 2));
          uVar151 = *(uint *)(local_5e0 + (uint)(iVar2 << 2));
          fVar173 = auVar99._0_4_;
          if ((float)local_a40._0_4_ < 0.0) {
            auVar276 = ZEXT1664(auVar276._0_16_);
            fVar173 = sqrtf((float)local_a40._0_4_);
            auVar117 = vmovdqa64_avx512vl(auVar106);
            auVar278 = ZEXT3264(auVar117);
            auVar117 = vmovdqa64_avx512vl(auVar105);
            auVar277 = ZEXT3264(auVar117);
            auVar256 = ZEXT3264(local_aa0);
            auVar281 = ZEXT3264(local_b00);
            auVar263 = ZEXT3264(local_a80);
            auVar261 = ZEXT3264(local_a60);
            auVar268 = ZEXT3264(local_ac0);
          }
          auVar94 = vminps_avx(local_840._0_16_,local_880._0_16_);
          auVar100 = vmaxps_avx(local_840._0_16_,local_880._0_16_);
          auVar101 = vminps_avx(local_860._0_16_,local_8a0._0_16_);
          auVar91 = vminps_avx(auVar94,auVar101);
          auVar94 = vmaxps_avx(local_860._0_16_,local_8a0._0_16_);
          auVar101 = vmaxps_avx(auVar100,auVar94);
          auVar226._8_4_ = 0x7fffffff;
          auVar226._0_8_ = 0x7fffffff7fffffff;
          auVar226._12_4_ = 0x7fffffff;
          auVar100 = vandps_avx(auVar91,auVar226);
          auVar94 = vandps_avx(auVar101,auVar226);
          auVar100 = vmaxps_avx(auVar100,auVar94);
          auVar94 = vmovshdup_avx(auVar100);
          auVar94 = vmaxss_avx(auVar94,auVar100);
          auVar100 = vshufpd_avx(auVar100,auVar100,1);
          auVar100 = vmaxss_avx(auVar100,auVar94);
          local_9c0._0_4_ = auVar100._0_4_ * 1.9073486e-06;
          local_820._0_4_ = fVar173 * 1.9073486e-06;
          local_960 = vshufps_avx(auVar101,auVar101,0xff);
          auVar100 = vinsertps_avx(ZEXT416(uVar151),ZEXT416(uVar80),0x10);
          auVar172 = ZEXT1664(auVar100);
          lVar72 = 5;
          do {
            do {
              bVar78 = lVar72 == 0;
              lVar72 = lVar72 + -1;
              if (bVar78) goto LAB_018a4bd9;
              uVar174 = auVar172._0_4_;
              auVar163._4_4_ = uVar174;
              auVar163._0_4_ = uVar174;
              auVar163._8_4_ = uVar174;
              auVar163._12_4_ = uVar174;
              auVar94 = vfmadd132ps_fma(auVar163,ZEXT816(0) << 0x40,local_a30);
              auVar101 = auVar172._0_16_;
              auVar100 = vmovshdup_avx(auVar101);
              local_7a0._0_16_ = auVar100;
              fVar192 = 1.0 - auVar100._0_4_;
              auVar100 = vshufps_avx(auVar101,auVar101,0x55);
              fVar173 = auVar100._0_4_;
              auVar204._0_4_ = local_880._0_4_ * fVar173;
              fVar188 = auVar100._4_4_;
              auVar204._4_4_ = local_880._4_4_ * fVar188;
              fVar189 = auVar100._8_4_;
              auVar204._8_4_ = local_880._8_4_ * fVar189;
              fVar190 = auVar100._12_4_;
              auVar204._12_4_ = local_880._12_4_ * fVar190;
              _local_780 = ZEXT416((uint)fVar192);
              auVar227._4_4_ = fVar192;
              auVar227._0_4_ = fVar192;
              auVar227._8_4_ = fVar192;
              auVar227._12_4_ = fVar192;
              auVar100 = vfmadd231ps_fma(auVar204,auVar227,local_840._0_16_);
              auVar238._0_4_ = local_860._0_4_ * fVar173;
              auVar238._4_4_ = local_860._4_4_ * fVar188;
              auVar238._8_4_ = local_860._8_4_ * fVar189;
              auVar238._12_4_ = local_860._12_4_ * fVar190;
              auVar101 = vfmadd231ps_fma(auVar238,auVar227,local_880._0_16_);
              auVar247._0_4_ = fVar173 * (float)local_8a0._0_4_;
              auVar247._4_4_ = fVar188 * (float)local_8a0._4_4_;
              auVar247._8_4_ = fVar189 * fStack_898;
              auVar247._12_4_ = fVar190 * fStack_894;
              auVar91 = vfmadd231ps_fma(auVar247,auVar227,local_860._0_16_);
              auVar254._0_4_ = fVar173 * auVar101._0_4_;
              auVar254._4_4_ = fVar188 * auVar101._4_4_;
              auVar254._8_4_ = fVar189 * auVar101._8_4_;
              auVar254._12_4_ = fVar190 * auVar101._12_4_;
              auVar100 = vfmadd231ps_fma(auVar254,auVar227,auVar100);
              auVar205._0_4_ = fVar173 * auVar91._0_4_;
              auVar205._4_4_ = fVar188 * auVar91._4_4_;
              auVar205._8_4_ = fVar189 * auVar91._8_4_;
              auVar205._12_4_ = fVar190 * auVar91._12_4_;
              auVar101 = vfmadd231ps_fma(auVar205,auVar227,auVar101);
              auVar239._0_4_ = fVar173 * auVar101._0_4_;
              auVar239._4_4_ = fVar188 * auVar101._4_4_;
              auVar239._8_4_ = fVar189 * auVar101._8_4_;
              auVar239._12_4_ = fVar190 * auVar101._12_4_;
              auVar91 = vfmadd231ps_fma(auVar239,auVar100,auVar227);
              auVar100 = vsubps_avx(auVar101,auVar100);
              auVar37._8_4_ = 0x40400000;
              auVar37._0_8_ = 0x4040000040400000;
              auVar37._12_4_ = 0x40400000;
              auVar101 = vmulps_avx512vl(auVar100,auVar37);
              local_760._0_16_ = auVar91;
              auVar94 = vsubps_avx(auVar94,auVar91);
              auVar100 = vdpps_avx(auVar94,auVar94,0x7f);
              fVar173 = auVar100._0_4_;
              local_900 = auVar172;
              if (fVar173 < 0.0) {
                auVar251._0_4_ = sqrtf(fVar173);
                auVar251._4_60_ = extraout_var_00;
                auVar91 = auVar251._0_16_;
              }
              else {
                auVar91 = vsqrtss_avx(auVar100,auVar100);
              }
              local_7c0._0_16_ = vdpps_avx(auVar101,auVar101,0x7f);
              fVar188 = local_7c0._0_4_;
              auVar206._4_12_ = ZEXT812(0) << 0x20;
              auVar206._0_4_ = fVar188;
              auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar206);
              local_7e0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar206);
              auVar38._8_4_ = 0x80000000;
              auVar38._0_8_ = 0x8000000080000000;
              auVar38._12_4_ = 0x80000000;
              auVar88 = vxorps_avx512vl(local_7c0._0_16_,auVar38);
              auVar90 = vfnmadd213ss_fma(local_7e0._0_16_,local_7c0._0_16_,ZEXT416(0x40000000));
              local_800._0_4_ = auVar90._0_4_;
              local_9a0._0_4_ = auVar91._0_4_;
              if (fVar188 < auVar88._0_4_) {
                local_ae0 = auVar87;
                auVar256._0_4_ = sqrtf(fVar188);
                auVar256._4_60_ = extraout_var_01;
                auVar91 = ZEXT416((uint)local_9a0._0_4_);
                auVar88 = auVar256._0_16_;
                auVar90 = local_ae0;
              }
              else {
                auVar88 = vsqrtss_avx512f(local_7c0._0_16_,local_7c0._0_16_);
                auVar90 = auVar87;
              }
              fVar189 = auVar90._0_4_;
              auVar92 = vbroadcastss_avx512vl
                                  (ZEXT416((uint)(auVar87._0_4_ * 1.5 +
                                                 fVar188 * -0.5 * fVar189 * fVar189 * fVar189)));
              auVar87 = vmulps_avx512vl(auVar101,auVar92);
              auVar90 = vdpps_avx(auVar94,auVar87,0x7f);
              fVar188 = auVar91._0_4_ + 1.0;
              auVar164._0_4_ = auVar90._0_4_ * auVar90._0_4_;
              auVar164._4_4_ = auVar90._4_4_ * auVar90._4_4_;
              auVar164._8_4_ = auVar90._8_4_ * auVar90._8_4_;
              auVar164._12_4_ = auVar90._12_4_ * auVar90._12_4_;
              auVar100 = vsubps_avx(auVar100,auVar164);
              fVar189 = auVar100._0_4_;
              auVar181._4_12_ = ZEXT812(0) << 0x20;
              auVar181._0_4_ = fVar189;
              auVar89 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar181);
              auVar93 = vmulss_avx512f(auVar89,ZEXT416(0x3fc00000));
              auVar102 = vmulss_avx512f(auVar100,ZEXT416(0xbf000000));
              if (fVar189 < 0.0) {
                local_ae0._0_4_ = fVar188;
                local_930._0_4_ = auVar93._0_4_;
                _local_950 = auVar92;
                local_940 = auVar87;
                local_920 = auVar89;
                fVar189 = sqrtf(fVar189);
                auVar102 = ZEXT416(auVar102._0_4_);
                auVar93 = ZEXT416((uint)local_930._0_4_);
                auVar88 = ZEXT416(auVar88._0_4_);
                auVar91 = ZEXT416((uint)local_9a0._0_4_);
                auVar87 = local_940;
                fVar188 = (float)local_ae0._0_4_;
                auVar89 = local_920;
                auVar92 = _local_950;
              }
              else {
                auVar100 = vsqrtss_avx(auVar100,auVar100);
                fVar189 = auVar100._0_4_;
              }
              auVar268 = ZEXT3264(local_ac0);
              auVar281 = ZEXT3264(local_b00);
              auVar117 = vmovdqa64_avx512vl(auVar105);
              auVar277 = ZEXT3264(auVar117);
              auVar117 = vmovdqa64_avx512vl(auVar106);
              auVar278 = ZEXT3264(auVar117);
              auVar28 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_780,local_7a0._0_16_);
              auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7a0._0_16_,_local_780)
              ;
              fVar190 = auVar100._0_4_ * 6.0;
              fVar192 = local_7a0._0_4_ * 6.0;
              auVar228._0_4_ = fVar192 * (float)local_8a0._0_4_;
              auVar228._4_4_ = fVar192 * (float)local_8a0._4_4_;
              auVar228._8_4_ = fVar192 * fStack_898;
              auVar228._12_4_ = fVar192 * fStack_894;
              auVar207._4_4_ = fVar190;
              auVar207._0_4_ = fVar190;
              auVar207._8_4_ = fVar190;
              auVar207._12_4_ = fVar190;
              auVar100 = vfmadd132ps_fma(auVar207,auVar228,local_860._0_16_);
              fVar190 = auVar28._0_4_ * 6.0;
              auVar182._4_4_ = fVar190;
              auVar182._0_4_ = fVar190;
              auVar182._8_4_ = fVar190;
              auVar182._12_4_ = fVar190;
              auVar100 = vfmadd132ps_fma(auVar182,auVar100,local_880._0_16_);
              fVar190 = local_780._0_4_ * 6.0;
              auVar208._4_4_ = fVar190;
              auVar208._0_4_ = fVar190;
              auVar208._8_4_ = fVar190;
              auVar208._12_4_ = fVar190;
              auVar100 = vfmadd132ps_fma(auVar208,auVar100,local_840._0_16_);
              auVar183._0_4_ = auVar100._0_4_ * (float)local_7c0._0_4_;
              auVar183._4_4_ = auVar100._4_4_ * (float)local_7c0._0_4_;
              auVar183._8_4_ = auVar100._8_4_ * (float)local_7c0._0_4_;
              auVar183._12_4_ = auVar100._12_4_ * (float)local_7c0._0_4_;
              auVar100 = vdpps_avx(auVar101,auVar100,0x7f);
              fVar190 = auVar100._0_4_;
              auVar209._0_4_ = auVar101._0_4_ * fVar190;
              auVar209._4_4_ = auVar101._4_4_ * fVar190;
              auVar209._8_4_ = auVar101._8_4_ * fVar190;
              auVar209._12_4_ = auVar101._12_4_ * fVar190;
              auVar100 = vsubps_avx(auVar183,auVar209);
              fVar190 = (float)local_800._0_4_ * (float)local_7e0._0_4_;
              auVar28 = vmaxss_avx(ZEXT416((uint)local_9c0._0_4_),
                                   ZEXT416((uint)(local_900._0_4_ * (float)local_820._0_4_)));
              auVar210._0_4_ = auVar100._0_4_ * fVar190;
              auVar210._4_4_ = auVar100._4_4_ * fVar190;
              auVar210._8_4_ = auVar100._8_4_ * fVar190;
              auVar210._12_4_ = auVar100._12_4_ * fVar190;
              auVar39._8_4_ = 0x80000000;
              auVar39._0_8_ = 0x8000000080000000;
              auVar39._12_4_ = 0x80000000;
              auVar103 = vxorps_avx512vl(auVar101,auVar39);
              auVar92 = vmulps_avx512vl(auVar92,auVar210);
              auVar100 = vdpps_avx(auVar103,auVar87,0x7f);
              auVar104 = vdivss_avx512f(ZEXT416((uint)local_9c0._0_4_),auVar88);
              auVar88 = vfmadd213ss_fma(auVar91,ZEXT416((uint)local_9c0._0_4_),auVar28);
              auVar91 = vdpps_avx(auVar94,auVar92,0x7f);
              auVar92 = vfmadd213ss_fma(ZEXT416((uint)fVar188),auVar104,auVar88);
              auVar276 = ZEXT1664(auVar92);
              fVar188 = auVar100._0_4_ + auVar91._0_4_;
              auVar100 = vdpps_avx(local_a30,auVar87,0x7f);
              auVar91 = vdpps_avx(auVar94,auVar103,0x7f);
              auVar87 = vmulss_avx512f(auVar102,auVar89);
              auVar88 = vmulss_avx512f(auVar89,auVar89);
              auVar93 = vaddss_avx512f(auVar93,ZEXT416((uint)(auVar87._0_4_ * auVar88._0_4_)));
              auVar87 = vdpps_avx(auVar94,local_a30,0x7f);
              auVar89 = vfnmadd231ss_fma(auVar91,auVar90,ZEXT416((uint)fVar188));
              auVar87 = vfnmadd231ss_fma(auVar87,auVar90,auVar100);
              auVar91 = vpermilps_avx(local_760._0_16_,0xff);
              fVar189 = fVar189 - auVar91._0_4_;
              auVar88 = vshufps_avx(auVar101,auVar101,0xff);
              auVar91 = vfmsub213ss_fma(auVar89,auVar93,auVar88);
              auVar259._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
              auVar259._8_4_ = auVar91._8_4_ ^ 0x80000000;
              auVar259._12_4_ = auVar91._12_4_ ^ 0x80000000;
              auVar87 = ZEXT416((uint)(auVar87._0_4_ * auVar93._0_4_));
              auVar89 = vfmsub231ss_fma(ZEXT416((uint)(auVar100._0_4_ * auVar91._0_4_)),
                                        ZEXT416((uint)fVar188),auVar87);
              auVar91 = vinsertps_avx(auVar259,auVar87,0x1c);
              auVar248._0_8_ = auVar100._0_8_ ^ 0x8000000080000000;
              auVar248._8_4_ = auVar100._8_4_ ^ 0x80000000;
              auVar248._12_4_ = auVar100._12_4_ ^ 0x80000000;
              auVar87 = vinsertps_avx(ZEXT416((uint)fVar188),auVar248,0x10);
              auVar229._0_4_ = auVar89._0_4_;
              auVar229._4_4_ = auVar229._0_4_;
              auVar229._8_4_ = auVar229._0_4_;
              auVar229._12_4_ = auVar229._0_4_;
              auVar100 = vdivps_avx(auVar91,auVar229);
              auVar91 = vdivps_avx(auVar87,auVar229);
              auVar87 = vbroadcastss_avx512vl(auVar90);
              auVar230._0_4_ = auVar87._0_4_ * auVar100._0_4_ + fVar189 * auVar91._0_4_;
              auVar230._4_4_ = auVar87._4_4_ * auVar100._4_4_ + fVar189 * auVar91._4_4_;
              auVar230._8_4_ = auVar87._8_4_ * auVar100._8_4_ + fVar189 * auVar91._8_4_;
              auVar230._12_4_ = auVar87._12_4_ * auVar100._12_4_ + fVar189 * auVar91._12_4_;
              auVar100 = vsubps_avx(local_900._0_16_,auVar230);
              auVar172 = ZEXT1664(auVar100);
              auVar40._8_4_ = 0x7fffffff;
              auVar40._0_8_ = 0x7fffffff7fffffff;
              auVar40._12_4_ = 0x7fffffff;
              auVar91 = vandps_avx512vl(auVar90,auVar40);
              auVar261 = ZEXT3264(local_a60);
              auVar263 = ZEXT3264(local_a80);
              auVar256 = ZEXT3264(local_aa0);
            } while (auVar92._0_4_ <= auVar91._0_4_);
            auVar91 = vfmadd231ss_fma(ZEXT416((uint)(auVar92._0_4_ + auVar28._0_4_)),local_960,
                                      ZEXT416(0x36000000));
            auVar41._8_4_ = 0x7fffffff;
            auVar41._0_8_ = 0x7fffffff7fffffff;
            auVar41._12_4_ = 0x7fffffff;
            auVar90 = vandps_avx512vl(ZEXT416((uint)fVar189),auVar41);
          } while (auVar91._0_4_ <= auVar90._0_4_);
          fVar188 = auVar100._0_4_ + (float)local_970._0_4_;
          if (fVar6 <= fVar188) {
            fVar189 = *(float *)(ray + k * 4 + 0x200);
            auVar276 = ZEXT464((uint)fVar189);
            if (fVar188 <= fVar189) {
              auVar100 = vmovshdup_avx(auVar100);
              fVar190 = auVar100._0_4_;
              if ((0.0 <= fVar190) && (fVar190 <= 1.0)) {
                auVar100 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)fVar173));
                fVar192 = auVar100._0_4_;
                pGVar8 = (context->scene->geometries).items[uVar7].ptr;
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  fVar173 = fVar192 * 1.5 + fVar173 * -0.5 * fVar192 * fVar192 * fVar192;
                  auVar231._0_4_ = auVar94._0_4_ * fVar173;
                  auVar231._4_4_ = auVar94._4_4_ * fVar173;
                  auVar231._8_4_ = auVar94._8_4_ * fVar173;
                  auVar231._12_4_ = auVar94._12_4_ * fVar173;
                  auVar91 = vfmadd213ps_fma(auVar88,auVar231,auVar101);
                  auVar100 = vshufps_avx(auVar231,auVar231,0xc9);
                  auVar94 = vshufps_avx(auVar101,auVar101,0xc9);
                  auVar232._0_4_ = auVar231._0_4_ * auVar94._0_4_;
                  auVar232._4_4_ = auVar231._4_4_ * auVar94._4_4_;
                  auVar232._8_4_ = auVar231._8_4_ * auVar94._8_4_;
                  auVar232._12_4_ = auVar231._12_4_ * auVar94._12_4_;
                  auVar101 = vfmsub231ps_fma(auVar232,auVar101,auVar100);
                  auVar100 = vshufps_avx(auVar101,auVar101,0xc9);
                  auVar94 = vshufps_avx(auVar91,auVar91,0xc9);
                  auVar101 = vshufps_avx(auVar101,auVar101,0xd2);
                  auVar165._0_4_ = auVar91._0_4_ * auVar101._0_4_;
                  auVar165._4_4_ = auVar91._4_4_ * auVar101._4_4_;
                  auVar165._8_4_ = auVar91._8_4_ * auVar101._8_4_;
                  auVar165._12_4_ = auVar91._12_4_ * auVar101._12_4_;
                  auVar100 = vfmsub231ps_fma(auVar165,auVar100,auVar94);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar188;
                    uVar174 = vextractps_avx(auVar100,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar174;
                    uVar174 = vextractps_avx(auVar100,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar174;
                    *(int *)(ray + k * 4 + 0x380) = auVar100._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar190;
                    *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                    *(int *)(ray + k * 4 + 0x440) = (int)local_ac8;
                    *(uint *)(ray + k * 4 + 0x480) = uVar7;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar12 = context->user;
                    auVar241 = vbroadcastss_avx512f(ZEXT416(1));
                    local_340 = vpermps_avx512f(auVar241,auVar172);
                    auVar172 = vpermps_avx512f(auVar241,ZEXT1664(auVar100));
                    auVar241 = vbroadcastss_avx512f(ZEXT416(2));
                    local_3c0 = vpermps_avx512f(auVar241,ZEXT1664(auVar100));
                    local_380 = vbroadcastss_avx512f(auVar100);
                    local_400[0] = (RTCHitN)auVar172[0];
                    local_400[1] = (RTCHitN)auVar172[1];
                    local_400[2] = (RTCHitN)auVar172[2];
                    local_400[3] = (RTCHitN)auVar172[3];
                    local_400[4] = (RTCHitN)auVar172[4];
                    local_400[5] = (RTCHitN)auVar172[5];
                    local_400[6] = (RTCHitN)auVar172[6];
                    local_400[7] = (RTCHitN)auVar172[7];
                    local_400[8] = (RTCHitN)auVar172[8];
                    local_400[9] = (RTCHitN)auVar172[9];
                    local_400[10] = (RTCHitN)auVar172[10];
                    local_400[0xb] = (RTCHitN)auVar172[0xb];
                    local_400[0xc] = (RTCHitN)auVar172[0xc];
                    local_400[0xd] = (RTCHitN)auVar172[0xd];
                    local_400[0xe] = (RTCHitN)auVar172[0xe];
                    local_400[0xf] = (RTCHitN)auVar172[0xf];
                    local_400[0x10] = (RTCHitN)auVar172[0x10];
                    local_400[0x11] = (RTCHitN)auVar172[0x11];
                    local_400[0x12] = (RTCHitN)auVar172[0x12];
                    local_400[0x13] = (RTCHitN)auVar172[0x13];
                    local_400[0x14] = (RTCHitN)auVar172[0x14];
                    local_400[0x15] = (RTCHitN)auVar172[0x15];
                    local_400[0x16] = (RTCHitN)auVar172[0x16];
                    local_400[0x17] = (RTCHitN)auVar172[0x17];
                    local_400[0x18] = (RTCHitN)auVar172[0x18];
                    local_400[0x19] = (RTCHitN)auVar172[0x19];
                    local_400[0x1a] = (RTCHitN)auVar172[0x1a];
                    local_400[0x1b] = (RTCHitN)auVar172[0x1b];
                    local_400[0x1c] = (RTCHitN)auVar172[0x1c];
                    local_400[0x1d] = (RTCHitN)auVar172[0x1d];
                    local_400[0x1e] = (RTCHitN)auVar172[0x1e];
                    local_400[0x1f] = (RTCHitN)auVar172[0x1f];
                    local_400[0x20] = (RTCHitN)auVar172[0x20];
                    local_400[0x21] = (RTCHitN)auVar172[0x21];
                    local_400[0x22] = (RTCHitN)auVar172[0x22];
                    local_400[0x23] = (RTCHitN)auVar172[0x23];
                    local_400[0x24] = (RTCHitN)auVar172[0x24];
                    local_400[0x25] = (RTCHitN)auVar172[0x25];
                    local_400[0x26] = (RTCHitN)auVar172[0x26];
                    local_400[0x27] = (RTCHitN)auVar172[0x27];
                    local_400[0x28] = (RTCHitN)auVar172[0x28];
                    local_400[0x29] = (RTCHitN)auVar172[0x29];
                    local_400[0x2a] = (RTCHitN)auVar172[0x2a];
                    local_400[0x2b] = (RTCHitN)auVar172[0x2b];
                    local_400[0x2c] = (RTCHitN)auVar172[0x2c];
                    local_400[0x2d] = (RTCHitN)auVar172[0x2d];
                    local_400[0x2e] = (RTCHitN)auVar172[0x2e];
                    local_400[0x2f] = (RTCHitN)auVar172[0x2f];
                    local_400[0x30] = (RTCHitN)auVar172[0x30];
                    local_400[0x31] = (RTCHitN)auVar172[0x31];
                    local_400[0x32] = (RTCHitN)auVar172[0x32];
                    local_400[0x33] = (RTCHitN)auVar172[0x33];
                    local_400[0x34] = (RTCHitN)auVar172[0x34];
                    local_400[0x35] = (RTCHitN)auVar172[0x35];
                    local_400[0x36] = (RTCHitN)auVar172[0x36];
                    local_400[0x37] = (RTCHitN)auVar172[0x37];
                    local_400[0x38] = (RTCHitN)auVar172[0x38];
                    local_400[0x39] = (RTCHitN)auVar172[0x39];
                    local_400[0x3a] = (RTCHitN)auVar172[0x3a];
                    local_400[0x3b] = (RTCHitN)auVar172[0x3b];
                    local_400[0x3c] = (RTCHitN)auVar172[0x3c];
                    local_400[0x3d] = (RTCHitN)auVar172[0x3d];
                    local_400[0x3e] = (RTCHitN)auVar172[0x3e];
                    local_400[0x3f] = (RTCHitN)auVar172[0x3f];
                    local_300 = 0;
                    uStack_2f8 = 0;
                    uStack_2f0 = 0;
                    uStack_2e8 = 0;
                    uStack_2e0 = 0;
                    uStack_2d8 = 0;
                    uStack_2d0 = 0;
                    uStack_2c8 = 0;
                    local_2c0 = local_480._0_8_;
                    uStack_2b8 = local_480._8_8_;
                    uStack_2b0 = local_480._16_8_;
                    uStack_2a8 = local_480._24_8_;
                    uStack_2a0 = local_480._32_8_;
                    uStack_298 = local_480._40_8_;
                    uStack_290 = local_480._48_8_;
                    uStack_288 = local_480._56_8_;
                    auVar172 = vmovdqa64_avx512f(local_440);
                    local_280 = vmovdqa64_avx512f(auVar172);
                    auVar117 = vpcmpeqd_avx2(auVar172._0_32_,auVar172._0_32_);
                    local_ad0[3] = auVar117;
                    local_ad0[2] = auVar117;
                    local_ad0[1] = auVar117;
                    *local_ad0 = auVar117;
                    local_240 = vbroadcastss_avx512f(ZEXT416(pRVar12->instID[0]));
                    local_200 = vbroadcastss_avx512f(ZEXT416(pRVar12->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar188;
                    auVar172 = vmovdqa64_avx512f(local_4c0);
                    local_700 = vmovdqa64_avx512f(auVar172);
                    local_b30.valid = (int *)local_700;
                    local_b30.geometryUserPtr = pGVar8->userPtr;
                    local_b30.context = context->user;
                    local_b30.hit = local_400;
                    local_b30.N = 0x10;
                    local_900._0_4_ = fVar189;
                    local_b30.ray = (RTCRayN *)ray;
                    if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar8->intersectionFilterN)(&local_b30);
                      auVar276 = ZEXT464((uint)local_900._0_4_);
                      auVar117 = vmovdqa64_avx512vl(auVar106);
                      auVar278 = ZEXT3264(auVar117);
                      auVar117 = vmovdqa64_avx512vl(auVar105);
                      auVar277 = ZEXT3264(auVar117);
                      auVar256 = ZEXT3264(local_aa0);
                      auVar281 = ZEXT3264(local_b00);
                      auVar263 = ZEXT3264(local_a80);
                      auVar261 = ZEXT3264(local_a60);
                      auVar268 = ZEXT3264(local_ac0);
                      auVar172 = vmovdqa64_avx512f(local_700);
                    }
                    uVar29 = vptestmd_avx512f(auVar172,auVar172);
                    if ((short)uVar29 != 0) {
                      p_Var13 = context->args->filter;
                      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var13)(&local_b30);
                        auVar276 = ZEXT464((uint)local_900._0_4_);
                        auVar117 = vmovdqa64_avx512vl(auVar106);
                        auVar278 = ZEXT3264(auVar117);
                        auVar117 = vmovdqa64_avx512vl(auVar105);
                        auVar277 = ZEXT3264(auVar117);
                        auVar256 = ZEXT3264(local_aa0);
                        auVar281 = ZEXT3264(local_b00);
                        auVar263 = ZEXT3264(local_a80);
                        auVar261 = ZEXT3264(local_a60);
                        auVar268 = ZEXT3264(local_ac0);
                        auVar172 = vmovdqa64_avx512f(local_700);
                      }
                      uVar79 = vptestmd_avx512f(auVar172,auVar172);
                      if ((short)uVar79 != 0) {
                        iVar3 = *(int *)(local_b30.hit + 4);
                        iVar4 = *(int *)(local_b30.hit + 8);
                        iVar1 = *(int *)(local_b30.hit + 0xc);
                        iVar53 = *(int *)(local_b30.hit + 0x10);
                        iVar54 = *(int *)(local_b30.hit + 0x14);
                        iVar55 = *(int *)(local_b30.hit + 0x18);
                        iVar56 = *(int *)(local_b30.hit + 0x1c);
                        iVar57 = *(int *)(local_b30.hit + 0x20);
                        iVar58 = *(int *)(local_b30.hit + 0x24);
                        iVar59 = *(int *)(local_b30.hit + 0x28);
                        iVar60 = *(int *)(local_b30.hit + 0x2c);
                        iVar61 = *(int *)(local_b30.hit + 0x30);
                        iVar62 = *(int *)(local_b30.hit + 0x34);
                        iVar63 = *(int *)(local_b30.hit + 0x38);
                        iVar64 = *(int *)(local_b30.hit + 0x3c);
                        bVar68 = (byte)uVar79;
                        bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar79 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar79 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar79 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar79 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar79 >> 7) & 1);
                        bVar70 = (byte)(uVar79 >> 8);
                        bVar20 = (bool)((byte)(uVar79 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar79 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar79 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar79 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar79 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar79 >> 0xe) & 1);
                        bVar26 = SUB81(uVar79 >> 0xf,0);
                        *(uint *)(local_b30.ray + 0x300) =
                             (uint)(bVar68 & 1) * *(int *)local_b30.hit |
                             (uint)!(bool)(bVar68 & 1) * *(int *)(local_b30.ray + 0x300);
                        *(uint *)(local_b30.ray + 0x304) =
                             (uint)bVar78 * iVar3 | (uint)!bVar78 * *(int *)(local_b30.ray + 0x304);
                        *(uint *)(local_b30.ray + 0x308) =
                             (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x308);
                        *(uint *)(local_b30.ray + 0x30c) =
                             (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x30c);
                        *(uint *)(local_b30.ray + 0x310) =
                             (uint)bVar16 * iVar53 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x310)
                        ;
                        *(uint *)(local_b30.ray + 0x314) =
                             (uint)bVar17 * iVar54 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x314)
                        ;
                        *(uint *)(local_b30.ray + 0x318) =
                             (uint)bVar18 * iVar55 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x318)
                        ;
                        *(uint *)(local_b30.ray + 0x31c) =
                             (uint)bVar19 * iVar56 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x31c)
                        ;
                        *(uint *)(local_b30.ray + 800) =
                             (uint)(bVar70 & 1) * iVar57 |
                             (uint)!(bool)(bVar70 & 1) * *(int *)(local_b30.ray + 800);
                        *(uint *)(local_b30.ray + 0x324) =
                             (uint)bVar20 * iVar58 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x324)
                        ;
                        *(uint *)(local_b30.ray + 0x328) =
                             (uint)bVar21 * iVar59 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x328)
                        ;
                        *(uint *)(local_b30.ray + 0x32c) =
                             (uint)bVar22 * iVar60 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x32c)
                        ;
                        *(uint *)(local_b30.ray + 0x330) =
                             (uint)bVar23 * iVar61 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x330)
                        ;
                        *(uint *)(local_b30.ray + 0x334) =
                             (uint)bVar24 * iVar62 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x334)
                        ;
                        *(uint *)(local_b30.ray + 0x338) =
                             (uint)bVar25 * iVar63 | (uint)!bVar25 * *(int *)(local_b30.ray + 0x338)
                        ;
                        *(uint *)(local_b30.ray + 0x33c) =
                             (uint)bVar26 * iVar64 | (uint)!bVar26 * *(int *)(local_b30.ray + 0x33c)
                        ;
                        iVar3 = *(int *)(local_b30.hit + 0x44);
                        iVar4 = *(int *)(local_b30.hit + 0x48);
                        iVar1 = *(int *)(local_b30.hit + 0x4c);
                        iVar53 = *(int *)(local_b30.hit + 0x50);
                        iVar54 = *(int *)(local_b30.hit + 0x54);
                        iVar55 = *(int *)(local_b30.hit + 0x58);
                        iVar56 = *(int *)(local_b30.hit + 0x5c);
                        iVar57 = *(int *)(local_b30.hit + 0x60);
                        iVar58 = *(int *)(local_b30.hit + 100);
                        iVar59 = *(int *)(local_b30.hit + 0x68);
                        iVar60 = *(int *)(local_b30.hit + 0x6c);
                        iVar61 = *(int *)(local_b30.hit + 0x70);
                        iVar62 = *(int *)(local_b30.hit + 0x74);
                        iVar63 = *(int *)(local_b30.hit + 0x78);
                        iVar64 = *(int *)(local_b30.hit + 0x7c);
                        bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar79 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar79 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar79 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar79 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar79 >> 7) & 1);
                        bVar20 = (bool)((byte)(uVar79 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar79 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar79 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar79 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar79 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar79 >> 0xe) & 1);
                        bVar26 = SUB81(uVar79 >> 0xf,0);
                        *(uint *)(local_b30.ray + 0x340) =
                             (uint)(bVar68 & 1) * *(int *)(local_b30.hit + 0x40) |
                             (uint)!(bool)(bVar68 & 1) * *(int *)(local_b30.ray + 0x340);
                        *(uint *)(local_b30.ray + 0x344) =
                             (uint)bVar78 * iVar3 | (uint)!bVar78 * *(int *)(local_b30.ray + 0x344);
                        *(uint *)(local_b30.ray + 0x348) =
                             (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x348);
                        *(uint *)(local_b30.ray + 0x34c) =
                             (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x34c);
                        *(uint *)(local_b30.ray + 0x350) =
                             (uint)bVar16 * iVar53 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x350)
                        ;
                        *(uint *)(local_b30.ray + 0x354) =
                             (uint)bVar17 * iVar54 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x354)
                        ;
                        *(uint *)(local_b30.ray + 0x358) =
                             (uint)bVar18 * iVar55 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x358)
                        ;
                        *(uint *)(local_b30.ray + 0x35c) =
                             (uint)bVar19 * iVar56 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x35c)
                        ;
                        *(uint *)(local_b30.ray + 0x360) =
                             (uint)(bVar70 & 1) * iVar57 |
                             (uint)!(bool)(bVar70 & 1) * *(int *)(local_b30.ray + 0x360);
                        *(uint *)(local_b30.ray + 0x364) =
                             (uint)bVar20 * iVar58 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x364)
                        ;
                        *(uint *)(local_b30.ray + 0x368) =
                             (uint)bVar21 * iVar59 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x368)
                        ;
                        *(uint *)(local_b30.ray + 0x36c) =
                             (uint)bVar22 * iVar60 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x36c)
                        ;
                        *(uint *)(local_b30.ray + 0x370) =
                             (uint)bVar23 * iVar61 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x370)
                        ;
                        *(uint *)(local_b30.ray + 0x374) =
                             (uint)bVar24 * iVar62 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x374)
                        ;
                        *(uint *)(local_b30.ray + 0x378) =
                             (uint)bVar25 * iVar63 | (uint)!bVar25 * *(int *)(local_b30.ray + 0x378)
                        ;
                        *(uint *)(local_b30.ray + 0x37c) =
                             (uint)bVar26 * iVar64 | (uint)!bVar26 * *(int *)(local_b30.ray + 0x37c)
                        ;
                        iVar3 = *(int *)(local_b30.hit + 0x84);
                        iVar4 = *(int *)(local_b30.hit + 0x88);
                        iVar1 = *(int *)(local_b30.hit + 0x8c);
                        iVar53 = *(int *)(local_b30.hit + 0x90);
                        iVar54 = *(int *)(local_b30.hit + 0x94);
                        iVar55 = *(int *)(local_b30.hit + 0x98);
                        iVar56 = *(int *)(local_b30.hit + 0x9c);
                        iVar57 = *(int *)(local_b30.hit + 0xa0);
                        iVar58 = *(int *)(local_b30.hit + 0xa4);
                        iVar59 = *(int *)(local_b30.hit + 0xa8);
                        iVar60 = *(int *)(local_b30.hit + 0xac);
                        iVar61 = *(int *)(local_b30.hit + 0xb0);
                        iVar62 = *(int *)(local_b30.hit + 0xb4);
                        iVar63 = *(int *)(local_b30.hit + 0xb8);
                        iVar64 = *(int *)(local_b30.hit + 0xbc);
                        bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar79 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar79 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar79 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar79 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar79 >> 7) & 1);
                        bVar20 = (bool)((byte)(uVar79 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar79 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar79 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar79 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar79 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar79 >> 0xe) & 1);
                        bVar26 = SUB81(uVar79 >> 0xf,0);
                        *(uint *)(local_b30.ray + 0x380) =
                             (uint)(bVar68 & 1) * *(int *)(local_b30.hit + 0x80) |
                             (uint)!(bool)(bVar68 & 1) * *(int *)(local_b30.ray + 0x380);
                        *(uint *)(local_b30.ray + 900) =
                             (uint)bVar78 * iVar3 | (uint)!bVar78 * *(int *)(local_b30.ray + 900);
                        *(uint *)(local_b30.ray + 0x388) =
                             (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x388);
                        *(uint *)(local_b30.ray + 0x38c) =
                             (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x38c);
                        *(uint *)(local_b30.ray + 0x390) =
                             (uint)bVar16 * iVar53 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x390)
                        ;
                        *(uint *)(local_b30.ray + 0x394) =
                             (uint)bVar17 * iVar54 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x394)
                        ;
                        *(uint *)(local_b30.ray + 0x398) =
                             (uint)bVar18 * iVar55 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x398)
                        ;
                        *(uint *)(local_b30.ray + 0x39c) =
                             (uint)bVar19 * iVar56 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x39c)
                        ;
                        *(uint *)(local_b30.ray + 0x3a0) =
                             (uint)(bVar70 & 1) * iVar57 |
                             (uint)!(bool)(bVar70 & 1) * *(int *)(local_b30.ray + 0x3a0);
                        *(uint *)(local_b30.ray + 0x3a4) =
                             (uint)bVar20 * iVar58 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x3a4)
                        ;
                        *(uint *)(local_b30.ray + 0x3a8) =
                             (uint)bVar21 * iVar59 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x3a8)
                        ;
                        *(uint *)(local_b30.ray + 0x3ac) =
                             (uint)bVar22 * iVar60 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x3ac)
                        ;
                        *(uint *)(local_b30.ray + 0x3b0) =
                             (uint)bVar23 * iVar61 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x3b0)
                        ;
                        *(uint *)(local_b30.ray + 0x3b4) =
                             (uint)bVar24 * iVar62 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x3b4)
                        ;
                        *(uint *)(local_b30.ray + 0x3b8) =
                             (uint)bVar25 * iVar63 | (uint)!bVar25 * *(int *)(local_b30.ray + 0x3b8)
                        ;
                        *(uint *)(local_b30.ray + 0x3bc) =
                             (uint)bVar26 * iVar64 | (uint)!bVar26 * *(int *)(local_b30.ray + 0x3bc)
                        ;
                        iVar3 = *(int *)(local_b30.hit + 0xc4);
                        iVar4 = *(int *)(local_b30.hit + 200);
                        iVar1 = *(int *)(local_b30.hit + 0xcc);
                        iVar53 = *(int *)(local_b30.hit + 0xd0);
                        iVar54 = *(int *)(local_b30.hit + 0xd4);
                        iVar55 = *(int *)(local_b30.hit + 0xd8);
                        iVar56 = *(int *)(local_b30.hit + 0xdc);
                        iVar57 = *(int *)(local_b30.hit + 0xe0);
                        iVar58 = *(int *)(local_b30.hit + 0xe4);
                        iVar59 = *(int *)(local_b30.hit + 0xe8);
                        iVar60 = *(int *)(local_b30.hit + 0xec);
                        iVar61 = *(int *)(local_b30.hit + 0xf0);
                        iVar62 = *(int *)(local_b30.hit + 0xf4);
                        iVar63 = *(int *)(local_b30.hit + 0xf8);
                        iVar64 = *(int *)(local_b30.hit + 0xfc);
                        bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar79 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar79 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar79 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar79 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar79 >> 7) & 1);
                        bVar20 = (bool)((byte)(uVar79 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar79 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar79 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar79 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar79 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar79 >> 0xe) & 1);
                        bVar26 = SUB81(uVar79 >> 0xf,0);
                        *(uint *)(local_b30.ray + 0x3c0) =
                             (uint)(bVar68 & 1) * *(int *)(local_b30.hit + 0xc0) |
                             (uint)!(bool)(bVar68 & 1) * *(int *)(local_b30.ray + 0x3c0);
                        *(uint *)(local_b30.ray + 0x3c4) =
                             (uint)bVar78 * iVar3 | (uint)!bVar78 * *(int *)(local_b30.ray + 0x3c4);
                        *(uint *)(local_b30.ray + 0x3c8) =
                             (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x3c8);
                        *(uint *)(local_b30.ray + 0x3cc) =
                             (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x3cc);
                        *(uint *)(local_b30.ray + 0x3d0) =
                             (uint)bVar16 * iVar53 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x3d0)
                        ;
                        *(uint *)(local_b30.ray + 0x3d4) =
                             (uint)bVar17 * iVar54 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x3d4)
                        ;
                        *(uint *)(local_b30.ray + 0x3d8) =
                             (uint)bVar18 * iVar55 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x3d8)
                        ;
                        *(uint *)(local_b30.ray + 0x3dc) =
                             (uint)bVar19 * iVar56 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x3dc)
                        ;
                        *(uint *)(local_b30.ray + 0x3e0) =
                             (uint)(bVar70 & 1) * iVar57 |
                             (uint)!(bool)(bVar70 & 1) * *(int *)(local_b30.ray + 0x3e0);
                        *(uint *)(local_b30.ray + 0x3e4) =
                             (uint)bVar20 * iVar58 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x3e4)
                        ;
                        *(uint *)(local_b30.ray + 1000) =
                             (uint)bVar21 * iVar59 | (uint)!bVar21 * *(int *)(local_b30.ray + 1000);
                        *(uint *)(local_b30.ray + 0x3ec) =
                             (uint)bVar22 * iVar60 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x3ec)
                        ;
                        *(uint *)(local_b30.ray + 0x3f0) =
                             (uint)bVar23 * iVar61 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x3f0)
                        ;
                        *(uint *)(local_b30.ray + 0x3f4) =
                             (uint)bVar24 * iVar62 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x3f4)
                        ;
                        *(uint *)(local_b30.ray + 0x3f8) =
                             (uint)bVar25 * iVar63 | (uint)!bVar25 * *(int *)(local_b30.ray + 0x3f8)
                        ;
                        *(uint *)(local_b30.ray + 0x3fc) =
                             (uint)bVar26 * iVar64 | (uint)!bVar26 * *(int *)(local_b30.ray + 0x3fc)
                        ;
                        iVar3 = *(int *)(local_b30.hit + 0x104);
                        iVar4 = *(int *)(local_b30.hit + 0x108);
                        iVar1 = *(int *)(local_b30.hit + 0x10c);
                        iVar53 = *(int *)(local_b30.hit + 0x110);
                        iVar54 = *(int *)(local_b30.hit + 0x114);
                        iVar55 = *(int *)(local_b30.hit + 0x118);
                        iVar56 = *(int *)(local_b30.hit + 0x11c);
                        iVar57 = *(int *)(local_b30.hit + 0x120);
                        iVar58 = *(int *)(local_b30.hit + 0x124);
                        iVar59 = *(int *)(local_b30.hit + 0x128);
                        iVar60 = *(int *)(local_b30.hit + 300);
                        iVar61 = *(int *)(local_b30.hit + 0x130);
                        iVar62 = *(int *)(local_b30.hit + 0x134);
                        iVar63 = *(int *)(local_b30.hit + 0x138);
                        iVar64 = *(int *)(local_b30.hit + 0x13c);
                        bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar79 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar79 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar79 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar79 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar79 >> 7) & 1);
                        bVar20 = (bool)((byte)(uVar79 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar79 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar79 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar79 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar79 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar79 >> 0xe) & 1);
                        bVar26 = SUB81(uVar79 >> 0xf,0);
                        *(uint *)(local_b30.ray + 0x400) =
                             (uint)(bVar68 & 1) * *(int *)(local_b30.hit + 0x100) |
                             (uint)!(bool)(bVar68 & 1) * *(int *)(local_b30.ray + 0x400);
                        *(uint *)(local_b30.ray + 0x404) =
                             (uint)bVar78 * iVar3 | (uint)!bVar78 * *(int *)(local_b30.ray + 0x404);
                        *(uint *)(local_b30.ray + 0x408) =
                             (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x408);
                        *(uint *)(local_b30.ray + 0x40c) =
                             (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x40c);
                        *(uint *)(local_b30.ray + 0x410) =
                             (uint)bVar16 * iVar53 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x410)
                        ;
                        *(uint *)(local_b30.ray + 0x414) =
                             (uint)bVar17 * iVar54 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x414)
                        ;
                        *(uint *)(local_b30.ray + 0x418) =
                             (uint)bVar18 * iVar55 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x418)
                        ;
                        *(uint *)(local_b30.ray + 0x41c) =
                             (uint)bVar19 * iVar56 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x41c)
                        ;
                        *(uint *)(local_b30.ray + 0x420) =
                             (uint)(bVar70 & 1) * iVar57 |
                             (uint)!(bool)(bVar70 & 1) * *(int *)(local_b30.ray + 0x420);
                        *(uint *)(local_b30.ray + 0x424) =
                             (uint)bVar20 * iVar58 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x424)
                        ;
                        *(uint *)(local_b30.ray + 0x428) =
                             (uint)bVar21 * iVar59 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x428)
                        ;
                        *(uint *)(local_b30.ray + 0x42c) =
                             (uint)bVar22 * iVar60 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x42c)
                        ;
                        *(uint *)(local_b30.ray + 0x430) =
                             (uint)bVar23 * iVar61 | (uint)!bVar23 * *(int *)(local_b30.ray + 0x430)
                        ;
                        *(uint *)(local_b30.ray + 0x434) =
                             (uint)bVar24 * iVar62 | (uint)!bVar24 * *(int *)(local_b30.ray + 0x434)
                        ;
                        *(uint *)(local_b30.ray + 0x438) =
                             (uint)bVar25 * iVar63 | (uint)!bVar25 * *(int *)(local_b30.ray + 0x438)
                        ;
                        *(uint *)(local_b30.ray + 0x43c) =
                             (uint)bVar26 * iVar64 | (uint)!bVar26 * *(int *)(local_b30.ray + 0x43c)
                        ;
                        auVar172 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x140));
                        auVar172 = vmovdqu32_avx512f(auVar172);
                        *(undefined1 (*) [64])(local_b30.ray + 0x440) = auVar172;
                        auVar172 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x180));
                        auVar172 = vmovdqu32_avx512f(auVar172);
                        *(undefined1 (*) [64])(local_b30.ray + 0x480) = auVar172;
                        auVar172 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x1c0));
                        auVar172 = vmovdqa32_avx512f(auVar172);
                        *(undefined1 (*) [64])(local_b30.ray + 0x4c0) = auVar172;
                        auVar172 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x200));
                        auVar172 = vmovdqa32_avx512f(auVar172);
                        *(undefined1 (*) [64])(local_b30.ray + 0x500) = auVar172;
                        goto LAB_018a4bd9;
                      }
                    }
                    *(int *)(ray + k * 4 + 0x200) = auVar276._0_4_;
                  }
                }
              }
            }
          }
LAB_018a4bd9:
          uVar174 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar250._4_4_ = uVar174;
          auVar250._0_4_ = uVar174;
          auVar250._8_4_ = uVar174;
          auVar250._12_4_ = uVar174;
          auVar250._16_4_ = uVar174;
          auVar250._20_4_ = uVar174;
          auVar250._24_4_ = uVar174;
          auVar250._28_4_ = uVar174;
          auVar172 = ZEXT3264(auVar250);
          auVar66._4_4_ = fStack_67c;
          auVar66._0_4_ = local_680;
          auVar66._8_4_ = fStack_678;
          auVar66._12_4_ = fStack_674;
          auVar66._16_4_ = fStack_670;
          auVar66._20_4_ = fStack_66c;
          auVar66._24_4_ = fStack_668;
          auVar66._28_4_ = fStack_664;
          uVar29 = vcmpps_avx512vl(auVar250,auVar66,0xd);
          auVar279 = ZEXT3264(local_a00);
          auVar280 = ZEXT3264(local_a20);
        }
        uVar31 = vpcmpd_avx512vl(local_640,local_5c0,1);
        uVar30 = vpcmpd_avx512vl(local_640,_local_6a0,1);
        auVar187._0_4_ = (float)local_720._0_4_ + (float)local_540._0_4_;
        auVar187._4_4_ = (float)local_720._4_4_ + (float)local_540._4_4_;
        auVar187._8_4_ = fStack_718 + fStack_538;
        auVar187._12_4_ = fStack_714 + fStack_534;
        auVar187._16_4_ = fStack_710 + fStack_530;
        auVar187._20_4_ = fStack_70c + fStack_52c;
        auVar187._24_4_ = fStack_708 + fStack_528;
        auVar187._28_4_ = fStack_704 + fStack_524;
        uVar174 = auVar172._0_4_;
        auVar215._4_4_ = uVar174;
        auVar215._0_4_ = uVar174;
        auVar215._8_4_ = uVar174;
        auVar215._12_4_ = uVar174;
        auVar215._16_4_ = uVar174;
        auVar215._20_4_ = uVar174;
        auVar215._24_4_ = uVar174;
        auVar215._28_4_ = uVar174;
        uVar29 = vcmpps_avx512vl(auVar187,auVar215,2);
        bVar73 = bVar73 & (byte)uVar31 & (byte)uVar29;
        auVar234._0_4_ = (float)local_720._0_4_ + local_600._0_4_;
        auVar234._4_4_ = (float)local_720._4_4_ + local_600._4_4_;
        auVar234._8_4_ = fStack_718 + local_600._8_4_;
        auVar234._12_4_ = fStack_714 + local_600._12_4_;
        auVar234._16_4_ = fStack_710 + local_600._16_4_;
        auVar234._20_4_ = fStack_70c + local_600._20_4_;
        auVar234._24_4_ = fStack_708 + local_600._24_4_;
        auVar234._28_4_ = fStack_704 + local_600._28_4_;
        uVar29 = vcmpps_avx512vl(auVar234,auVar215,2);
        bVar67 = bVar67 & (byte)uVar30 & (byte)uVar29 | bVar73;
        if (bVar67 != 0) {
          uVar71 = (ulong)uVar77;
          abStack_1a0[uVar71 * 0x60] = bVar67;
          auVar150._0_4_ =
               (uint)(bVar73 & 1) * local_540._0_4_ |
               (uint)!(bool)(bVar73 & 1) * (int)local_600._0_4_;
          bVar78 = (bool)(bVar73 >> 1 & 1);
          auVar150._4_4_ = (uint)bVar78 * local_540._4_4_ | (uint)!bVar78 * (int)local_600._4_4_;
          bVar78 = (bool)(bVar73 >> 2 & 1);
          auVar150._8_4_ = (uint)bVar78 * (int)fStack_538 | (uint)!bVar78 * (int)local_600._8_4_;
          bVar78 = (bool)(bVar73 >> 3 & 1);
          auVar150._12_4_ = (uint)bVar78 * (int)fStack_534 | (uint)!bVar78 * (int)local_600._12_4_;
          bVar78 = (bool)(bVar73 >> 4 & 1);
          auVar150._16_4_ = (uint)bVar78 * (int)fStack_530 | (uint)!bVar78 * (int)local_600._16_4_;
          bVar78 = (bool)(bVar73 >> 5 & 1);
          auVar150._20_4_ = (uint)bVar78 * (int)fStack_52c | (uint)!bVar78 * (int)local_600._20_4_;
          auVar150._24_4_ =
               (uint)(bVar73 >> 6) * (int)fStack_528 |
               (uint)!(bool)(bVar73 >> 6) * (int)local_600._24_4_;
          auVar150._28_4_ = local_600._28_4_;
          *(undefined1 (*) [32])(auStack_180 + uVar71 * 0x60) = auVar150;
          uVar79 = vmovlps_avx(local_650);
          (&uStack_160)[uVar71 * 0xc] = uVar79;
          aiStack_158[uVar71 * 0x18] = iVar75 + 1;
          uVar77 = uVar77 + 1;
        }
        auVar251 = ZEXT3264(_DAT_01f7b040);
      }
    }
    do {
      uVar80 = uVar77;
      uVar151 = uVar80 - 1;
      if (uVar80 == 0) {
        uVar174 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar42._4_4_ = uVar174;
        auVar42._0_4_ = uVar174;
        auVar42._8_4_ = uVar174;
        auVar42._12_4_ = uVar174;
        uVar29 = vcmpps_avx512vl(local_660,auVar42,2);
        local_908 = (ulong)((uint)uVar29 & (uint)local_908 - 1 & (uint)local_908);
        goto LAB_018a25ea;
      }
      uVar79 = (ulong)uVar151;
      lVar72 = uVar79 * 0x60;
      auVar117 = *(undefined1 (*) [32])(auStack_180 + lVar72);
      auVar184._0_4_ = auVar117._0_4_ + (float)local_720._0_4_;
      auVar184._4_4_ = auVar117._4_4_ + (float)local_720._4_4_;
      auVar184._8_4_ = auVar117._8_4_ + fStack_718;
      auVar184._12_4_ = auVar117._12_4_ + fStack_714;
      auVar184._16_4_ = auVar117._16_4_ + fStack_710;
      auVar184._20_4_ = auVar117._20_4_ + fStack_70c;
      auVar184._24_4_ = auVar117._24_4_ + fStack_708;
      auVar184._28_4_ = auVar117._28_4_ + fStack_704;
      uVar174 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar45._4_4_ = uVar174;
      auVar45._0_4_ = uVar174;
      auVar45._8_4_ = uVar174;
      auVar45._12_4_ = uVar174;
      auVar45._16_4_ = uVar174;
      auVar45._20_4_ = uVar174;
      auVar45._24_4_ = uVar174;
      auVar45._28_4_ = uVar174;
      uVar29 = vcmpps_avx512vl(auVar184,auVar45,2);
      uVar152 = (uint)uVar29 & (uint)abStack_1a0[lVar72];
      uVar77 = uVar151;
    } while (uVar152 == 0);
    uVar71 = (&uStack_160)[uVar79 * 0xc];
    auVar177._8_8_ = 0;
    auVar177._0_8_ = uVar71;
    auVar214._8_4_ = 0x7f800000;
    auVar214._0_8_ = 0x7f8000007f800000;
    auVar214._12_4_ = 0x7f800000;
    auVar214._16_4_ = 0x7f800000;
    auVar214._20_4_ = 0x7f800000;
    auVar214._24_4_ = 0x7f800000;
    auVar214._28_4_ = 0x7f800000;
    auVar115 = vblendmps_avx512vl(auVar214,auVar117);
    bVar67 = (byte)uVar152;
    auVar147._0_4_ =
         (uint)(bVar67 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar67 & 1) * (int)auVar117._0_4_;
    bVar78 = (bool)((byte)(uVar152 >> 1) & 1);
    auVar147._4_4_ = (uint)bVar78 * auVar115._4_4_ | (uint)!bVar78 * (int)auVar117._4_4_;
    bVar78 = (bool)((byte)(uVar152 >> 2) & 1);
    auVar147._8_4_ = (uint)bVar78 * auVar115._8_4_ | (uint)!bVar78 * (int)auVar117._8_4_;
    bVar78 = (bool)((byte)(uVar152 >> 3) & 1);
    auVar147._12_4_ = (uint)bVar78 * auVar115._12_4_ | (uint)!bVar78 * (int)auVar117._12_4_;
    bVar78 = (bool)((byte)(uVar152 >> 4) & 1);
    auVar147._16_4_ = (uint)bVar78 * auVar115._16_4_ | (uint)!bVar78 * (int)auVar117._16_4_;
    bVar78 = (bool)((byte)(uVar152 >> 5) & 1);
    auVar147._20_4_ = (uint)bVar78 * auVar115._20_4_ | (uint)!bVar78 * (int)auVar117._20_4_;
    bVar78 = (bool)((byte)(uVar152 >> 6) & 1);
    auVar147._24_4_ = (uint)bVar78 * auVar115._24_4_ | (uint)!bVar78 * (int)auVar117._24_4_;
    auVar147._28_4_ =
         (uVar152 >> 7) * auVar115._28_4_ | (uint)!SUB41(uVar152 >> 7,0) * (int)auVar117._28_4_;
    auVar117 = vshufps_avx(auVar147,auVar147,0xb1);
    auVar117 = vminps_avx(auVar147,auVar117);
    auVar115 = vshufpd_avx(auVar117,auVar117,5);
    auVar117 = vminps_avx(auVar117,auVar115);
    auVar115 = vpermpd_avx2(auVar117,0x4e);
    auVar117 = vminps_avx(auVar117,auVar115);
    uVar29 = vcmpps_avx512vl(auVar147,auVar117,0);
    bVar74 = (byte)uVar29 & bVar67;
    if (bVar74 != 0) {
      uVar152 = (uint)bVar74;
    }
    uVar153 = 0;
    for (; (uVar152 & 1) == 0; uVar152 = uVar152 >> 1 | 0x80000000) {
      uVar153 = uVar153 + 1;
    }
    iVar75 = aiStack_158[uVar79 * 0x18];
    bVar67 = ~('\x01' << ((byte)uVar153 & 0x1f)) & bVar67;
    abStack_1a0[lVar72] = bVar67;
    uVar77 = uVar80;
    if (bVar67 == 0) {
      uVar77 = uVar151;
    }
    uVar174 = (undefined4)uVar71;
    auVar166._4_4_ = uVar174;
    auVar166._0_4_ = uVar174;
    auVar166._8_4_ = uVar174;
    auVar166._12_4_ = uVar174;
    auVar166._16_4_ = uVar174;
    auVar166._20_4_ = uVar174;
    auVar166._24_4_ = uVar174;
    auVar166._28_4_ = uVar174;
    auVar100 = vmovshdup_avx(auVar177);
    auVar100 = vsubps_avx(auVar100,auVar177);
    auVar185._0_4_ = auVar100._0_4_;
    auVar185._4_4_ = auVar185._0_4_;
    auVar185._8_4_ = auVar185._0_4_;
    auVar185._12_4_ = auVar185._0_4_;
    auVar185._16_4_ = auVar185._0_4_;
    auVar185._20_4_ = auVar185._0_4_;
    auVar185._24_4_ = auVar185._0_4_;
    auVar185._28_4_ = auVar185._0_4_;
    auVar100 = vfmadd132ps_fma(auVar185,auVar166,auVar251._0_32_);
    auVar117 = ZEXT1632(auVar100);
    local_400[0] = (RTCHitN)auVar117[0];
    local_400[1] = (RTCHitN)auVar117[1];
    local_400[2] = (RTCHitN)auVar117[2];
    local_400[3] = (RTCHitN)auVar117[3];
    local_400[4] = (RTCHitN)auVar117[4];
    local_400[5] = (RTCHitN)auVar117[5];
    local_400[6] = (RTCHitN)auVar117[6];
    local_400[7] = (RTCHitN)auVar117[7];
    local_400[8] = (RTCHitN)auVar117[8];
    local_400[9] = (RTCHitN)auVar117[9];
    local_400[10] = (RTCHitN)auVar117[10];
    local_400[0xb] = (RTCHitN)auVar117[0xb];
    local_400[0xc] = (RTCHitN)auVar117[0xc];
    local_400[0xd] = (RTCHitN)auVar117[0xd];
    local_400[0xe] = (RTCHitN)auVar117[0xe];
    local_400[0xf] = (RTCHitN)auVar117[0xf];
    local_400[0x10] = (RTCHitN)auVar117[0x10];
    local_400[0x11] = (RTCHitN)auVar117[0x11];
    local_400[0x12] = (RTCHitN)auVar117[0x12];
    local_400[0x13] = (RTCHitN)auVar117[0x13];
    local_400[0x14] = (RTCHitN)auVar117[0x14];
    local_400[0x15] = (RTCHitN)auVar117[0x15];
    local_400[0x16] = (RTCHitN)auVar117[0x16];
    local_400[0x17] = (RTCHitN)auVar117[0x17];
    local_400[0x18] = (RTCHitN)auVar117[0x18];
    local_400[0x19] = (RTCHitN)auVar117[0x19];
    local_400[0x1a] = (RTCHitN)auVar117[0x1a];
    local_400[0x1b] = (RTCHitN)auVar117[0x1b];
    local_400[0x1c] = (RTCHitN)auVar117[0x1c];
    local_400[0x1d] = (RTCHitN)auVar117[0x1d];
    local_400[0x1e] = (RTCHitN)auVar117[0x1e];
    local_400[0x1f] = (RTCHitN)auVar117[0x1f];
    local_650._8_8_ = 0;
    local_650._0_8_ = *(ulong *)(local_400 + (ulong)uVar153 * 4);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }